

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813.cpp
# Opt level: O3

void __thiscall
chrono::fea::Brick_ForceNumerical::Evaluate
          (Brick_ForceNumerical *this,ChVectorN<double,_330> *result,double x,double y,double z)

{
  plain_array<double,_54,_1,_16> *ppVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  ShapeVector *Ny;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  ChMatrixNM<double,_8,_3> *pCVar29;
  ChVectorN<double,_9> *pCVar30;
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  int iVar48;
  double *pdVar49;
  double *pdVar50;
  double *pdVar51;
  double *pdVar52;
  undefined8 uVar53;
  undefined8 uVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  ChVectorN<double,_330> *pCVar70;
  undefined4 uVar71;
  undefined4 uVar72;
  long lVar73;
  double *pdVar74;
  ulong uVar75;
  uint uVar76;
  Index row;
  ChElementHexaANCF_3813 *pCVar77;
  Scalar *alpha;
  Index row_1;
  undefined8 *extraout_RDX;
  ChMatrixNM<double,_6,_6> *pCVar79;
  ulong uVar80;
  undefined8 *in_R10;
  undefined8 *in_R11;
  undefined8 *unaff_R13;
  ChMatrixNM<double,_6,_24> *a_rhs;
  uint uVar81;
  uint uVar82;
  Index row_2;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  ChMatrixNM<double,_6,_9> *pCVar83;
  scalar_constant_op<double> a_rhs_00;
  ulong uVar84;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar102 [32];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar103 [32];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  undefined1 auVar120 [64];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  double dVar130;
  double dVar131;
  double dVar132;
  undefined8 in_XMM0_Qb;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  double dVar151;
  double dVar152;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar181 [16];
  undefined8 in_XMM1_Qb;
  undefined1 auVar184 [64];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  double dVar206;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  double dVar216;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  double dVar217;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  double dVar290;
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [64];
  undefined1 auVar303 [16];
  undefined1 auVar304 [64];
  undefined1 in_ZMM19 [64];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  ChVectorN<double,_6> TEMP5;
  ChMatrix33<double> CGN;
  ChVectorN<double,_6> strain_1;
  DstEvaluatorType dstEvaluator;
  ChMatrix33<double> STRN;
  ChMatrix33<double> JPCN;
  ChMatrix33<double> INVCGN;
  ChMatrixNM<double,_9,_9> KALPHA;
  ChVectorN<double,_216> GDEPSPVec;
  ChVectorN<double,_81> KALPHAVec;
  SrcEvaluatorType srcEvaluator;
  ChMatrixNM<double,_9,_24> GDEPSP;
  ChVectorN<double,_8> d0d0Ny;
  ChVectorN<double,_8> d0d0Nx;
  ChVectorN<double,_8> ddNz;
  ChVectorN<double,_8> ddNy;
  ChVectorN<double,_8> ddNx;
  ChMatrix33<double> I2PCN;
  ChMatrix33<double> I1PCN;
  ChVectorN<double,_8> d0d0Nz;
  ChMatrix33<double> JPC;
  ChMatrixNM<double,_3,_3> j0;
  ChMatrix33<double> STR;
  ChMatrix33<double> I2PC;
  ChMatrixNM<double,_3,_3> rd0;
  ChMatrixNM<double,_6,_24> strainD_til;
  ChMatrixNM<double,_8,_8> d_d;
  ChMatrixNM<double,_8,_8> d0_d0;
  assign_op<double,_double> local_2781;
  ChMatrixNM<double,_3,_24> *local_2780;
  undefined8 uStack_2778;
  ChMatrixNM<double,_3,_24> *local_2770;
  undefined8 uStack_2768;
  ChVectorN<double,_330> *local_2758;
  double local_2750;
  undefined1 local_2748 [16];
  double dStack_2738;
  double dStack_2730;
  double local_2728;
  scalar_constant_op<double> local_2720;
  undefined8 uStack_2718;
  undefined1 local_2708 [56];
  double dStack_26d0;
  double local_26c8;
  undefined1 local_26c0 [64];
  undefined1 local_2660 [16];
  undefined1 local_2650 [16];
  double local_2640 [4];
  double local_2620;
  double dStack_2618;
  ChMatrixNM<double,_6,_24> *local_2610;
  Brick_ForceNumerical *local_2608;
  undefined1 local_2600 [64];
  undefined1 local_25c0 [64];
  undefined1 local_2580 [64];
  undefined1 local_2540 [64];
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_9,_6,_0,_9,_6>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>,_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_24d0;
  double dStack_24b0;
  double dStack_24a8;
  double dStack_24a0;
  double dStack_2498;
  double local_2490;
  plainobjectbase_evaluator_data<double,_9> local_2488;
  undefined1 local_2480 [64];
  undefined1 local_2440 [64];
  undefined1 local_23c8 [32];
  double local_23a8;
  double local_23a0;
  double local_2388;
  undefined1 local_2380 [64];
  double local_2330;
  double dStack_2328;
  double local_2320;
  double dStack_2318;
  double local_2310;
  double dStack_2308;
  double local_2300;
  double dStack_22f8;
  double local_22f0;
  undefined1 local_22e0 [80];
  Matrix<double,_3,_24,_1,_3,_24> local_2290;
  undefined8 local_2050;
  undefined8 uStack_2048;
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined8 local_2030;
  undefined8 uStack_2028;
  undefined8 local_2020;
  undefined8 uStack_2018;
  undefined8 local_2010;
  undefined4 auStack_2008 [2];
  Matrix<double,_9,_24,_0,_9,_24> local_2000;
  Matrix<double,_3,_24,_1,_3,_24> local_1910;
  undefined8 local_16d0;
  undefined8 uStack_16c8;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 local_16b0;
  undefined8 uStack_16a8;
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 local_1690;
  undefined1 local_1680 [64];
  undefined1 local_1630 [16];
  ChMatrixNM<double,_6,_9> *pCStack_1620;
  undefined8 uStack_1618;
  double adStack_1610 [5];
  undefined1 local_15e8 [64];
  undefined1 local_15a8 [64];
  undefined1 local_1568 [64];
  undefined1 local_1528 [64];
  undefined1 local_14e8 [64];
  double local_14a8;
  double local_14a0;
  double local_1498;
  double local_1490;
  double local_1488;
  undefined1 local_1480 [16];
  scalar_constant_op<double> sStack_1470;
  variable_if_dynamic<long,__1> vStack_1468;
  variable_if_dynamic<long,__1> vStack_1460;
  ChMatrixNM<double,_6,_9> *pCStack_1458;
  undefined1 auStack_1450 [16];
  double dStack_1440;
  double dStack_1438;
  double dStack_1430;
  double dStack_1428;
  double dStack_1420;
  double dStack_1418;
  double dStack_1410;
  double dStack_1408;
  double dStack_1400;
  double local_13f8;
  double local_13f0;
  double local_13e8;
  double local_13e0;
  double local_13d8;
  double local_13d0;
  double local_13c8;
  double local_13c0;
  double dStack_13b8;
  double dStack_13b0;
  double dStack_13a8;
  double dStack_13a0;
  double dStack_1398;
  double dStack_1390;
  double dStack_1388;
  double local_1380;
  double dStack_1378;
  double dStack_1370;
  double dStack_1368;
  double dStack_1360;
  double dStack_1358;
  double dStack_1350;
  double dStack_1348;
  double local_1340;
  double dStack_1338;
  double dStack_1330;
  double dStack_1328;
  double dStack_1320;
  double dStack_1318;
  double dStack_1310;
  double dStack_1308;
  double local_1300;
  double dStack_12f8;
  double dStack_12f0;
  double dStack_12e8;
  double dStack_12e0;
  double dStack_12d8;
  double dStack_12d0;
  double dStack_12c8;
  double local_12c0;
  double dStack_12b8;
  double dStack_12b0;
  double dStack_12a8;
  double dStack_12a0;
  double dStack_1298;
  double dStack_1290;
  double dStack_1288;
  double local_1280;
  double dStack_1278;
  double dStack_1270;
  double dStack_1268;
  double dStack_1260;
  double dStack_1258;
  double dStack_1250;
  double dStack_1248;
  double local_1240;
  double dStack_1238;
  double dStack_1230;
  double dStack_1228;
  double dStack_1220;
  double dStack_1218;
  double dStack_1210;
  double dStack_1208;
  double local_1200;
  double dStack_11f8;
  double dStack_11f0;
  double dStack_11e8;
  double dStack_11e0;
  double dStack_11d8;
  double dStack_11d0;
  double dStack_11c8;
  double local_11c0;
  double dStack_11b8;
  double dStack_11b0;
  double dStack_11a8;
  double dStack_11a0;
  double dStack_1198;
  double dStack_1190;
  double dStack_1188;
  double local_1180;
  double dStack_1178;
  double dStack_1170;
  double dStack_1168;
  double dStack_1160;
  double dStack_1158;
  double dStack_1150;
  double dStack_1148;
  double local_1140;
  double dStack_1138;
  double dStack_1130;
  double dStack_1128;
  double dStack_1120;
  double dStack_1118;
  double dStack_1110;
  double dStack_1108;
  double local_1100;
  double dStack_10f8;
  double dStack_10f0;
  double dStack_10e8;
  double dStack_10e0;
  double dStack_10d8;
  double dStack_10d0;
  double dStack_10c8;
  double local_10c0;
  double dStack_10b8;
  double dStack_10b0;
  double dStack_10a8;
  double dStack_10a0;
  double dStack_1098;
  double dStack_1090;
  double dStack_1088;
  double local_1080;
  double dStack_1078;
  double dStack_1070;
  double dStack_1068;
  double dStack_1060;
  double dStack_1058;
  double dStack_1050;
  double dStack_1048;
  double local_1040;
  double dStack_1038;
  double dStack_1030;
  double dStack_1028;
  double dStack_1020;
  double dStack_1018;
  double dStack_1010;
  double dStack_1008;
  double local_1000;
  double dStack_ff8;
  double dStack_ff0;
  double dStack_fe8;
  double dStack_fe0;
  double dStack_fd8;
  double dStack_fd0;
  double dStack_fc8;
  double local_fc0;
  double dStack_fb8;
  double dStack_fb0;
  double dStack_fa8;
  double dStack_fa0;
  double dStack_f98;
  double dStack_f90;
  double dStack_f88;
  double local_f80;
  double dStack_f78;
  double dStack_f70;
  double dStack_f68;
  double dStack_f60;
  double dStack_f58;
  double dStack_f50;
  double dStack_f48;
  double local_f40;
  double dStack_f38;
  double dStack_f30;
  double dStack_f28;
  double dStack_f20;
  double dStack_f18;
  double dStack_f10;
  double dStack_f08;
  double local_f00;
  double dStack_ef8;
  double dStack_ef0;
  double dStack_ee8;
  double dStack_ee0;
  double dStack_ed8;
  double dStack_ed0;
  double dStack_ec8;
  double local_ec0;
  double dStack_eb8;
  double dStack_eb0;
  double dStack_ea8;
  double dStack_ea0;
  double dStack_e98;
  double dStack_e90;
  double dStack_e88;
  double local_e80;
  double dStack_e78;
  double dStack_e70;
  double dStack_e68;
  double dStack_e60;
  double dStack_e58;
  double dStack_e50;
  double dStack_e48;
  double local_e40;
  double dStack_e38;
  double dStack_e30;
  double dStack_e28;
  double dStack_e20;
  double dStack_e18;
  double dStack_e10;
  double dStack_e08;
  double local_e00;
  double dStack_df8;
  double dStack_df0;
  double dStack_de8;
  double dStack_de0;
  double dStack_dd8;
  double dStack_dd0;
  double dStack_dc8;
  undefined1 local_dc0 [64];
  undefined1 local_d80 [64];
  undefined1 local_d40 [64];
  undefined1 local_d00 [64];
  Matrix<double,_8,_1,_0,_8,_1> local_cc0;
  Matrix<double,_8,_1,_0,_8,_1> local_c80;
  Matrix<double,_8,_1,_0,_8,_1> local_c40;
  Matrix<double,_8,_1,_0,_8,_1> local_c00;
  Matrix<double,_8,_1,_0,_8,_1> local_bc0;
  ChMatrix33<double> local_b50;
  undefined1 local_b08 [80];
  double dStack_ab8;
  double dStack_ab0;
  double dStack_aa8;
  double dStack_aa0;
  double dStack_a98;
  double dStack_a90;
  double dStack_a88;
  double local_a70;
  double dStack_a68;
  double local_a60;
  double dStack_a58;
  double local_a50;
  double dStack_a48;
  double local_a40;
  double dStack_a38;
  double local_a30;
  Matrix<double,_3,_3,_1,_3,_3> local_a20;
  ChMatrix33<double> local_9d8;
  ChMatrix33<double> local_990;
  Matrix<double,_3,_3,_1,_3,_3> local_948;
  undefined1 local_900 [128];
  undefined1 local_880 [64];
  undefined1 local_840 [64];
  undefined1 local_800 [64];
  undefined1 local_7c0 [64];
  double local_780 [24];
  undefined1 local_6c0 [64];
  undefined1 local_680 [64];
  undefined1 local_640 [64];
  double local_600 [24];
  double local_540 [24];
  Matrix<double,_8,_8,_1,_8,_8> local_480;
  Matrix<double,_8,_8,_1,_8,_8> local_280;
  ulong uVar78;
  undefined1 auVar205 [32];
  
  local_2650._8_8_ = local_2650._0_8_;
  local_2600._0_8_ = &this->Nx;
  local_2780 = (ChMatrixNM<double,_3,_24> *)x;
  uStack_2778 = in_XMM0_Qb;
  local_2770 = (ChMatrixNM<double,_3,_24> *)y;
  uStack_2768 = in_XMM1_Qb;
  local_26c0._0_8_ = z;
  ChElementHexaANCF_3813::ShapeFunctionsDerivativeX(this->element,&this->Nx,x,y,z);
  Ny = &this->Ny;
  ChElementHexaANCF_3813::ShapeFunctionsDerivativeY
            (this->element,Ny,(double)local_2780,y,(double)local_26c0._0_8_);
  pCVar77 = this->element;
  auVar92._8_8_ = uStack_2778;
  auVar92._0_8_ = local_2780;
  auVar304 = ZEXT864(0x3ff0000000000000);
  auVar86._8_8_ = uStack_2768;
  auVar86._0_8_ = local_2770;
  auVar85 = vsubsd_avx512f(ZEXT816(0x3ff0000000000000),auVar92);
  local_2540._8_8_ = 0x3ff0000000000000;
  local_2540._0_8_ = 0x3ff0000000000000;
  auVar92 = vshufpd_avx(local_2540._0_16_,local_2540._0_16_,3);
  dVar131 = (2.0 / (pCVar77->m_InertFlexVec).m_data[2]) * 0.125;
  auVar86 = vsubsd_avx512f(ZEXT816(0x3ff0000000000000),auVar86);
  auVar102 = vpermpd_avx2(ZEXT1632(CONCAT88(((double)local_2780 + 1.0) * dVar131,
                                            auVar85._0_8_ * dVar131)),0x14);
  auVar103._0_8_ = auVar86._0_8_ * auVar102._0_8_;
  auVar103._8_8_ = auVar86._0_8_ * auVar102._8_8_;
  auVar103._16_8_ = ((double)local_2770 + auVar92._0_8_) * auVar102._16_8_;
  auVar103._24_8_ = ((double)local_2770 + auVar92._8_8_) * auVar102._24_8_;
  auVar102._8_8_ = 0x8000000000000000;
  auVar102._0_8_ = 0x8000000000000000;
  auVar102._16_8_ = 0x8000000000000000;
  auVar102._24_8_ = 0x8000000000000000;
  auVar102 = vxorpd_avx512vl(auVar103,auVar102);
  *(undefined1 (*) [32])
   (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array =
       auVar102;
  *(undefined1 (*) [32])
   ((this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array +
   4) = auVar103;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array[0] =
       0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array[1] =
       0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array[2] =
       0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array[3] =
       0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array[4] =
       0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array[5] =
       0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array[6] =
       0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array[7] =
       0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array
  [0x28] = 0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array
  [0x29] = 0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array
  [0x2a] = 0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array
  [0x2b] = 0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array
  [0x2c] = 0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array
  [0x2d] = 0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array
  [0x2e] = 0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array
  [0x2f] = 0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array[8] =
       0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array[9] =
       0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array[10]
       = 0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array[0xb]
       = 0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array[0xc]
       = 0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array[0xd]
       = 0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array[0xe]
       = 0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array[0xf]
       = 0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array
  [0x10] = 0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array
  [0x11] = 0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array
  [0x12] = 0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array
  [0x13] = 0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array
  [0x14] = 0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array
  [0x15] = 0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array
  [0x16] = 0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array
  [0x17] = 0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array
  [0x18] = 0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array
  [0x19] = 0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array
  [0x1a] = 0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array
  [0x1b] = 0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array
  [0x1c] = 0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array
  [0x1d] = 0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array
  [0x1e] = 0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array
  [0x1f] = 0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array
  [0x20] = 0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array
  [0x21] = 0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array
  [0x22] = 0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array
  [0x23] = 0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array
  [0x24] = 0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array
  [0x25] = 0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array
  [0x26] = 0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array
  [0x27] = 0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array
  [0x2c] = 0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array
  [0x2d] = 0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array
  [0x2e] = 0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array
  [0x2f] = 0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array
  [0x30] = 0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array
  [0x31] = 0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array
  [0x32] = 0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array
  [0x33] = 0.0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array[0] =
       (double)local_2780;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array[10]
       = (double)local_2770;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array
  [0x14] = (double)local_2780;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array
  [0x15] = (double)local_2770;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array
  [0x1f] = (double)local_26c0._0_8_;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array
  [0x29] = (double)local_2780;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array
  [0x2a] = (double)local_26c0._0_8_;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array
  [0x34] = (double)local_2770;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.array
  [0x35] = (double)local_26c0._0_8_;
  auVar92 = ZEXT816(0x3ff0000000000000);
  if (pCVar77->m_isMooney == false) {
    pdVar74 = this->v;
    auVar98 = ZEXT816(0xc000000000000000);
    auVar87._8_8_ = 0;
    auVar87._0_8_ = *pdVar74;
    auVar89 = ZEXT816(0x3ff0000000000000);
    auVar86 = vsubsd_avx512f(auVar89,auVar87);
    dVar131 = *this->E;
    auVar85 = vaddsd_avx512f(auVar87,auVar89);
    auVar87 = vfmadd213sd_avx512f(auVar87,auVar98,auVar89);
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0] = 1.0;
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[7] = 1.0;
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0xe] = 1.0;
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x15] = 1.0;
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x1c] = 1.0;
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x23] = 1.0;
    dVar130 = (auVar86._0_8_ * dVar131) / (auVar85._0_8_ * auVar87._0_8_);
    auVar85._8_8_ = 0;
    auVar85._0_8_ = *pdVar74;
    auVar86 = vsubsd_avx512f(auVar89,auVar85);
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[1] = *pdVar74 / auVar86._0_8_;
    auVar94._8_8_ = 0;
    auVar94._0_8_ = *pdVar74;
    auVar86 = vsubsd_avx512f(auVar89,auVar94);
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[3] = *pdVar74 / auVar86._0_8_;
    auVar91._8_8_ = 0;
    auVar91._0_8_ = *pdVar74;
    auVar86 = vsubsd_avx512f(auVar89,auVar91);
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[6] = *pdVar74 / auVar86._0_8_;
    auVar93._8_8_ = 0;
    auVar93._0_8_ = *pdVar74;
    auVar86 = vsubsd_avx512f(auVar89,auVar93);
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[9] = *pdVar74 / auVar86._0_8_;
    auVar88._8_8_ = 0;
    auVar88._0_8_ = *pdVar74;
    auVar86 = vfmadd213sd_avx512f(auVar98,auVar88,auVar89);
    auVar87 = ZEXT816(0x3ff0000000000000);
    auVar85 = vsubsd_avx512f(auVar87,auVar88);
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0xe] = auVar86._0_8_ / (auVar85._0_8_ + auVar85._0_8_);
    auVar89._8_8_ = 0;
    auVar89._0_8_ = *pdVar74;
    auVar86 = vsubsd_avx512f(auVar87,auVar89);
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x12] = *pdVar74 / auVar86._0_8_;
    auVar90._8_8_ = 0;
    auVar90._0_8_ = *pdVar74;
    auVar86 = vsubsd_avx512f(auVar87,auVar90);
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x13] = *pdVar74 / auVar86._0_8_;
    auVar96._8_8_ = 0;
    auVar96._0_8_ = *pdVar74;
    auVar86 = vfmadd213sd_avx512f(auVar98,auVar96,auVar87);
    auVar85 = vsubsd_avx512f(auVar92,auVar96);
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x1c] = auVar86._0_8_ / (auVar85._0_8_ + auVar85._0_8_);
    auVar97._8_8_ = 0;
    auVar97._0_8_ = *pdVar74;
    auVar86 = vfmadd213sd_avx512f(auVar98,auVar97,auVar92);
    auVar85 = vsubsd_avx512f(auVar92,auVar97);
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x23] = auVar86._0_8_ / (auVar85._0_8_ + auVar85._0_8_);
    dVar131 = (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
              m_data.array[1];
    dVar151 = (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
              m_data.array[2];
    dVar152 = (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
              m_data.array[3];
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0] = dVar130 * (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                         m_storage.m_data.array[0];
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[1] = dVar130 * dVar131;
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[2] = dVar130 * dVar151;
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[3] = dVar130 * dVar152;
    dVar131 = (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
              m_data.array[5];
    dVar151 = (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
              m_data.array[6];
    dVar152 = (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
              m_data.array[7];
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[4] = dVar130 * (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                         m_storage.m_data.array[4];
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[5] = dVar130 * dVar131;
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[6] = dVar130 * dVar151;
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[7] = dVar130 * dVar152;
    dVar131 = (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
              m_data.array[9];
    dVar151 = (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
              m_data.array[10];
    dVar152 = (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
              m_data.array[0xb];
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[8] = dVar130 * (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                         m_storage.m_data.array[8];
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[9] = dVar130 * dVar131;
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[10] = dVar130 * dVar151;
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0xb] = dVar130 * dVar152;
    dVar131 = (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
              m_data.array[0xd];
    dVar151 = (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
              m_data.array[0xe];
    dVar152 = (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
              m_data.array[0xf];
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0xc] = dVar130 * (this->E_eps).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                           m_data.array[0xc];
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0xd] = dVar130 * dVar131;
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0xe] = dVar130 * dVar151;
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0xf] = dVar130 * dVar152;
    dVar131 = (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
              m_data.array[0x11];
    dVar151 = (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
              m_data.array[0x12];
    dVar152 = (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
              m_data.array[0x13];
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x10] = dVar130 * (this->E_eps).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                            m_data.array[0x10];
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x11] = dVar130 * dVar131;
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x12] = dVar130 * dVar151;
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x13] = dVar130 * dVar152;
    dVar131 = (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
              m_data.array[0x15];
    dVar151 = (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
              m_data.array[0x16];
    dVar152 = (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
              m_data.array[0x17];
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x14] = dVar130 * (this->E_eps).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                            m_data.array[0x14];
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x15] = dVar130 * dVar131;
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x16] = dVar130 * dVar151;
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x17] = dVar130 * dVar152;
    dVar131 = (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
              m_data.array[0x19];
    dVar151 = (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
              m_data.array[0x1a];
    dVar152 = (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
              m_data.array[0x1b];
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x18] = dVar130 * (this->E_eps).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                            m_data.array[0x18];
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x19] = dVar130 * dVar131;
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x1a] = dVar130 * dVar151;
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x1b] = dVar130 * dVar152;
    dVar131 = (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
              m_data.array[0x1d];
    dVar151 = (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
              m_data.array[0x1e];
    dVar152 = (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
              m_data.array[0x1f];
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x1c] = dVar130 * (this->E_eps).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                            m_data.array[0x1c];
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x1d] = dVar130 * dVar131;
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x1e] = dVar130 * dVar151;
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x1f] = dVar130 * dVar152;
    dVar131 = (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
              m_data.array[0x21];
    dVar151 = (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
              m_data.array[0x22];
    dVar152 = (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
              m_data.array[0x23];
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x20] = dVar130 * (this->E_eps).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                            m_data.array[0x20];
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x21] = dVar130 * dVar131;
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x22] = dVar130 * dVar151;
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x23] = dVar130 * dVar152;
  }
  auVar104 = *(undefined1 (*) [64])
              (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
              m_data.array;
  auVar184 = ZEXT3264(_DAT_00998460);
  pCVar83 = &this->M;
  local_26c0._0_8_ = &this->Nz;
  local_2770 = &this->Sx;
  local_2780 = &this->Sy;
  vscatterdpd_avx512f(ZEXT864(this) + ZEXT864(0x280) + auVar184 * (undefined1  [64])0x8,0xffff,
                      auVar104);
  vscatterdpd_avx512f(ZEXT864(this) + ZEXT864(0x348) + auVar184 * (undefined1  [64])0x8,0xffff,
                      auVar104);
  vscatterdpd_avx512f(ZEXT864(this) + ZEXT864(0x410) + auVar184 * (undefined1  [64])0x8,0xffff,
                      auVar104);
  auVar104 = *(undefined1 (*) [64])
              (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
              m_data.array;
  vscatterdpd_avx512f(ZEXT864(this) + ZEXT864(0x4c0) + auVar184 * (undefined1  [64])0x8,0xffff,
                      auVar104);
  vscatterdpd_avx512f(ZEXT864(this) + ZEXT864(0x588) + auVar184 * (undefined1  [64])0x8,0xffff,
                      auVar104);
  vscatterdpd_avx512f(ZEXT864(this) + ZEXT864(0x650) + auVar184 * (undefined1  [64])0x8,0xffff,
                      auVar104);
  local_2650._0_8_ = &this->Sz;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0] = (double)&local_948;
  auVar104 = *(undefined1 (*) [64])
              (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
              m_data.array;
  vscatterdpd_avx512f(ZEXT864(this) + ZEXT864(0x700) + auVar184 * (undefined1  [64])0x8,0xffff,
                      auVar104);
  vscatterdpd_avx512f(ZEXT864(this) + ZEXT864(0x7c8) + auVar184 * (undefined1  [64])0x8,0xffff,
                      auVar104);
  vscatterdpd_avx512f(ZEXT864(this) + ZEXT864(0x890) + auVar184 * (undefined1  [64])0x8,0xffff,
                      auVar104);
  pCVar29 = this->d0;
  dVar131 = (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
            .array[0];
  auVar261._8_8_ = dVar131;
  auVar261._0_8_ = dVar131;
  dVar151 = (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
            .array[3];
  auVar231._8_8_ = dVar151;
  auVar231._0_8_ = dVar151;
  dVar151 = (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
            .array[4];
  auVar207._8_8_ = dVar151;
  auVar207._0_8_ = dVar151;
  dVar151 = (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
            .array[7];
  auVar193._8_8_ = dVar151;
  auVar193._0_8_ = dVar151;
  auVar133._0_8_ =
       dVar131 * (pCVar29->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.
                 m_data.array[0];
  auVar133._8_8_ =
       dVar131 * (pCVar29->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.
                 m_data.array[1];
  auVar86 = *(undefined1 (*) [16])
             ((pCVar29->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.
              m_data.array + 9);
  auVar85 = *(undefined1 (*) [16])
             ((pCVar29->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.
              m_data.array + 0xc);
  auVar87 = *(undefined1 (*) [16])
             ((pCVar29->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.
              m_data.array + 0xf);
  auVar94 = *(undefined1 (*) [16])
             ((pCVar29->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.
              m_data.array + 0x12);
  auVar91 = *(undefined1 (*) [16])
             ((pCVar29->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.
              m_data.array + 0x15);
  dVar131 = (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
            .array[1];
  auVar293._8_8_ = dVar131;
  auVar293._0_8_ = dVar131;
  auVar88 = vfmadd231pd_avx512vl
                      (auVar133,*(undefined1 (*) [16])
                                 ((pCVar29->
                                  super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).
                                  m_storage.m_data.array + 3),auVar293);
  auVar252._8_8_ = 0;
  auVar252._0_8_ =
       (pCVar29->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
       array[2];
  auVar93 = vmovhpd_avx(auVar252,(pCVar29->
                                 super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).
                                 m_storage.m_data.array[0xb]);
  dVar131 = (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
            .array[2];
  auVar303._8_8_ = dVar131;
  auVar303._0_8_ = dVar131;
  auVar89 = vfmadd231pd_avx512vl
                      (auVar88,*(undefined1 (*) [16])
                                ((pCVar29->
                                 super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).
                                 m_storage.m_data.array + 6),auVar303);
  auVar241._8_8_ = 0;
  auVar241._0_8_ =
       (pCVar29->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
       array[5];
  auVar88 = vmovhpd_avx(auVar241,(pCVar29->
                                 super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).
                                 m_storage.m_data.array[8]);
  auVar89 = vfmadd231pd_fma(auVar89,auVar86,auVar231);
  auVar96 = vunpcklpd_avx(auVar261,auVar231);
  auVar89 = vfmadd231pd_fma(auVar89,auVar85,auVar207);
  dVar131 = (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
            .array[5];
  auVar305._8_8_ = dVar131;
  auVar305._0_8_ = dVar131;
  auVar90 = vfmadd231pd_avx512vl(auVar89,auVar87,auVar305);
  auVar242._8_8_ = 0;
  auVar242._0_8_ =
       (pCVar29->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
       array[0x11];
  auVar89 = vmovhpd_avx(auVar242,(pCVar29->
                                 super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).
                                 m_storage.m_data.array[0x14]);
  dVar131 = (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
            .array[6];
  auVar306._8_8_ = dVar131;
  auVar306._0_8_ = dVar131;
  auVar90 = vfmadd231pd_avx512vl(auVar90,auVar94,auVar306);
  auVar99 = vfmadd231pd_fma(auVar90,auVar91,auVar193);
  auVar97 = vunpcklpd_avx(auVar207,auVar193);
  auVar208._8_8_ = 0;
  auVar208._0_8_ =
       (pCVar29->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
       array[0xe];
  auVar90 = vmovhpd_avx(auVar208,(pCVar29->
                                 super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).
                                 m_storage.m_data.array[0x17]);
  local_948.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)vmovlpd_avx(auVar99);
  local_948.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       (double)vmovhpd_avx(auVar99);
  local_948.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       auVar88._0_8_ *
       (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[1] + auVar93._0_8_ * auVar96._0_8_ +
       auVar88._8_8_ *
       (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[2] + auVar93._8_8_ * auVar96._8_8_ +
       auVar89._0_8_ *
       (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[5] + auVar97._0_8_ * auVar90._0_8_ +
       auVar89._8_8_ *
       (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[6] + auVar97._8_8_ * auVar90._8_8_;
  auVar96 = vshufpd_avx(auVar99,auVar99,1);
  dVar131 = (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
            .array[0];
  auVar284._8_8_ = dVar131;
  auVar284._0_8_ = dVar131;
  dVar151 = (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
            .array[3];
  auVar262._8_8_ = dVar151;
  auVar262._0_8_ = dVar151;
  dVar151 = (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
            .array[4];
  auVar253._8_8_ = dVar151;
  auVar253._0_8_ = dVar151;
  dVar151 = (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
            .array[7];
  auVar243._8_8_ = dVar151;
  auVar243._0_8_ = dVar151;
  auVar232._0_8_ =
       dVar131 * (pCVar29->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.
                 m_data.array[0];
  auVar232._8_8_ =
       dVar131 * (pCVar29->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.
                 m_data.array[1];
  dVar131 = (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
            .array[1];
  auVar32._8_8_ = dVar131;
  auVar32._0_8_ = dVar131;
  auVar88 = vfmadd231pd_avx512vl
                      (auVar232,*(undefined1 (*) [16])
                                 ((pCVar29->
                                  super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).
                                  m_storage.m_data.array + 3),auVar32);
  auVar278._8_8_ = 0;
  auVar278._0_8_ =
       (pCVar29->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
       array[2];
  auVar93 = vmovhpd_avx(auVar278,(pCVar29->
                                 super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).
                                 m_storage.m_data.array[0xb]);
  dVar131 = (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
            .array[2];
  auVar33._8_8_ = dVar131;
  auVar33._0_8_ = dVar131;
  auVar89 = vfmadd231pd_avx512vl
                      (auVar88,*(undefined1 (*) [16])
                                ((pCVar29->
                                 super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).
                                 m_storage.m_data.array + 6),auVar33);
  auVar269._8_8_ = 0;
  auVar269._0_8_ =
       (pCVar29->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
       array[5];
  auVar88 = vmovhpd_avx(auVar269,(pCVar29->
                                 super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).
                                 m_storage.m_data.array[8]);
  auVar89 = vfmadd231pd_fma(auVar89,auVar86,auVar262);
  auVar97 = vunpcklpd_avx(auVar284,auVar262);
  auVar89 = vfmadd231pd_fma(auVar89,auVar85,auVar253);
  dVar131 = (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
            .array[5];
  auVar34._8_8_ = dVar131;
  auVar34._0_8_ = dVar131;
  auVar90 = vfmadd231pd_avx512vl(auVar89,auVar87,auVar34);
  auVar270._8_8_ = 0;
  auVar270._0_8_ =
       (pCVar29->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
       array[0x11];
  auVar89 = vmovhpd_avx(auVar270,(pCVar29->
                                 super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).
                                 m_storage.m_data.array[0x14]);
  dVar131 = (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
            .array[6];
  auVar35._8_8_ = dVar131;
  auVar35._0_8_ = dVar131;
  auVar90 = vfmadd231pd_avx512vl(auVar90,auVar94,auVar35);
  auVar293 = vfmadd231pd_fma(auVar90,auVar91,auVar243);
  auVar98 = vunpcklpd_avx(auVar253,auVar243);
  auVar254._8_8_ = 0;
  auVar254._0_8_ =
       (pCVar29->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
       array[0xe];
  auVar90 = vmovhpd_avx(auVar254,(pCVar29->
                                 super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).
                                 m_storage.m_data.array[0x17]);
  local_948.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (double)vmovlpd_avx(auVar293);
  local_948.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       (double)vmovhpd_avx(auVar293);
  local_948.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       auVar88._0_8_ *
       (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[1] + auVar97._0_8_ * auVar93._0_8_ +
       auVar88._8_8_ *
       (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[2] + auVar97._8_8_ * auVar93._8_8_ +
       auVar89._0_8_ *
       (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[5] + auVar98._0_8_ * auVar90._0_8_ +
       auVar89._8_8_ *
       (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[6] + auVar98._8_8_ * auVar90._8_8_;
  auVar93 = vshufpd_avx(auVar293,auVar293,1);
  auVar98._8_8_ = 0;
  auVar98._0_8_ =
       (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[0];
  auVar88 = vmovddup_avx512vl(auVar98);
  auVar302 = ZEXT1664(auVar88);
  dVar131 = (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
            .array[3];
  auVar279._8_8_ = dVar131;
  auVar279._0_8_ = dVar131;
  dVar131 = (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
            .array[4];
  auVar271._8_8_ = dVar131;
  auVar271._0_8_ = dVar131;
  dVar131 = (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
            .array[7];
  auVar263._8_8_ = dVar131;
  auVar263._0_8_ = dVar131;
  auVar89 = vmulpd_avx512vl(auVar88,*(undefined1 (*) [16])
                                     (pCVar29->
                                     super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).
                                     m_storage.m_data.array);
  dVar131 = (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
            .array[1];
  auVar36._8_8_ = dVar131;
  auVar36._0_8_ = dVar131;
  auVar89 = vfmadd231pd_avx512vl
                      (auVar89,*(undefined1 (*) [16])
                                ((pCVar29->
                                 super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).
                                 m_storage.m_data.array + 3),auVar36);
  dVar131 = (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
            .array[2];
  auVar37._8_8_ = dVar131;
  auVar37._0_8_ = dVar131;
  auVar89 = vfmadd231pd_avx512vl
                      (auVar89,*(undefined1 (*) [16])
                                ((pCVar29->
                                 super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).
                                 m_storage.m_data.array + 6),auVar37);
  auVar89 = vfmadd231pd_avx512vl(auVar89,auVar279,auVar86);
  auVar90 = vunpcklpd_avx512vl(auVar88,auVar279);
  auVar280._8_8_ = 0;
  auVar280._0_8_ =
       (pCVar29->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
       array[2];
  auVar86 = vmovhpd_avx(auVar280,(pCVar29->
                                 super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).
                                 m_storage.m_data.array[0xb]);
  auVar85 = vfmadd231pd_avx512vl(auVar89,auVar271,auVar85);
  auVar227._8_8_ = 0;
  auVar227._0_8_ =
       (pCVar29->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
       array[5];
  dVar131 = (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
            .array[5];
  auVar38._8_8_ = dVar131;
  auVar38._0_8_ = dVar131;
  auVar88 = vfmadd231pd_avx512vl(auVar85,auVar87,auVar38);
  auVar218._8_8_ = 0;
  auVar218._0_8_ =
       (pCVar29->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
       array[0x11];
  auVar85 = vmovhpd_avx(auVar227,(pCVar29->
                                 super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).
                                 m_storage.m_data.array[8]);
  auVar87 = vmovhpd_avx(auVar218,(pCVar29->
                                 super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).
                                 m_storage.m_data.array[0x14]);
  dVar131 = (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
            .array[6];
  auVar39._8_8_ = dVar131;
  auVar39._0_8_ = dVar131;
  auVar89 = vfmadd231pd_avx512vl(auVar88,auVar94,auVar39);
  auVar88 = vunpcklpd_avx(auVar271,auVar263);
  auVar272._8_8_ = 0;
  auVar272._0_8_ =
       (pCVar29->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
       array[0xe];
  auVar94 = vmovhpd_avx(auVar272,(pCVar29->
                                 super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).
                                 m_storage.m_data.array[0x17]);
  auVar91 = vfmadd231pd_avx512vl(auVar89,auVar263,auVar91);
  auVar184 = ZEXT1664(auVar91);
  auVar89 = vshufpd_avx512vl(auVar91,auVar91,1);
  local_948.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       (double)vmovlpd_avx512f(auVar91);
  local_948.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       (double)vmovhpd_avx512f(auVar91);
  local_948.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       auVar90._0_8_ * auVar86._0_8_ +
       auVar85._0_8_ *
       (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[1] +
       auVar90._8_8_ * auVar86._8_8_ +
       auVar85._8_8_ *
       (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[2] +
       auVar88._0_8_ * auVar94._0_8_ +
       auVar87._0_8_ *
       (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[5] +
       auVar88._8_8_ * auVar94._8_8_ +
       auVar87._8_8_ *
       (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[6];
  auVar153._8_8_ = 0;
  auVar153._0_8_ =
       local_948.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [8];
  auVar219._8_8_ = 0;
  auVar219._0_8_ =
       local_948.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [7] * auVar89._0_8_;
  auVar86 = vfmsub231sd_fma(auVar219,auVar93,auVar153);
  auVar185._8_8_ = 0;
  auVar185._0_8_ =
       local_948.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [6] * auVar89._0_8_;
  auVar85 = vfmsub231sd_fma(auVar185,auVar96,auVar153);
  dVar131 = auVar99._0_8_;
  auVar220._8_8_ = 0;
  auVar220._0_8_ =
       auVar93._0_8_ *
       local_948.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [6];
  auVar255._8_8_ = 0;
  auVar255._0_8_ =
       local_948.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [7];
  local_2580._0_16_ = vfmsub231sd_fma(auVar220,auVar96,auVar255);
  auVar87 = vmulsd_avx512f(auVar91,local_2580._0_16_);
  this->detJ0 = auVar87._0_8_ + (dVar131 * auVar86._0_8_ - auVar293._0_8_ * auVar85._0_8_);
  auVar154._8_8_ = 0;
  auVar154._0_8_ =
       local_948.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [7] * dVar131;
  auVar194._8_8_ = 0;
  auVar194._0_8_ =
       local_948.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [6];
  auVar86 = vfmsub231sd_fma(auVar154,auVar194,auVar293);
  local_2480._0_8_ = auVar86._0_8_;
  dVar152 = auVar96._0_8_;
  auVar155._8_8_ = 0;
  auVar155._0_8_ = auVar293._0_8_ * dVar152;
  auVar85 = vfmsub231sd_fma(auVar155,auVar99,auVar93);
  local_2758 = auVar85._0_8_;
  auVar156._8_8_ = 0;
  auVar156._0_8_ = dVar152 * dVar152;
  auVar86 = vfmadd231sd_fma(auVar156,auVar99,auVar99);
  auVar86 = vfmadd231sd_fma(auVar86,auVar194,auVar194);
  auVar86 = vsqrtsd_avx(auVar86,auVar86);
  auVar92 = vdivsd_avx512f(auVar92,auVar86);
  dVar151 = auVar92._0_8_;
  local_2720.m_other = dVar131 * dVar151;
  uStack_2718 = 0;
  local_2380._8_8_ = 0;
  local_2380._0_8_ = dVar152 * dVar151;
  local_1680._8_8_ = 0;
  local_1680._0_8_ =
       local_948.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [6] * dVar151;
  auVar134._8_8_ = 0;
  auVar134._0_8_ = (double)local_2480._0_8_ * (double)local_2480._0_8_;
  auVar92 = vfmadd231sd_fma(auVar134,local_2580._0_16_,local_2580._0_16_);
  auVar92 = vfmadd231sd_fma(auVar92,auVar85,auVar85);
  local_25c0._0_16_ = vsqrtsd_avx(auVar92,auVar92);
  local_2440._0_8_ = dVar152 * dVar151 * 0.0;
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run(&local_a20,(SrcXprType *)&local_2000,(assign_op<double,_double> *)local_1480);
  auVar55._8_8_ = uStack_2718;
  auVar55._0_8_ = local_2720.m_other;
  auVar91 = local_1680._0_16_;
  auVar67._8_8_ =
       local_a20.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [1];
  auVar67._0_8_ =
       local_a20.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [0];
  auVar68._8_8_ =
       local_a20.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar68._0_8_ =
       local_a20.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [1];
  auVar69._8_8_ =
       local_a20.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [3];
  auVar69._0_8_ =
       local_a20.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar157._8_8_ = 0;
  auVar157._0_8_ =
       local_a20.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [5];
  auVar92 = vunpcklpd_avx(auVar55,local_25c0._0_16_);
  auVar291._8_8_ =
       local_a20.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [4];
  auVar291._0_8_ =
       local_a20.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [4];
  auVar85 = vunpcklpd_avx(auVar68,auVar291);
  auVar92 = vdivpd_avx(local_2540._0_16_,auVar92);
  auVar209._8_8_ = auVar92._8_8_;
  auVar209._0_8_ = local_2720.m_other * 0.0;
  auVar86 = vshufpd_avx(auVar92,auVar92,1);
  local_2480._0_8_ = auVar86._0_8_ * (double)local_2480._0_8_;
  dVar151 = auVar86._0_8_ * (double)local_2758;
  auVar40._8_8_ = 0x8000000000000000;
  auVar40._0_8_ = 0x8000000000000000;
  auVar244._8_8_ = 0;
  auVar244._0_8_ = local_2480._0_8_;
  auVar93 = vxorpd_avx512vl(auVar244,auVar40);
  auVar195._8_8_ = 0;
  auVar195._0_8_ = dVar151;
  auVar86 = vmulsd_avx512f(local_2380._0_16_,auVar195);
  auVar87 = vfmsub231sd_avx512f(auVar86,auVar244,local_1680._0_16_);
  auVar86 = vunpcklpd_avx(auVar87,local_2580._0_16_);
  dVar131 = local_2720.m_other + auVar87._0_8_ * 0.0;
  auVar264._0_8_ = auVar86._0_8_ * local_2720.m_other * 0.0;
  auVar264._8_8_ = auVar86._8_8_ * auVar92._8_8_;
  auVar86 = vsubpd_avx(auVar86,auVar209);
  auVar92 = vshufpd_avx(auVar264,auVar264,1);
  auVar273._8_8_ = auVar264._8_8_;
  auVar273._0_8_ = auVar86._0_8_;
  auVar236._8_8_ = 0;
  auVar236._0_8_ = dVar131;
  auVar86 = vunpcklpd_avx(auVar236,auVar86);
  auVar237._8_8_ = auVar264._8_8_;
  auVar237._0_8_ = dVar131;
  auVar87 = vmulsd_avx512f(local_1680._0_16_,auVar92);
  auVar87 = vfmsub231sd_fma(auVar87,auVar195,auVar55);
  auVar281._8_8_ = 0;
  auVar281._0_8_ = auVar87._0_8_ * 0.0;
  auVar94 = vaddsd_avx512f(local_2380._0_16_,auVar281);
  auVar245._8_8_ = 0;
  auVar245._0_8_ = local_2480._0_8_;
  auVar285._8_8_ = 0;
  auVar285._0_8_ = auVar87._0_8_ - (double)local_2440._0_8_;
  auVar87 = vunpcklpd_avx(auVar285,auVar245);
  auVar41._8_8_ =
       local_a20.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [1];
  auVar41._0_8_ =
       local_a20.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [1];
  auVar87 = vmulpd_avx512vl(auVar87,auVar41);
  auVar42._8_8_ =
       local_a20.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [0];
  auVar42._0_8_ =
       local_a20.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [0];
  auVar88 = vfmadd231pd_avx512vl(auVar87,auVar273,auVar42);
  auVar87 = vunpcklpd_avx(auVar94,auVar245);
  auVar94 = vunpcklpd_avx(auVar94,auVar285);
  auVar274._0_8_ =
       auVar87._0_8_ *
       local_a20.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [4];
  auVar274._8_8_ =
       auVar87._8_8_ *
       local_a20.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [4];
  auVar292._8_8_ =
       local_a20.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [3];
  auVar292._0_8_ =
       local_a20.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [3];
  auVar221._0_8_ = auVar94._0_8_ * auVar85._0_8_;
  auVar221._8_8_ = auVar94._8_8_ * auVar85._8_8_;
  auVar87 = vfmadd213pd_fma(auVar237,auVar292,auVar274);
  auVar275._8_8_ =
       local_a20.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [6];
  auVar275._0_8_ =
       local_a20.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [6];
  auVar85 = vunpcklpd_avx(auVar67,auVar292);
  auVar99._8_8_ = 0;
  auVar99._0_8_ = this->T0;
  auVar104 = vpbroadcastq_avx512f(auVar99);
  auVar85 = vfmadd213pd_fma(auVar85,auVar86,auVar221);
  auVar222._0_8_ =
       auVar94._0_8_ *
       local_a20.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [7];
  auVar222._8_8_ =
       auVar94._8_8_ *
       local_a20.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [7];
  vpaddq_avx512f(auVar104,_DAT_00997cc0);
  vpaddq_avx512f(auVar104,_DAT_00997d40);
  vpaddq_avx512f(auVar104,_DAT_00997d80);
  auVar246._8_8_ = 0;
  auVar246._0_8_ =
       (double)local_2480._0_8_ *
       local_a20.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [7];
  local_2660 = vfmadd231sd_fma(auVar246,auVar92,auVar275);
  auVar86 = vfmadd231pd_fma(auVar222,auVar275,auVar86);
  vpaddq_avx512f(auVar104,_DAT_00997c80);
  vpaddq_avx512f(auVar104,_DAT_00997d00);
  vpaddq_avx512f(auVar104,_DAT_00997dc0);
  lVar73 = 4;
  auVar247._0_8_ = *this->detJ0C / this->detJ0;
  auVar247._8_8_ = 0;
  do {
    vxorpd_avx512vl(auVar302._0_16_,auVar302._0_16_);
    vxorpd_avx512vl(auVar184._0_16_,auVar184._0_16_);
    vxorpd_avx512vl(auVar304._0_16_,auVar304._0_16_);
    vxorpd_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
    auVar104 = vgatherqpd_avx512f(*in_R10);
    dVar131 = (pCVar83->super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>).m_storage.
              m_data.array[0];
    auVar304._8_8_ = dVar131;
    auVar304._0_8_ = dVar131;
    auVar304._16_8_ = dVar131;
    auVar304._24_8_ = dVar131;
    auVar304._32_8_ = dVar131;
    auVar304._40_8_ = dVar131;
    auVar304._48_8_ = dVar131;
    auVar304._56_8_ = dVar131;
    auVar304 = vmulpd_avx512f(ZEXT4864(auVar104._0_48_),auVar304);
    auVar184 = vgatherqpd_avx512f(*in_R11);
    dVar131 = (pCVar83->super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>).m_storage.
              m_data.array[9];
    auVar104._8_8_ = dVar131;
    auVar104._0_8_ = dVar131;
    auVar104._16_8_ = dVar131;
    auVar104._24_8_ = dVar131;
    auVar104._32_8_ = dVar131;
    auVar104._40_8_ = dVar131;
    auVar104._48_8_ = dVar131;
    auVar104._56_8_ = dVar131;
    auVar104 = vmulpd_avx512f(ZEXT4864(auVar184._0_48_),auVar104);
    auVar302 = vgatherqpd_avx512f((result->
                                  super_PlainObjectBase<Eigen::Matrix<double,_330,_1,_0,_330,_1>_>).
                                  m_storage.m_data.array[0]);
    dVar131 = (pCVar83->super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>).m_storage.
              m_data.array[0x12];
    auVar184._8_8_ = dVar131;
    auVar184._0_8_ = dVar131;
    auVar184._16_8_ = dVar131;
    auVar184._24_8_ = dVar131;
    auVar184._32_8_ = dVar131;
    auVar184._40_8_ = dVar131;
    auVar184._48_8_ = dVar131;
    auVar184._56_8_ = dVar131;
    auVar184 = vmulpd_avx512f(ZEXT4864(auVar302._0_48_),auVar184);
    auVar104 = vaddpd_avx512f(auVar104,auVar184);
    vxorpd_avx512vl(auVar184._0_16_,auVar184._0_16_);
    auVar105 = vaddpd_avx512f(auVar304,auVar104);
    vxorpd_avx512vl(auVar104._0_16_,auVar104._0_16_);
    auVar304 = vgatherqpd_avx512f(*unaff_R13);
    dVar131 = (pCVar83->super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>).m_storage.
              m_data.array[0x1b];
    auVar302._8_8_ = dVar131;
    auVar302._0_8_ = dVar131;
    auVar302._16_8_ = dVar131;
    auVar302._24_8_ = dVar131;
    auVar302._32_8_ = dVar131;
    auVar302._40_8_ = dVar131;
    auVar302._48_8_ = dVar131;
    auVar302._56_8_ = dVar131;
    auVar104 = vmulpd_avx512f(ZEXT4864(auVar304._0_48_),auVar302);
    auVar304 = vgatherqpd_avx512f((this->
                                  super_ChIntegrable3D<Eigen::Matrix<double,_330,_1,_0,_330,_1>_>).
                                  _vptr_ChIntegrable3D);
    dVar131 = (pCVar83->super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>).m_storage.
              m_data.array[0x24];
    auVar106._8_8_ = dVar131;
    auVar106._0_8_ = dVar131;
    auVar106._16_8_ = dVar131;
    auVar106._24_8_ = dVar131;
    auVar106._32_8_ = dVar131;
    auVar106._40_8_ = dVar131;
    auVar106._48_8_ = dVar131;
    auVar106._56_8_ = dVar131;
    auVar304 = vmulpd_avx512f(ZEXT4864(auVar304._0_48_),auVar106);
    auVar184 = vgatherqpd_avx512f((pCVar83->
                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>).
                                  m_storage.m_data.array[0]);
    dVar131 = (pCVar83->super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>).m_storage.
              m_data.array[0x2d];
    auVar107._8_8_ = dVar131;
    auVar107._0_8_ = dVar131;
    auVar107._16_8_ = dVar131;
    auVar107._24_8_ = dVar131;
    auVar107._32_8_ = dVar131;
    auVar107._40_8_ = dVar131;
    auVar107._48_8_ = dVar131;
    auVar107._56_8_ = dVar131;
    in_ZMM19 = vmulpd_avx512f(ZEXT4864(auVar184._0_48_),auVar107);
    pCVar83 = (ChMatrixNM<double,_6,_9> *)
              ((pCVar83->super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>).m_storage.
               m_data.array + 1);
    auVar304 = vaddpd_avx512f(auVar304,in_ZMM19);
    auVar184 = vaddpd_avx512f(auVar104,auVar304);
    auVar302 = vaddpd_avx512f(auVar105,auVar184);
    uVar53 = local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.
             m_data.array[lVar73 + 6];
    uVar54 = local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.
             m_data.array[lVar73 + 7];
    local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
    [lVar73] = auVar302._0_8_;
    local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
    [lVar73 + 1] = (double)auVar302._8_8_;
    local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
    [lVar73 + 2] = (double)auVar302._16_8_;
    local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
    [lVar73 + 3] = (double)auVar302._24_8_;
    local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
    [lVar73 + 4] = (double)auVar302._32_8_;
    local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
    [lVar73 + 5] = (double)auVar302._40_8_;
    local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
    [lVar73 + 6] = (double)uVar53;
    local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
    [lVar73 + 7] = (double)uVar54;
    lVar73 = lVar73 + 6;
  } while (lVar73 != 0x3a);
  auVar233._8_8_ = 0;
  auVar233._0_8_ = local_2720.m_other * auVar93._0_8_;
  auVar92 = vfmadd213sd_avx512f(local_2380._0_16_,auVar92,auVar233);
  auVar265._8_8_ =
       local_a20.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [5];
  auVar265._0_8_ =
       local_a20.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [5];
  local_2720.m_other = (double)&this->G;
  lVar73 = 0;
  uVar84 = CONCAT71((int7)((ulong)local_2720.m_other >> 8),0x3f) & 0xffffffff;
  auVar94 = vunpcklpd_avx512vl(auVar92,auVar91);
  auVar228._0_8_ = auVar94._0_8_ * 0.0;
  auVar228._8_8_ = auVar94._8_8_ * 0.0;
  auVar92 = vunpcklpd_avx512vl(auVar91,auVar92);
  auVar256._0_8_ = auVar92._0_8_ + auVar228._0_8_;
  auVar256._8_8_ = auVar92._8_8_ + auVar228._8_8_;
  auVar92 = vsubpd_avx(auVar92,auVar228);
  auVar229._8_8_ = auVar92._8_8_;
  auVar229._0_8_ = auVar256._0_8_;
  auVar196._8_8_ = 0;
  auVar196._0_8_ = dVar151;
  auVar94 = vunpcklpd_avx(auVar256,auVar196);
  local_2380._0_16_ = vshufpd_avx(auVar92,auVar196,1);
  auVar197._8_8_ =
       local_a20.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar197._0_8_ =
       local_a20.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar92 = vfmadd213pd_fma(auVar265,auVar94,auVar87);
  local_2540 = ZEXT1664(auVar92);
  auVar92 = vfmadd213pd_fma(auVar197,local_2380._0_16_,auVar88);
  local_2440 = ZEXT1664(auVar92);
  auVar304 = vbroadcastsd_avx512f(auVar247);
  auVar105._8_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[5];
  auVar105._0_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[4];
  auVar105._16_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[6];
  auVar105._24_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[7];
  auVar105._32_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[8];
  auVar105._40_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[9];
  auVar105._48_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[10];
  auVar105._56_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0xb];
  auVar104 = vmulpd_avx512f(auVar304,auVar105);
  vscatterdpd_avx512f(ZEXT864(this) + ZEXT864(0x1070) + ZEXT3264(_DAT_00998480),uVar84,auVar104);
  auVar108._8_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0xb];
  auVar108._0_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[10];
  auVar108._16_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0xc];
  auVar108._24_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0xd];
  auVar108._32_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0xe];
  auVar108._40_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0xf];
  auVar108._48_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x10];
  auVar108._56_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x11];
  auVar104 = vmulpd_avx512f(auVar304,auVar108);
  vscatterdpd_avx512f(ZEXT864(this) + ZEXT864(0x1078) + ZEXT3264(_DAT_00998480),uVar84,auVar104);
  auVar109._8_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x11];
  auVar109._0_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x10];
  auVar109._16_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x12];
  auVar109._24_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x13];
  auVar109._32_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x14];
  auVar109._40_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x15];
  auVar109._48_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x16];
  auVar109._56_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x17];
  auVar104 = vmulpd_avx512f(auVar304,auVar109);
  vscatterdpd_avx512f(ZEXT864(this) + ZEXT864(0x1070) + ZEXT3264(_DAT_009984a0),uVar84,auVar104);
  auVar110._8_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x17];
  auVar110._0_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x16];
  auVar110._16_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x18];
  auVar110._24_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x19];
  auVar110._32_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x1a];
  auVar110._40_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x1b];
  auVar110._48_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x1c];
  auVar110._56_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x1d];
  auVar104 = vmulpd_avx512f(auVar304,auVar110);
  vscatterdpd_avx512f(ZEXT864(this) + ZEXT864(0x1070) + ZEXT3264(_DAT_009984c0),uVar84,auVar104);
  auVar111._8_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x1d];
  auVar111._0_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x1c];
  auVar111._16_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x1e];
  auVar111._24_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x1f];
  auVar111._32_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x20];
  auVar111._40_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x21];
  auVar111._48_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x22];
  auVar111._56_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x23];
  auVar104 = vmulpd_avx512f(auVar304,auVar111);
  vscatterdpd_avx512f(ZEXT864(this) + ZEXT864(0x1070) + ZEXT3264(_DAT_009984e0),uVar84,auVar104);
  auVar112._8_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x23];
  auVar112._0_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x22];
  auVar112._16_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x24];
  auVar112._24_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x25];
  auVar112._32_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x26];
  auVar112._40_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x27];
  auVar112._48_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x28];
  auVar112._56_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x29];
  auVar104 = vmulpd_avx512f(auVar304,auVar112);
  vscatterdpd_avx512f(ZEXT864(this) + ZEXT864(0x1070) + ZEXT3264(_DAT_00998500),uVar84,auVar104);
  auVar113._8_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x29];
  auVar113._0_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x28];
  auVar113._16_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x2a];
  auVar113._24_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x2b];
  auVar113._32_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x2c];
  auVar113._40_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x2d];
  auVar113._48_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x2e];
  auVar113._56_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x2f];
  auVar104 = vmulpd_avx512f(auVar304,auVar113);
  vscatterdpd_avx512f(ZEXT864(this) + ZEXT864(0x1070) + ZEXT3264(_DAT_00998520),uVar84,auVar104);
  auVar114._8_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x2f];
  auVar114._0_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x2e];
  auVar114._16_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x30];
  auVar114._24_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x31];
  auVar114._32_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x32];
  auVar114._40_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x33];
  auVar114._48_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x34];
  auVar114._56_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x35];
  auVar104 = vmulpd_avx512f(auVar304,auVar114);
  vscatterdpd_avx512f(ZEXT864(this) + ZEXT864(0x1070) + ZEXT3264(_DAT_00998540),uVar84,auVar104);
  auVar115._8_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x35];
  auVar115._0_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x34];
  auVar115._16_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x36];
  auVar115._24_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x37];
  auVar115._32_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x38];
  auVar115._40_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x39];
  auVar115._48_8_ = auVar247._0_8_;
  auVar115._56_8_ =
       local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
       array[0x3b];
  auVar304 = vmulpd_avx512f(auVar304,auVar115);
  vscatterdpd_avx512f(ZEXT864(this) + ZEXT864(0x1070) + ZEXT3264(_DAT_00998560),uVar84,auVar304);
  local_25c0._8_8_ = 0;
  local_25c0._0_8_ =
       local_a20.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [8];
  auVar92 = vmovddup_avx512vl(local_25c0._0_16_);
  pCVar30 = this->alpha_eas;
  auVar92 = vfmadd213pd_fma(auVar92,auVar229,auVar86);
  local_2580 = ZEXT1664(auVar92);
  dVar151 = (pCVar30->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data
            .array[0];
  dVar152 = (pCVar30->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data
            .array[1];
  dVar130 = (pCVar30->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data
            .array[2];
  dVar216 = (pCVar30->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data
            .array[3];
  dVar290 = (pCVar30->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data
            .array[4];
  dVar31 = (pCVar30->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data.
           array[5];
  dVar206 = (pCVar30->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data
            .array[6];
  dVar217 = (pCVar30->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data
            .array[7];
  dVar131 = (pCVar30->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data
            .array[8];
  pdVar74 = (this->G).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.
            array + 8;
  do {
    ppVar1 = (plain_array<double,_54,_1,_16> *)(pdVar74 + -8);
    pdVar49 = pdVar74 + -7;
    pdVar2 = pdVar74 + -6;
    pdVar50 = pdVar74 + -5;
    pdVar3 = pdVar74 + -2;
    pdVar51 = pdVar74 + -1;
    pdVar4 = pdVar74 + -4;
    pdVar52 = pdVar74 + -3;
    dVar132 = *pdVar74;
    pdVar74 = pdVar74 + 9;
    local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
    [lVar73] = dVar131 * dVar132 +
               dVar151 * ppVar1->array[0] + dVar130 * *pdVar2 +
               dVar290 * *pdVar4 + dVar206 * *pdVar3 +
               dVar152 * *pdVar49 + dVar216 * *pdVar50 + dVar31 * *pdVar52 + dVar217 * *pdVar51;
    lVar73 = lVar73 + 1;
  } while (lVar73 != 6);
  auVar92 = vunpcklpd_avx(auVar69,auVar157);
  auVar92 = vfmadd213pd_fma(auVar92,auVar229,auVar85);
  local_2480 = ZEXT1664(auVar92);
  (this->strain_EAS).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
  array[0] = local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.
             m_data.array[0];
  (this->strain_EAS).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
  array[1] = local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.
             m_data.array[1];
  (this->strain_EAS).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
  array[2] = local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.
             m_data.array[2];
  (this->strain_EAS).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
  array[3] = local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.
             m_data.array[3];
  (this->strain_EAS).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
  array[4] = local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.
             m_data.array[4];
  (this->strain_EAS).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
  array[5] = local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.
             m_data.array[5];
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [1] = (double)this->d;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0]._0_4_ = SUB84(local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.
                    m_storage.m_data.array[1],0);
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0]._4_4_ = (undefined4)
              ((ulong)local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.
                      m_storage.m_data.array[1] >> 0x20);
  local_2758 = result;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x3a] = auVar247._0_8_;
  Eigen::internal::
  generic_product_impl<Eigen::Matrix<double,8,3,1,8,3>,Eigen::Transpose<Eigen::Matrix<double,8,3,1,8,3>>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::evalTo<Eigen::Matrix<double,8,8,1,8,8>>
            (&local_480,
             (Matrix<double,_8,_3,_1,_8,_3> *)
             local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.
             m_data.array[1],
             (Transpose<Eigen::Matrix<double,_8,_3,_1,_8,_3>_> *)
             (local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.
              m_data.array + 1));
  local_bc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[0] =
       0.0;
  local_bc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[1] =
       0.0;
  local_bc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[2] =
       0.0;
  local_bc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[3] =
       0.0;
  local_bc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[4] =
       0.0;
  local_bc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[5] =
       0.0;
  local_bc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[6] =
       0.0;
  local_bc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[7] =
       0.0;
  local_1480._0_8_ = (PointerType)0x3ff0000000000000;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0]._0_4_ = local_2600._0_4_;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0]._4_4_ = local_2600._4_4_;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Matrix<double,8,8,1,8,8>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,Eigen::Matrix<double,8,1,0,8,1>>
            (&local_480,(Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_> *)&local_2000,&local_bc0,
             (Scalar *)local_1480);
  local_1480._0_8_ = (PointerType)0x3ff0000000000000;
  local_c00.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[0] =
       0.0;
  local_c00.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[1] =
       0.0;
  local_c00.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[2] =
       0.0;
  local_c00.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[3] =
       0.0;
  local_c00.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[4] =
       0.0;
  local_c00.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[5] =
       0.0;
  local_c00.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[6] =
       0.0;
  local_c00.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[7] =
       0.0;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0] = (double)Ny;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Matrix<double,8,8,1,8,8>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,Eigen::Matrix<double,8,1,0,8,1>>
            (&local_480,(Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_> *)&local_2000,&local_c00,
             (Scalar *)local_1480);
  local_1480._0_8_ = (PointerType)0x3ff0000000000000;
  local_c40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[0] =
       0.0;
  local_c40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[1] =
       0.0;
  local_c40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[2] =
       0.0;
  local_c40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[3] =
       0.0;
  local_c40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[4] =
       0.0;
  local_c40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[5] =
       0.0;
  local_c40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[6] =
       0.0;
  local_c40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[7] =
       0.0;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0]._0_4_ = local_26c0._0_4_;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0]._4_4_ = local_26c0._4_4_;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Matrix<double,8,8,1,8,8>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,Eigen::Matrix<double,8,1,0,8,1>>
            (&local_480,(Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_> *)&local_2000,&local_c40,
             (Scalar *)local_1480);
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [1] = (double)this->d0;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0]._0_4_ = SUB84(local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.
                    m_storage.m_data.array[1],0);
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0]._4_4_ = (undefined4)
              ((ulong)local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.
                      m_storage.m_data.array[1] >> 0x20);
  Eigen::internal::
  generic_product_impl<Eigen::Matrix<double,8,3,1,8,3>,Eigen::Transpose<Eigen::Matrix<double,8,3,1,8,3>>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::evalTo<Eigen::Matrix<double,8,8,1,8,8>>
            (&local_280,
             (Matrix<double,_8,_3,_1,_8,_3> *)
             local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.
             m_data.array[1],
             (Transpose<Eigen::Matrix<double,_8,_3,_1,_8,_3>_> *)
             (local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.
              m_data.array + 1));
  local_1480._0_8_ = (PointerType)0x3ff0000000000000;
  local_c80.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[0] =
       0.0;
  local_c80.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[1] =
       0.0;
  local_c80.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[2] =
       0.0;
  local_c80.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[3] =
       0.0;
  local_c80.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[4] =
       0.0;
  local_c80.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[5] =
       0.0;
  local_c80.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[6] =
       0.0;
  local_c80.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[7] =
       0.0;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0]._0_4_ = local_2600._0_4_;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0]._4_4_ = local_2600._4_4_;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Matrix<double,8,8,1,8,8>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,Eigen::Matrix<double,8,1,0,8,1>>
            (&local_280,(Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_> *)&local_2000,&local_c80,
             (Scalar *)local_1480);
  local_1480._0_8_ = (PointerType)0x3ff0000000000000;
  local_cc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[0] =
       0.0;
  local_cc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[1] =
       0.0;
  local_cc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[2] =
       0.0;
  local_cc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[3] =
       0.0;
  local_cc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[4] =
       0.0;
  local_cc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[5] =
       0.0;
  local_cc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[6] =
       0.0;
  local_cc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[7] =
       0.0;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0] = (double)Ny;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Matrix<double,8,8,1,8,8>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,Eigen::Matrix<double,8,1,0,8,1>>
            (&local_280,(Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_> *)&local_2000,&local_cc0,
             (Scalar *)local_1480);
  local_1480._0_8_ = (PointerType)0x3ff0000000000000;
  local_b08._72_8_ = 0.0;
  dStack_ab8 = 0.0;
  dStack_ab0 = 0.0;
  dStack_aa8 = 0.0;
  dStack_aa0 = 0.0;
  dStack_a98 = 0.0;
  dStack_a90 = 0.0;
  dStack_a88 = 0.0;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0]._0_4_ = local_26c0._0_4_;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0]._4_4_ = local_26c0._4_4_;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Matrix<double,8,8,1,8,8>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,Eigen::Matrix<double,8,1,0,8,1>>
            (&local_280,(Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_> *)&local_2000,
             (Matrix<double,_8,_1,_0,_8,_1> *)(local_b08 + 0x48),(Scalar *)local_1480);
  auVar304 = *(undefined1 (*) [64])
              (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
              m_data.array;
  auVar104 = *(undefined1 (*) [64])
              (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
              m_data.array;
  auVar128._8_8_ =
       local_bc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [1];
  auVar128._0_8_ =
       local_bc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [0];
  auVar128._16_8_ =
       local_bc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [2];
  auVar128._24_8_ =
       local_bc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [3];
  auVar128._32_8_ =
       local_bc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [4];
  auVar128._40_8_ =
       local_bc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [5];
  auVar128._48_8_ =
       local_bc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [6];
  auVar128._56_8_ =
       local_bc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [7];
  auVar124._8_8_ =
       local_c80.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [1];
  auVar124._0_8_ =
       local_c80.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [0];
  auVar124._16_8_ =
       local_c80.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [2];
  auVar124._24_8_ =
       local_c80.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [3];
  auVar124._32_8_ =
       local_c80.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [4];
  auVar124._40_8_ =
       local_c80.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [5];
  auVar124._48_8_ =
       local_c80.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [6];
  auVar124._56_8_ =
       local_c80.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [7];
  auVar184 = vsubpd_avx512f(auVar128,auVar124);
  auVar306 = local_2580._0_16_;
  auVar87 = vshufpd_avx512vl(auVar306,auVar306,1);
  auVar303 = local_2440._0_16_;
  auVar85 = vshufpd_avx512vl(auVar303,auVar303,1);
  auVar305 = local_2540._0_16_;
  auVar94 = vshufpd_avx512vl(auVar305,auVar305,1);
  dVar290 = local_2480._0_8_;
  auVar184 = vmulpd_avx512f(auVar304,auVar184);
  auVar286._8_8_ = 0;
  auVar286._0_8_ = dVar290 * auVar87._0_8_;
  auVar92 = vfmadd231sd_avx512f(auVar286,auVar303,auVar306);
  auVar102 = vextractf64x4_avx512f(auVar184,1);
  auVar302 = vbroadcastsd_avx512f(auVar92);
  dVar131 = auVar184._0_8_ + auVar102._0_8_ + auVar184._8_8_ + auVar102._8_8_;
  dVar151 = auVar184._16_8_ + auVar102._16_8_ + auVar184._24_8_ + auVar102._24_8_;
  auVar234._0_8_ = dVar131 + dVar151;
  auVar234._8_8_ = dVar131 + dVar151;
  auVar129._8_8_ =
       local_c00.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [1];
  auVar129._0_8_ =
       local_c00.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [0];
  auVar129._16_8_ =
       local_c00.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [2];
  auVar129._24_8_ =
       local_c00.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [3];
  auVar129._32_8_ =
       local_c00.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [4];
  auVar129._40_8_ =
       local_c00.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [5];
  auVar129._48_8_ =
       local_c00.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [6];
  auVar129._56_8_ =
       local_c00.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [7];
  auVar116._8_8_ =
       local_cc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [1];
  auVar116._0_8_ =
       local_cc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [0];
  auVar116._16_8_ =
       local_cc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [2];
  auVar116._24_8_ =
       local_cc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [3];
  auVar116._32_8_ =
       local_cc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [4];
  auVar116._40_8_ =
       local_cc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [5];
  auVar116._48_8_ =
       local_cc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [6];
  auVar116._56_8_ =
       local_cc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [7];
  auVar184 = vsubpd_avx512f(auVar129,auVar116);
  local_1480._0_8_ = local_780;
  auVar91 = vmulsd_avx512f(auVar234,ZEXT816(0x3fe0000000000000));
  auVar106 = vmulpd_avx512f(auVar104,auVar184);
  auVar184 = vmulpd_avx512f(auVar304,auVar184);
  auVar102 = vextractf64x4_avx512f(auVar106,1);
  dVar131 = auVar106._0_8_ + auVar102._0_8_ + auVar106._8_8_ + auVar102._8_8_;
  dVar151 = auVar106._16_8_ + auVar102._16_8_ + auVar106._24_8_ + auVar102._24_8_;
  auVar238._0_8_ = dVar131 + dVar151;
  auVar238._8_8_ = dVar131 + dVar151;
  auVar102 = vextractf64x4_avx512f(auVar184,1);
  auVar92 = vmulsd_avx512f(auVar238,ZEXT816(0x3fe0000000000000));
  dVar151 = auVar184._0_8_ + auVar102._0_8_ + auVar184._8_8_ + auVar102._8_8_;
  dVar152 = auVar184._16_8_ + auVar102._16_8_ + auVar184._24_8_ + auVar102._24_8_;
  auVar127._8_8_ =
       local_c40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [1];
  auVar127._0_8_ =
       local_c40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [0];
  auVar127._16_8_ =
       local_c40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [2];
  auVar127._24_8_ =
       local_c40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [3];
  auVar127._32_8_ =
       local_c40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [4];
  auVar127._40_8_ =
       local_c40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [5];
  auVar127._48_8_ =
       local_c40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [6];
  auVar127._56_8_ =
       local_c40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [7];
  auVar93 = vmovddup_avx512vl(auVar92);
  dVar131 = auVar92._0_8_ + auVar92._0_8_;
  auVar117._8_8_ = dStack_ab8;
  auVar117._0_8_ = local_b08._72_8_;
  auVar117._16_8_ = dStack_ab0;
  auVar117._24_8_ = dStack_aa8;
  auVar117._32_8_ = dStack_aa0;
  auVar117._40_8_ = dStack_a98;
  auVar117._48_8_ = dStack_a90;
  auVar117._56_8_ = dStack_a88;
  auVar184 = vsubpd_avx512f(auVar127,auVar117);
  auVar106 = vmulpd_avx512f(auVar184,*(undefined1 (*) [64])
                                      (this->Nz).
                                      super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.
                                      m_storage.m_data.array);
  auVar135._0_8_ = dVar151 + dVar152;
  auVar135._8_8_ = dVar151 + dVar152;
  auVar104 = vmulpd_avx512f(auVar104,auVar184);
  auVar304 = vmulpd_avx512f(auVar304,auVar184);
  auVar102 = vextractf64x4_avx512f(auVar106,1);
  auVar103 = vextractf64x4_avx512f(auVar104,1);
  dVar130 = auVar106._0_8_ + auVar102._0_8_ + auVar106._8_8_ + auVar102._8_8_;
  dVar216 = auVar106._16_8_ + auVar102._16_8_ + auVar106._24_8_ + auVar102._24_8_;
  dVar151 = auVar104._0_8_ + auVar103._0_8_ + auVar104._8_8_ + auVar103._8_8_;
  dVar152 = auVar104._16_8_ + auVar103._16_8_ + auVar104._24_8_ + auVar103._24_8_;
  local_1680 = vbroadcastsd_avx512f(auVar303);
  auVar293 = local_2480._0_16_;
  auVar92 = vshufpd_avx(auVar293,auVar293,1);
  auVar248._0_8_ = dVar130 + dVar216;
  auVar248._8_8_ = dVar130 + dVar216;
  auVar102 = vextractf64x4_avx512f(auVar304,1);
  auVar186._0_8_ = dVar151 + dVar152;
  auVar186._8_8_ = dVar151 + dVar152;
  auVar282._8_8_ = 0;
  auVar282._0_8_ = dVar290 * auVar92._0_8_;
  auVar86 = vfmadd231sd_avx512f(auVar282,auVar303,auVar305);
  auVar88 = vmulsd_avx512f(auVar85,auVar135);
  auVar88 = vunpcklpd_avx512vl(auVar135,auVar88);
  auVar89 = vmulsd_avx512f(auVar248,ZEXT816(0x3fe0000000000000));
  auVar90 = vmovddup_avx512vl(auVar91);
  auVar104 = vbroadcastsd_avx512f(auVar86);
  dVar151 = auVar304._0_8_ + auVar102._0_8_ + auVar304._8_8_ + auVar102._8_8_;
  dVar152 = auVar304._16_8_ + auVar102._16_8_ + auVar304._24_8_ + auVar102._24_8_;
  dVar130 = local_1680._8_8_;
  auVar210._8_8_ = dVar130;
  auVar210._0_8_ = dVar290;
  auVar95._0_8_ = local_2540._0_8_;
  dVar216 = local_2480._8_8_;
  auVar95._8_8_ = dVar216;
  auVar86 = vmulsd_avx512f(auVar305,auVar87);
  auVar86 = vunpcklpd_avx(auVar86,local_2660);
  auVar96 = vmulsd_avx512f(auVar94,auVar186);
  auVar97 = vmulpd_avx512vl(auVar95,auVar93);
  auVar98 = vmulpd_avx512vl(auVar210,auVar90);
  auVar257._0_8_ = dVar290 * auVar135._0_8_;
  auVar257._8_8_ = dVar130 * auVar135._8_8_;
  auVar276._0_8_ = auVar95._0_8_ * auVar186._0_8_;
  auVar276._8_8_ = dVar216 * auVar186._8_8_;
  auVar97 = vmulpd_avx512vl(auVar95,auVar97);
  auVar158._0_8_ = dVar151 + dVar152;
  auVar158._8_8_ = dVar151 + dVar152;
  auVar97 = vfmadd231pd_avx512vl(auVar97,auVar210,auVar98);
  auVar266._0_8_ = dVar290 * auVar158._0_8_;
  auVar266._8_8_ = dVar130 * auVar158._8_8_;
  auVar98 = vmulsd_avx512f(auVar85,auVar158);
  auVar97 = vfmadd231pd_avx512vl(auVar97,auVar95,auVar257);
  dVar151 = auVar89._0_8_;
  auVar258._8_8_ = dVar151;
  auVar258._0_8_ = dVar151;
  auVar89 = vmulpd_avx512vl(auVar306,auVar258);
  auVar249._8_8_ = 0;
  auVar249._0_8_ = dVar151 + dVar151;
  auVar85 = vunpcklpd_avx(auVar249,auVar258);
  auVar99 = vshufpd_avx512vl(auVar303,auVar303,3);
  auVar89 = vfmadd213pd_avx512vl(auVar89,auVar306,auVar97);
  auVar89 = vfmadd231pd_avx512vl(auVar89,auVar306,auVar266);
  auVar97 = vunpckhpd_avx512vl(auVar293,local_2380._0_16_);
  auVar89 = vfmadd231pd_avx512vl(auVar89,auVar306,auVar276);
  auVar235._8_8_ = 0;
  auVar235._0_8_ = auVar91._0_8_ + auVar91._0_8_;
  auVar91 = vunpcklpd_avx512vl(auVar235,auVar90);
  auVar90 = vmulsd_avx512f(auVar303,auVar235);
  *(undefined1 (*) [16])
   (this->strain).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
   array = auVar89;
  auVar89 = vunpcklpd_avx512vl(auVar306,local_25c0._0_16_);
  auVar100._0_8_ = auVar104._0_8_;
  auVar100._8_8_ = local_2540._8_8_;
  auVar89 = vfmadd213pd_avx512vl(auVar89,auVar97,auVar86);
  local_d80 = ZEXT1664(auVar89);
  auVar97 = vunpckhpd_avx512vl(auVar293,auVar305);
  auVar267._0_8_ = dVar290 * auVar91._0_8_;
  auVar267._8_8_ = local_2440._8_8_ * auVar91._8_8_;
  auVar239._8_8_ = 0;
  auVar239._0_8_ = dVar131;
  auVar86 = vunpcklpd_avx512vl(auVar239,auVar93);
  auVar91 = vshufpd_avx512vl(auVar305,auVar305,3);
  auVar93 = vmulpd_avx512vl(auVar305,auVar86);
  auVar86 = vunpcklpd_avx(auVar267,auVar90);
  auVar101._0_8_ = auVar302._0_8_;
  auVar101._8_8_ = auVar89._8_8_;
  auVar223._8_8_ = 0;
  auVar223._0_8_ = dVar131 * auVar92._0_8_;
  auVar92 = vunpcklpd_avx(auVar93,auVar223);
  auVar294._0_8_ = auVar97._0_8_ * auVar93._0_8_;
  auVar294._8_8_ = auVar97._8_8_ * auVar93._8_8_;
  auVar224._0_8_ = auVar91._0_8_ * auVar92._0_8_;
  auVar224._8_8_ = auVar91._8_8_ * auVar92._8_8_;
  auVar93 = vfmadd231pd_avx512vl(auVar294,auVar267,auVar303);
  auVar92 = vfmadd213pd_fma(auVar86,auVar99,auVar224);
  auVar225._0_8_ = auVar91._0_8_ * dVar290;
  auVar225._8_8_ = auVar91._8_8_ * dVar130;
  auVar86 = vfmadd231pd_fma(auVar225,auVar99,auVar95);
  local_d00 = ZEXT1664(auVar86);
  auVar93 = vfmadd213pd_avx512vl(auVar100,auVar88,auVar93);
  auVar259._0_8_ = local_2580._0_8_ * auVar85._0_8_;
  auVar259._8_8_ = auVar89._8_8_ * auVar85._8_8_;
  auVar88 = vunpckhpd_avx512vl(auVar306,auVar89);
  auVar85 = vfmadd231pd_fma(auVar92,auVar86,auVar135);
  auVar90 = vshufpd_avx512vl(auVar89,auVar89,3);
  auVar230._8_8_ = 0;
  auVar230._0_8_ = (dVar151 + dVar151) * auVar87._0_8_;
  auVar92 = vunpcklpd_avx(auVar259,auVar230);
  auVar86 = vfmadd213pd_fma(auVar88,auVar259,auVar93);
  auVar87 = vunpcklpd_avx512vl(auVar158,auVar98);
  auVar211._0_8_ = dVar290 * auVar90._0_8_;
  auVar211._8_8_ = dVar130 * auVar90._8_8_;
  auVar93 = vfmadd231pd_avx512vl(auVar211,auVar306,auVar99);
  local_d40 = ZEXT1664(auVar93);
  auVar92 = vfmadd213pd_fma(auVar92,auVar90,auVar85);
  auVar86 = vfmadd213pd_fma(auVar101,auVar87,auVar86);
  auVar85 = vunpcklpd_avx512vl(auVar186,auVar96);
  auVar92 = vfmadd231pd_fma(auVar92,auVar93,auVar158);
  auVar159._0_8_ = auVar95._0_8_ * auVar90._0_8_;
  auVar159._8_8_ = dVar216 * auVar90._8_8_;
  auVar86 = vfmadd213pd_avx512vl(auVar85,auVar89,auVar86);
  auVar85 = vfmadd231pd_avx512vl(auVar159,auVar306,auVar91);
  local_dc0 = ZEXT1664(auVar85);
  *(undefined1 (*) [16])
   ((this->strain).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
    array + 2) = auVar86;
  auVar92 = vfmadd231pd_fma(auVar92,auVar85,auVar186);
  *(undefined1 (*) [16])
   ((this->strain).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
    array + 4) = auVar92;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [4] = (double)this->d;
  dVar131 = (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
            .array[1];
  auVar160._8_8_ = dVar131;
  auVar160._0_8_ = dVar131;
  dVar131 = (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
            .array[0];
  auVar43._8_8_ = dVar131;
  auVar43._0_8_ = dVar131;
  auVar92 = vmulpd_avx512vl(*(undefined1 (*) [16])
                             (((ChMatrixNM<double,_8,_3> *)
                              local_2000.
                              super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.
                              m_storage.m_data.array[4])->
                             super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage
                             .m_data.array,auVar43);
  auVar92 = vfmadd132pd_fma(auVar160,auVar92,
                            *(undefined1 (*) [16])
                             ((((ChMatrixNM<double,_8,_3> *)
                               local_2000.
                               super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.
                               m_storage.m_data.array[4])->
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).
                              m_storage.m_data.array + 3));
  dVar131 = (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
            .array[2];
  auVar136._8_8_ = dVar131;
  auVar136._0_8_ = dVar131;
  auVar92 = vfmadd132pd_fma(auVar136,auVar92,
                            *(undefined1 (*) [16])
                             ((((ChMatrixNM<double,_8,_3> *)
                               local_2000.
                               super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.
                               m_storage.m_data.array[4])->
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).
                              m_storage.m_data.array + 6));
  dVar131 = (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
            .array[3];
  auVar161._8_8_ = dVar131;
  auVar161._0_8_ = dVar131;
  auVar92 = vfmadd132pd_fma(auVar161,auVar92,
                            *(undefined1 (*) [16])
                             ((((ChMatrixNM<double,_8,_3> *)
                               local_2000.
                               super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.
                               m_storage.m_data.array[4])->
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).
                              m_storage.m_data.array + 9));
  dVar131 = (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
            .array[4];
  auVar137._8_8_ = dVar131;
  auVar137._0_8_ = dVar131;
  auVar92 = vfmadd132pd_fma(auVar137,auVar92,
                            *(undefined1 (*) [16])
                             ((((ChMatrixNM<double,_8,_3> *)
                               local_2000.
                               super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.
                               m_storage.m_data.array[4])->
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).
                              m_storage.m_data.array + 0xc));
  dVar131 = (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
            .array[5];
  auVar162._8_8_ = dVar131;
  auVar162._0_8_ = dVar131;
  auVar92 = vfmadd132pd_fma(auVar162,auVar92,
                            *(undefined1 (*) [16])
                             ((((ChMatrixNM<double,_8,_3> *)
                               local_2000.
                               super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.
                               m_storage.m_data.array[4])->
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).
                              m_storage.m_data.array + 0xf));
  dVar131 = (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
            .array[6];
  auVar138._8_8_ = dVar131;
  auVar138._0_8_ = dVar131;
  auVar92 = vfmadd132pd_fma(auVar138,auVar92,
                            *(undefined1 (*) [16])
                             ((((ChMatrixNM<double,_8,_3> *)
                               local_2000.
                               super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.
                               m_storage.m_data.array[4])->
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).
                              m_storage.m_data.array + 0x12));
  dVar131 = (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
            .array[7];
  auVar163._8_8_ = dVar131;
  auVar163._0_8_ = dVar131;
  auVar92 = vfmadd231pd_fma(auVar92,auVar163,
                            *(undefined1 (*) [16])
                             ((((ChMatrixNM<double,_8,_3> *)
                               local_2000.
                               super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.
                               m_storage.m_data.array[4])->
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).
                              m_storage.m_data.array + 0x15));
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [1] = auVar92._8_8_;
  auVar304 = vbroadcastsd_avx512f(auVar92);
  auVar164._8_8_ = 0;
  auVar164._0_8_ =
       (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[0] *
       (((ChMatrixNM<double,_8,_3> *)
        local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
        array[4])->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
       array[2] +
       (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[1] *
       (((ChMatrixNM<double,_8,_3> *)
        local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
        array[4])->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
       array[5] +
       (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[2] *
       (((ChMatrixNM<double,_8,_3> *)
        local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
        array[4])->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
       array[8] +
       (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[3] *
       (((ChMatrixNM<double,_8,_3> *)
        local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
        array[4])->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
       array[0xb] +
       (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[4] *
       (((ChMatrixNM<double,_8,_3> *)
        local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
        array[4])->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
       array[0xe] +
       (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[5] *
       (((ChMatrixNM<double,_8,_3> *)
        local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
        array[4])->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
       array[0x11] +
       (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[6] *
       (((ChMatrixNM<double,_8,_3> *)
        local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
        array[4])->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
       array[0x14] +
       dVar131 * (((ChMatrixNM<double,_8,_3> *)
                  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.
                  m_storage.m_data.array[4])->
                 super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
                 array[0x17];
  auVar184 = vbroadcastsd_avx512f(auVar164);
  auVar106 = vmulpd_avx512f(auVar304,*(undefined1 (*) [64])
                                      ((this->Sx).
                                       super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>
                                       .m_storage.m_data.array + 0x10));
  auVar107 = vmulpd_avx512f(auVar304,*(undefined1 (*) [64])
                                      ((this->Sx).
                                       super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>
                                       .m_storage.m_data.array + 8));
  auVar304 = vmulpd_avx512f(auVar304,*(undefined1 (*) [64])
                                      (this->Sx).
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>
                                      .m_storage.m_data.array);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage
                 .m_data.array[1];
  auVar105 = vbroadcastsd_avx512f(auVar5);
  auVar106 = vfmadd231pd_avx512f(auVar106,auVar105,
                                 *(undefined1 (*) [64])
                                  ((this->Sx).
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.
                                   m_storage.m_data.array + 0x28));
  auVar107 = vfmadd231pd_avx512f(auVar107,auVar105,
                                 *(undefined1 (*) [64])
                                  ((this->Sx).
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.
                                   m_storage.m_data.array + 0x20));
  auVar304 = vfmadd231pd_avx512f(auVar304,auVar105,
                                 *(undefined1 (*) [64])
                                  ((this->Sx).
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.
                                   m_storage.m_data.array + 0x18));
  local_880 = vfmadd231pd_avx512f(auVar106,auVar184,
                                  *(undefined1 (*) [64])
                                   ((this->Sx).
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.
                                    m_storage.m_data.array + 0x40));
  local_900._64_64_ =
       vfmadd231pd_avx512f(auVar107,auVar184,
                           *(undefined1 (*) [64])
                            ((this->Sx).
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.
                             m_storage.m_data.array + 0x38));
  local_900._0_64_ =
       vfmadd231pd_avx512f(auVar304,auVar184,
                           *(undefined1 (*) [64])
                            ((this->Sx).
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.
                             m_storage.m_data.array + 0x30));
  dVar131 = (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
            .array[1];
  auVar165._8_8_ = dVar131;
  auVar165._0_8_ = dVar131;
  dVar131 = (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
            .array[0];
  auVar44._8_8_ = dVar131;
  auVar44._0_8_ = dVar131;
  auVar92 = vmulpd_avx512vl(*(undefined1 (*) [16])
                             (((ChMatrixNM<double,_8,_3> *)
                              local_2000.
                              super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.
                              m_storage.m_data.array[4])->
                             super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage
                             .m_data.array,auVar44);
  auVar92 = vfmadd132pd_fma(auVar165,auVar92,
                            *(undefined1 (*) [16])
                             ((((ChMatrixNM<double,_8,_3> *)
                               local_2000.
                               super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.
                               m_storage.m_data.array[4])->
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).
                              m_storage.m_data.array + 3));
  dVar131 = (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
            .array[2];
  auVar139._8_8_ = dVar131;
  auVar139._0_8_ = dVar131;
  auVar92 = vfmadd132pd_fma(auVar139,auVar92,
                            *(undefined1 (*) [16])
                             ((((ChMatrixNM<double,_8,_3> *)
                               local_2000.
                               super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.
                               m_storage.m_data.array[4])->
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).
                              m_storage.m_data.array + 6));
  dVar131 = (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
            .array[3];
  auVar166._8_8_ = dVar131;
  auVar166._0_8_ = dVar131;
  auVar92 = vfmadd132pd_fma(auVar166,auVar92,
                            *(undefined1 (*) [16])
                             ((((ChMatrixNM<double,_8,_3> *)
                               local_2000.
                               super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.
                               m_storage.m_data.array[4])->
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).
                              m_storage.m_data.array + 9));
  dVar131 = (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
            .array[4];
  auVar140._8_8_ = dVar131;
  auVar140._0_8_ = dVar131;
  auVar92 = vfmadd132pd_fma(auVar140,auVar92,
                            *(undefined1 (*) [16])
                             ((((ChMatrixNM<double,_8,_3> *)
                               local_2000.
                               super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.
                               m_storage.m_data.array[4])->
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).
                              m_storage.m_data.array + 0xc));
  dVar131 = (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
            .array[5];
  auVar167._8_8_ = dVar131;
  auVar167._0_8_ = dVar131;
  auVar92 = vfmadd132pd_fma(auVar167,auVar92,
                            *(undefined1 (*) [16])
                             ((((ChMatrixNM<double,_8,_3> *)
                               local_2000.
                               super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.
                               m_storage.m_data.array[4])->
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).
                              m_storage.m_data.array + 0xf));
  dVar131 = (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
            .array[6];
  auVar141._8_8_ = dVar131;
  auVar141._0_8_ = dVar131;
  auVar92 = vfmadd132pd_fma(auVar141,auVar92,
                            *(undefined1 (*) [16])
                             ((((ChMatrixNM<double,_8,_3> *)
                               local_2000.
                               super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.
                               m_storage.m_data.array[4])->
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).
                              m_storage.m_data.array + 0x12));
  dVar131 = (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
            .array[7];
  auVar168._8_8_ = dVar131;
  auVar168._0_8_ = dVar131;
  auVar92 = vfmadd231pd_fma(auVar92,auVar168,
                            *(undefined1 (*) [16])
                             ((((ChMatrixNM<double,_8,_3> *)
                               local_2000.
                               super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.
                               m_storage.m_data.array[4])->
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).
                              m_storage.m_data.array + 0x15));
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [1] = auVar92._8_8_;
  auVar304 = vbroadcastsd_avx512f(auVar92);
  auVar169._8_8_ = 0;
  auVar169._0_8_ =
       (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[0] *
       (((ChMatrixNM<double,_8,_3> *)
        local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
        array[4])->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
       array[2] +
       (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[1] *
       (((ChMatrixNM<double,_8,_3> *)
        local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
        array[4])->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
       array[5] +
       (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[2] *
       (((ChMatrixNM<double,_8,_3> *)
        local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
        array[4])->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
       array[8] +
       (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[3] *
       (((ChMatrixNM<double,_8,_3> *)
        local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
        array[4])->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
       array[0xb] +
       (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[4] *
       (((ChMatrixNM<double,_8,_3> *)
        local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
        array[4])->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
       array[0xe] +
       (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[5] *
       (((ChMatrixNM<double,_8,_3> *)
        local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
        array[4])->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
       array[0x11] +
       (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[6] *
       (((ChMatrixNM<double,_8,_3> *)
        local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
        array[4])->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
       array[0x14] +
       dVar131 * (((ChMatrixNM<double,_8,_3> *)
                  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.
                  m_storage.m_data.array[4])->
                 super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
                 array[0x17];
  auVar184 = vbroadcastsd_avx512f(auVar169);
  auVar106 = vmulpd_avx512f(auVar304,*(undefined1 (*) [64])
                                      ((this->Sy).
                                       super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>
                                       .m_storage.m_data.array + 0x10));
  auVar107 = vmulpd_avx512f(auVar304,*(undefined1 (*) [64])
                                      ((this->Sy).
                                       super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>
                                       .m_storage.m_data.array + 8));
  auVar304 = vmulpd_avx512f(auVar304,*(undefined1 (*) [64])
                                      (this->Sy).
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>
                                      .m_storage.m_data.array);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage
                 .m_data.array[1];
  auVar105 = vbroadcastsd_avx512f(auVar6);
  auVar106 = vfmadd231pd_avx512f(auVar106,auVar105,
                                 *(undefined1 (*) [64])
                                  ((this->Sy).
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.
                                   m_storage.m_data.array + 0x28));
  auVar107 = vfmadd231pd_avx512f(auVar107,auVar105,
                                 *(undefined1 (*) [64])
                                  ((this->Sy).
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.
                                   m_storage.m_data.array + 0x20));
  auVar304 = vfmadd231pd_avx512f(auVar304,auVar105,
                                 *(undefined1 (*) [64])
                                  ((this->Sy).
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.
                                   m_storage.m_data.array + 0x18));
  local_7c0 = vfmadd231pd_avx512f(auVar106,auVar184,
                                  *(undefined1 (*) [64])
                                   ((this->Sy).
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.
                                    m_storage.m_data.array + 0x40));
  local_800 = vfmadd231pd_avx512f(auVar107,auVar184,
                                  *(undefined1 (*) [64])
                                   ((this->Sy).
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.
                                    m_storage.m_data.array + 0x38));
  local_840 = vfmadd231pd_avx512f(auVar304,auVar184,
                                  *(undefined1 (*) [64])
                                   ((this->Sy).
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.
                                    m_storage.m_data.array + 0x30));
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0]._0_4_ = local_2600._0_4_;
  uVar71 = local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.
           m_data.array[0]._0_4_;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0]._4_4_ = local_2600._4_4_;
  uVar72 = local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.
           m_data.array[0]._4_4_;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [2] = (double)local_2780;
  sStack_1470.m_other = (double)local_900;
  vStack_1468.m_value = 2;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [5] = (double)local_2770;
  lVar73 = 0;
  vStack_1460.m_value = 0;
  pCStack_1458 = (ChMatrixNM<double,_6,_9> *)0x18;
  local_2660 = auVar94;
  local_25c0 = auVar104;
  local_2380 = auVar302;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [1] = local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
        array[4];
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [3] = (double)Ny;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,24,1,6,24>,1,24,true>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,1,8,1,1,8>,Eigen::Matrix<double,8,3,1,8,3>,0>,Eigen::Matrix<double,3,24,1,3,24>,0>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,1,8,1,1,8>,Eigen::Matrix<double,8,3,1,8,3>,0>,Eigen::Matrix<double,3,24,1,3,24>,0>const>,Eigen::internal::assign_op<double,double>>
            ((Block<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true> *)local_1480,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_3,_1,_8,_3>,_0>,_Eigen::Matrix<double,_3,_24,_1,_3,_24>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_3,_1,_8,_3>,_0>,_Eigen::Matrix<double,_3,_24,_1,_3,_24>,_0>_>
              *)&local_2000,(assign_op<double,_double> *)&local_2290,(type)0x0);
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [4] = (double)this->d;
  dVar131 = (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
            .array[1];
  auVar170._8_8_ = dVar131;
  auVar170._0_8_ = dVar131;
  local_1480._0_8_ = local_600;
  dVar131 = (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
            .array[0];
  auVar45._8_8_ = dVar131;
  auVar45._0_8_ = dVar131;
  auVar92 = vmulpd_avx512vl(*(undefined1 (*) [16])
                             (((ChMatrixNM<double,_8,_3> *)
                              local_2000.
                              super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.
                              m_storage.m_data.array[4])->
                             super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage
                             .m_data.array,auVar45);
  auVar92 = vfmadd132pd_fma(auVar170,auVar92,
                            *(undefined1 (*) [16])
                             ((((ChMatrixNM<double,_8,_3> *)
                               local_2000.
                               super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.
                               m_storage.m_data.array[4])->
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).
                              m_storage.m_data.array + 3));
  dVar131 = (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
            .array[2];
  auVar142._8_8_ = dVar131;
  auVar142._0_8_ = dVar131;
  auVar92 = vfmadd132pd_fma(auVar142,auVar92,
                            *(undefined1 (*) [16])
                             ((((ChMatrixNM<double,_8,_3> *)
                               local_2000.
                               super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.
                               m_storage.m_data.array[4])->
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).
                              m_storage.m_data.array + 6));
  dVar131 = (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
            .array[3];
  auVar171._8_8_ = dVar131;
  auVar171._0_8_ = dVar131;
  auVar92 = vfmadd132pd_fma(auVar171,auVar92,
                            *(undefined1 (*) [16])
                             ((((ChMatrixNM<double,_8,_3> *)
                               local_2000.
                               super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.
                               m_storage.m_data.array[4])->
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).
                              m_storage.m_data.array + 9));
  dVar131 = (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
            .array[4];
  auVar143._8_8_ = dVar131;
  auVar143._0_8_ = dVar131;
  auVar92 = vfmadd132pd_fma(auVar143,auVar92,
                            *(undefined1 (*) [16])
                             ((((ChMatrixNM<double,_8,_3> *)
                               local_2000.
                               super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.
                               m_storage.m_data.array[4])->
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).
                              m_storage.m_data.array + 0xc));
  dVar131 = (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
            .array[5];
  auVar172._8_8_ = dVar131;
  auVar172._0_8_ = dVar131;
  auVar92 = vfmadd132pd_fma(auVar172,auVar92,
                            *(undefined1 (*) [16])
                             ((((ChMatrixNM<double,_8,_3> *)
                               local_2000.
                               super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.
                               m_storage.m_data.array[4])->
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).
                              m_storage.m_data.array + 0xf));
  dVar131 = (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
            .array[6];
  auVar144._8_8_ = dVar131;
  auVar144._0_8_ = dVar131;
  auVar92 = vfmadd132pd_fma(auVar144,auVar92,
                            *(undefined1 (*) [16])
                             ((((ChMatrixNM<double,_8,_3> *)
                               local_2000.
                               super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.
                               m_storage.m_data.array[4])->
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).
                              m_storage.m_data.array + 0x12));
  dVar131 = (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
            .array[7];
  auVar173._8_8_ = dVar131;
  auVar173._0_8_ = dVar131;
  auVar92 = vfmadd231pd_fma(auVar92,auVar173,
                            *(undefined1 (*) [16])
                             ((((ChMatrixNM<double,_8,_3> *)
                               local_2000.
                               super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.
                               m_storage.m_data.array[4])->
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).
                              m_storage.m_data.array + 0x15));
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [1] = auVar92._8_8_;
  auVar304 = vbroadcastsd_avx512f(auVar92);
  auVar174._8_8_ = 0;
  auVar174._0_8_ =
       (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[0] *
       (((ChMatrixNM<double,_8,_3> *)
        local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
        array[4])->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
       array[2] +
       (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[1] *
       (((ChMatrixNM<double,_8,_3> *)
        local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
        array[4])->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
       array[5] +
       (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[2] *
       (((ChMatrixNM<double,_8,_3> *)
        local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
        array[4])->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
       array[8] +
       (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[3] *
       (((ChMatrixNM<double,_8,_3> *)
        local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
        array[4])->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
       array[0xb] +
       (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[4] *
       (((ChMatrixNM<double,_8,_3> *)
        local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
        array[4])->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
       array[0xe] +
       (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[5] *
       (((ChMatrixNM<double,_8,_3> *)
        local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
        array[4])->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
       array[0x11] +
       (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[6] *
       (((ChMatrixNM<double,_8,_3> *)
        local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
        array[4])->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
       array[0x14] +
       dVar131 * (((ChMatrixNM<double,_8,_3> *)
                  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.
                  m_storage.m_data.array[4])->
                 super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
                 array[0x17];
  auVar104 = vbroadcastsd_avx512f(auVar174);
  auVar184 = vmulpd_avx512f(auVar304,*(undefined1 (*) [64])
                                      ((this->Sz).
                                       super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>
                                       .m_storage.m_data.array + 0x10));
  auVar302 = vmulpd_avx512f(auVar304,*(undefined1 (*) [64])
                                      ((this->Sz).
                                       super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>
                                       .m_storage.m_data.array + 8));
  auVar304 = vmulpd_avx512f(auVar304,*(undefined1 (*) [64])
                                      (this->Sz).
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>
                                      .m_storage.m_data.array);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage
                 .m_data.array[1];
  auVar106 = vbroadcastsd_avx512f(auVar7);
  auVar184 = vfmadd231pd_avx512f(auVar184,auVar106,
                                 *(undefined1 (*) [64])
                                  ((this->Sz).
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.
                                   m_storage.m_data.array + 0x28));
  auVar302 = vfmadd231pd_avx512f(auVar302,auVar106,
                                 *(undefined1 (*) [64])
                                  ((this->Sz).
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.
                                   m_storage.m_data.array + 0x20));
  auVar304 = vfmadd231pd_avx512f(auVar304,auVar106,
                                 *(undefined1 (*) [64])
                                  ((this->Sz).
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.
                                   m_storage.m_data.array + 0x18));
  local_640 = vfmadd231pd_avx512f(auVar184,auVar104,
                                  *(undefined1 (*) [64])
                                   ((this->Sz).
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.
                                    m_storage.m_data.array + 0x40));
  local_680 = vfmadd231pd_avx512f(auVar302,auVar104,
                                  *(undefined1 (*) [64])
                                   ((this->Sz).
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.
                                    m_storage.m_data.array + 0x38));
  local_6c0 = vfmadd231pd_avx512f(auVar304,auVar104,
                                  *(undefined1 (*) [64])
                                   ((this->Sz).
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.
                                    m_storage.m_data.array + 0x30));
  uVar53 = local_2650._0_8_;
  sStack_1470.m_other = (double)local_900;
  vStack_1468.m_value = 4;
  vStack_1460.m_value = 0;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [2] = (double)local_2650._0_8_;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [3] = (double)local_26c0._0_8_;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [5] = (double)local_2770;
  pCStack_1458 = (ChMatrixNM<double,_6,_9> *)0x18;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0]._0_4_ = uVar71;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0]._4_4_ = uVar72;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [1] = local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
        array[4];
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,24,1,6,24>,1,24,true>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,1,8,1,1,8>,Eigen::Matrix<double,8,3,1,8,3>,0>,Eigen::Matrix<double,3,24,1,3,24>,0>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,1,8,1,1,8>,Eigen::Matrix<double,8,3,1,8,3>,0>,Eigen::Matrix<double,3,24,1,3,24>,0>const>,Eigen::internal::assign_op<double,double>>
            ((Block<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true> *)local_1480,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_3,_1,_8,_3>,_0>,_Eigen::Matrix<double,_3,_24,_1,_3,_24>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_3,_1,_8,_3>,_0>,_Eigen::Matrix<double,_3,_24,_1,_3,_24>,_0>_>
              *)&local_2000,(assign_op<double,_double> *)&local_2290,(type)0x0);
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [1] = (double)this->d;
  local_1480._0_8_ = local_540;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [2] = (double)uVar53;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [3] = (double)local_26c0._0_8_;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [5] = (double)local_2780;
  vStack_1468.m_value = 5;
  vStack_1460.m_value = 0;
  pCStack_1458 = (ChMatrixNM<double,_6,_9> *)0x18;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [4] = local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
        array[1];
  sStack_1470.m_other = (double)local_900;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0] = (double)Ny;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,24,1,6,24>,1,24,true>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,1,8,1,1,8>,Eigen::Matrix<double,8,3,1,8,3>,0>,Eigen::Matrix<double,3,24,1,3,24>,0>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,1,8,1,1,8>,Eigen::Matrix<double,8,3,1,8,3>,0>,Eigen::Matrix<double,3,24,1,3,24>,0>const>,Eigen::internal::assign_op<double,double>>
            ((Block<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true> *)local_1480,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_3,_1,_8,_3>,_0>,_Eigen::Matrix<double,_3,_24,_1,_3,_24>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_3,_1,_8,_3>,_0>,_Eigen::Matrix<double,_3,_24,_1,_3,_24>,_0>_>
              *)&local_2000,(assign_op<double,_double> *)&local_2290,(type)0x0);
  auVar304 = vbroadcastsd_avx512f(ZEXT816(1));
  a_rhs = &this->strainD;
  auVar104 = vpermpd_avx512f(auVar304,local_2440);
  auVar184 = vbroadcastsd_avx512f(local_2480._0_16_);
  auVar302 = vbroadcastsd_avx512f(local_2540._0_16_);
  auVar106 = vbroadcastsd_avx512f(local_2580._0_16_);
  auVar107 = vbroadcastsd_avx512f(local_d80._0_16_);
  auVar105 = vbroadcastsd_avx512f(local_d00._0_16_);
  auVar108 = vbroadcastsd_avx512f(local_d40._0_16_);
  auVar109 = vpermpd_avx512f(auVar304,local_2480);
  auVar110 = vpermpd_avx512f(auVar304,local_2580);
  auVar111 = vpermpd_avx512f(auVar304,local_2540);
  auVar112 = vpermpd_avx512f(auVar304,local_d80);
  auVar113 = vpermpd_avx512f(auVar304,local_d00);
  auVar114 = vpermpd_avx512f(auVar304,local_d40);
  auVar304 = vpermpd_avx512f(auVar304,local_dc0);
  auVar115 = vbroadcastsd_avx512f(local_dc0._0_16_);
  auVar250._8_8_ = 0;
  auVar250._0_8_ = (double)local_2660._0_8_ * (double)local_900._40_8_;
  auVar116 = vbroadcastsd_avx512f(auVar250);
  do {
    auVar124 = *(undefined1 (*) [64])(local_840 + lVar73 * 8);
    auVar127 = *(undefined1 (*) [64])(local_900 + lVar73 * 8);
    auVar129 = *(undefined1 (*) [64])(local_780 + lVar73);
    auVar128 = *(undefined1 (*) [64])(local_6c0 + lVar73 * 8);
    auVar117 = vmulpd_avx512f(auVar302,auVar124);
    auVar118 = vmulpd_avx512f(auVar184,auVar127);
    auVar119 = vmulpd_avx512f(auVar109,auVar124);
    auVar120 = vaddpd_avx512f(auVar128,auVar128);
    auVar117 = vmulpd_avx512f(auVar302,auVar117);
    auVar121 = vmulpd_avx512f(auVar106,auVar120);
    auVar117 = vfmadd231pd_avx512f(auVar117,auVar184,auVar118);
    auVar118 = vmulpd_avx512f(auVar184,auVar129);
    auVar117 = vfmadd213pd_avx512f(auVar118,auVar302,auVar117);
    auVar118 = vmulpd_avx512f(auVar106,auVar128);
    auVar118 = vfmadd213pd_avx512f(auVar118,auVar106,auVar117);
    auVar117 = *(undefined1 (*) [64])(local_600 + lVar73);
    auVar122 = vmulpd_avx512f(auVar184,auVar117);
    auVar122 = vfmadd213pd_avx512f(auVar122,auVar106,auVar118);
    auVar118 = *(undefined1 (*) [64])(local_540 + lVar73);
    auVar123 = vmulpd_avx512f(auVar302,auVar118);
    auVar122 = vfmadd213pd_avx512f(auVar123,auVar106,auVar122);
    auVar123 = vmulpd_avx512f(local_1680,auVar127);
    *(undefined1 (*) [64])
     ((a_rhs->super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>).m_storage.m_data.array
     + lVar73) = auVar122;
    auVar119 = vmulpd_avx512f(auVar109,auVar119);
    auVar122 = vaddpd_avx512f(auVar124,auVar124);
    auVar124 = vmulpd_avx512f(auVar111,auVar124);
    auVar119 = vfmadd231pd_avx512f(auVar119,local_1680,auVar123);
    auVar123 = vmulpd_avx512f(local_1680,auVar129);
    auVar124 = vmulpd_avx512f(auVar111,auVar124);
    auVar125 = vmulpd_avx512f(auVar302,auVar122);
    auVar126 = vmulpd_avx512f(auVar109,auVar125);
    auVar119 = vfmadd213pd_avx512f(auVar123,auVar109,auVar119);
    auVar123 = vmulpd_avx512f(auVar110,auVar128);
    auVar119 = vfmadd213pd_avx512f(auVar123,auVar110,auVar119);
    auVar123 = vmulpd_avx512f(local_1680,auVar117);
    auVar119 = vfmadd213pd_avx512f(auVar123,auVar110,auVar119);
    auVar123 = vmulpd_avx512f(auVar109,auVar118);
    auVar119 = vfmadd213pd_avx512f(auVar123,auVar110,auVar119);
    auVar123 = vaddpd_avx512f(auVar127,auVar127);
    auVar127 = vmulpd_avx512f(auVar104,auVar127);
    auVar124 = vfmadd231pd_avx512f(auVar124,auVar104,auVar127);
    auVar127 = vmulpd_avx512f(auVar104,auVar129);
    *(undefined1 (*) [64])
     ((this->strainD).super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.
      m_data.array + lVar73 + 0x18) = auVar119;
    auVar119 = vmulpd_avx512f(auVar184,auVar123);
    auVar124 = vfmadd213pd_avx512f(auVar127,auVar111,auVar124);
    auVar127 = vmulpd_avx512f(auVar112,auVar128);
    auVar128 = vfmadd231pd_avx512f(auVar126,auVar119,local_1680);
    auVar123 = vmulpd_avx512f(local_1680,auVar123);
    auVar124 = vfmadd213pd_avx512f(auVar127,auVar112,auVar124);
    auVar127 = vmulpd_avx512f(auVar104,auVar117);
    auVar128 = vfmadd231pd_avx512f(auVar128,auVar129,local_25c0);
    auVar124 = vfmadd213pd_avx512f(auVar127,auVar112,auVar124);
    auVar127 = vmulpd_avx512f(auVar111,auVar125);
    auVar128 = vfmadd231pd_avx512f(auVar128,auVar121,auVar110);
    auVar127 = vfmadd231pd_avx512f(auVar127,auVar104,auVar119);
    auVar128 = vfmadd231pd_avx512f(auVar128,auVar117,local_2380);
    auVar124 = vfmadd231pd_avx512f(auVar124,auVar116,auVar112);
    auVar127 = vfmadd231pd_avx512f(auVar127,auVar129,auVar105);
    auVar128 = vfmadd231pd_avx512f(auVar128,auVar118,auVar107);
    auVar127 = vfmadd231pd_avx512f(auVar127,auVar112,auVar121);
    *(undefined1 (*) [64])
     ((this->strainD).super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.
      m_data.array + lVar73 + 0x30) = auVar128;
    *(undefined1 (*) [64])
     ((this->strainD).super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.
      m_data.array + lVar73 + 0x48) = auVar124;
    auVar124 = vfmadd231pd_avx512f(auVar127,auVar117,auVar108);
    auVar124 = vfmadd231pd_avx512f(auVar124,auVar118,auVar115);
    *(undefined1 (*) [64])
     ((this->strainD).super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.
      m_data.array + lVar73 + 0x60) = auVar124;
    auVar124 = vmulpd_avx512f(auVar109,auVar122);
    auVar124 = vmulpd_avx512f(auVar111,auVar124);
    auVar124 = vfmadd231pd_avx512f(auVar124,auVar104,auVar123);
    auVar124 = vfmadd231pd_avx512f(auVar124,auVar113,auVar129);
    auVar127 = vmulpd_avx512f(auVar110,auVar120);
    auVar124 = vfmadd213pd_avx512f(auVar127,auVar112,auVar124);
    auVar124 = vfmadd231pd_avx512f(auVar124,auVar114,auVar117);
    auVar124 = vfmadd231pd_avx512f(auVar124,auVar304,auVar118);
    *(undefined1 (*) [64])
     ((this->strainD).super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.
      m_data.array + lVar73 + 0x78) = auVar124;
    lVar73 = lVar73 + 8;
  } while (lVar73 != 0x18);
  dVar131 = (this->strain_EAS).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
            m_storage.m_data.array[2];
  dVar151 = (this->strain_EAS).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
            m_storage.m_data.array[3];
  dVar152 = (this->strain_EAS).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
            m_storage.m_data.array[4];
  dVar130 = (this->strain_EAS).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
            m_storage.m_data.array[5];
  auVar187._0_8_ =
       (this->strain_EAS).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
       m_data.array[0] +
       (this->strain).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
       array[0];
  auVar187._8_8_ =
       (this->strain_EAS).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
       m_data.array[1] +
       (this->strain).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
       array[1];
  *(undefined1 (*) [16])
   (this->strain).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
   array = auVar187;
  auVar175._0_8_ =
       dVar131 + (this->strain).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                 m_storage.m_data.array[2];
  auVar175._8_8_ =
       dVar151 + (this->strain).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                 m_storage.m_data.array[3];
  *(undefined1 (*) [16])
   ((this->strain).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
    array + 2) = auVar175;
  auVar145._0_8_ =
       dVar152 + (this->strain).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                 m_storage.m_data.array[4];
  auVar145._8_8_ =
       dVar130 + (this->strain).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                 m_storage.m_data.array[5];
  *(undefined1 (*) [16])
   ((this->strain).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
    array + 4) = auVar145;
  if (this->element->m_isMooney == true) {
    auVar86 = ZEXT816(0x4000000000000000);
    auVar85 = ZEXT816(0x3ff0000000000000);
    auVar92 = vfmadd213sd_fma(auVar187,auVar86,auVar85);
    local_1480._0_8_ = auVar92._0_8_;
    auVar188._8_8_ = 0;
    auVar188._0_8_ =
         (this->strain).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
         m_data.array[1];
    auVar92 = vfmadd132sd_fma(auVar188,auVar85,auVar86);
    vStack_1460.m_value = auVar92._0_8_;
    auVar189._8_8_ = 0;
    auVar189._0_8_ =
         (this->strain).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
         m_data.array[3];
    auVar92 = vfmadd132sd_fma(auVar189,auVar85,auVar86);
    dStack_1440 = auVar92._0_8_;
    vStack_1468.m_value = vmovlpd_avx(auVar175);
    unique0x00106900 = (LhsNested)vunpcklpd_avx(auVar175,auVar145);
    pCStack_1458 = (ChMatrixNM<double,_6,_9> *)vmovhpd_avx(auVar145);
    auStack_1450 = auVar145;
    local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
    [0] = (double)local_1480;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run((Matrix<double,_3,_3,_1,_3,_3> *)&local_2290,(SrcXprType *)&local_2000,
          (assign_op<double,_double> *)&local_1910);
    auVar146._8_8_ = 0;
    auVar146._0_8_ = vStack_1460.m_value;
    auVar295._8_8_ = 0;
    auVar295._0_8_ = auStack_1450._8_8_;
    auVar287._8_8_ = 0;
    auVar287._0_8_ = sStack_1470.m_other;
    auVar212._8_8_ = 0;
    auVar212._0_8_ = dStack_1440;
    dVar151 = (double)local_1480._0_8_ * (double)local_1480._0_8_;
    dVar152 = (double)vStack_1468.m_value * (double)vStack_1468.m_value;
    auVar298._8_8_ = 0;
    auVar298._0_8_ = auStack_1450._0_8_;
    auVar86 = vmulsd_avx512f(auVar298,auVar298);
    dVar130 = (double)local_1480._8_8_ * (double)local_1480._8_8_;
    dVar216 = (double)vStack_1460.m_value * (double)vStack_1460.m_value;
    dVar290 = (double)pCStack_1458 * (double)pCStack_1458;
    dVar31 = dStack_1440 * dStack_1440;
    dVar131 = (double)local_1480._0_8_ + (double)vStack_1460.m_value + dStack_1440;
    local_26c0._0_8_ = dVar131;
    dVar206 = sStack_1470.m_other * sStack_1470.m_other;
    dVar217 = (double)auStack_1450._8_8_ * (double)auStack_1450._8_8_;
    auVar299._8_8_ = 0;
    auVar299._0_8_ = auStack_1450._0_8_;
    auVar85 = vmulsd_avx512f(auVar146,auVar299);
    auVar176._8_8_ = 0;
    auVar176._0_8_ = (double)auStack_1450._8_8_ * (double)pCStack_1458 * (double)local_1480._0_8_;
    auVar198._8_8_ = 0;
    auVar198._0_8_ = (double)local_1480._0_8_ * (double)vStack_1460.m_value;
    auVar92 = vfmsub231sd_fma(auVar176,auVar212,auVar198);
    auVar199._8_8_ = 0;
    auVar199._0_8_ = (double)pCStack_1458 * (double)local_1480._8_8_;
    auVar92 = vfmadd213sd_avx512f(auVar199,auVar299,auVar92);
    auVar177._8_8_ = 0;
    auVar177._0_8_ = (double)vStack_1468.m_value * (double)local_1480._8_8_;
    auVar92 = vfnmadd213sd_fma(auVar177,auVar212,auVar92);
    auVar190._8_8_ = 0;
    auVar190._0_8_ = sStack_1470.m_other * (double)vStack_1468.m_value;
    auVar92 = vfmadd213sd_fma(auVar190,auVar295,auVar92);
    auVar92 = vfnmadd213sd_fma(auVar85,auVar287,auVar92);
    dVar132 = auVar92._0_8_;
    local_2600._0_8_ = dVar132;
    local_2610 = a_rhs;
    if (dVar132 < 0.0) {
      local_2780 = (ChMatrixNM<double,_3,_24> *)sqrt(dVar132);
    }
    else {
      auVar92 = vsqrtsd_avx(auVar92,auVar92);
      local_2780 = auVar92._0_8_;
    }
    dVar132 = this->element->CCOM1 + this->element->CCOM2;
    local_2580._0_8_ = (dVar132 + dVar132) / 0.020000000000000018;
    local_2770 = (ChMatrixNM<double,_3,_24> *)((double)local_26c0._0_8_ * 0.3333333333333333);
    local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
    [8] = pow((double)local_2600._0_8_,-0.3333333333333333);
    local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
    [4] = (double)local_2770;
    local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
    [2] = (double)&local_2290;
    ChMatrix33<double>::operator=
              ((ChMatrix33<double> *)&local_1910,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
                *)&local_2000);
    local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
    [0x13] = pow((double)local_2600._0_8_,-0.6666666666666666);
    local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
    [5] = (double)local_26c0._0_8_;
    local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
    [0xc] = 0.6666666666666666;
    local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
    [7] = (double)local_1480;
    local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
    [10] = (double)&local_2290;
    local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
    [0xf] = (double)((dVar131 * dVar131 -
                     (dVar31 + dVar290 + dVar206 + dVar217 + dVar216 + dVar130 + auVar86._0_8_ +
                                                                                 dVar151 + dVar152))
                    * 0.5);
    ChMatrix33<double>::operator=
              (&local_990,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
                *)&local_2000);
    local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
    [0xb] = (double)&local_a70;
    dStack_a38 = (double)local_2780 * 0.5;
    local_a70 = dStack_a38 *
                local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
                m_data.array[0];
    dStack_a68 = dStack_a38 *
                 local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage
                 .m_data.array[1];
    local_a30 = dStack_a38 *
                local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
                m_data.array[8];
    local_a60 = dStack_a38 *
                local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
                m_data.array[2];
    dStack_a58 = dStack_a38 *
                 local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage
                 .m_data.array[3];
    local_a50 = dStack_a38 *
                local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
                m_data.array[4];
    dStack_a48 = dStack_a38 *
                 local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage
                 .m_data.array[5];
    local_a40 = dStack_a38 *
                local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
                m_data.array[6];
    dStack_a38 = dStack_a38 *
                 local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage
                 .m_data.array[7];
    pCVar77 = this->element;
    local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
    [0xd] = ((double)local_2780 + -1.0) * (double)local_2580._0_8_;
    local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
    [0xd] = local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.
            m_data.array[0xd] +
            local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.
            m_data.array[0xd];
    local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
    [4] = pCVar77->CCOM1 + pCVar77->CCOM1;
    local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
    [8] = pCVar77->CCOM2 + pCVar77->CCOM2;
    local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
    [2] = (double)&local_1910;
    local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
    [6] = (double)&local_990;
    ChMatrix33<double>::operator=
              (&local_9d8,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>_>
                *)&local_2000);
    auVar304 = ZEXT864(0) << 0x40;
    local_2750 = local_9d8.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
    _local_2748 = vgatherdpd_avx512vl(*(undefined4 *)
                                       ((long)((long)(&local_9d8)[-2].
                                                     super_Matrix<double,_3,_3,_1,_3,_3>.
                                                                                                          
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                                  .m_storage.m_data.array + 0x10U) +
                                       (long)&(pCVar77->m_StiffnessMatrix).
                                              super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                              .m_storage));
    auVar178._8_8_ = 0;
    auVar178._0_8_ =
         local_9d8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    local_2608 = this;
    pdVar74 = (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
              m_data.array + 4;
    local_25c0._0_8_ = &this->E_eps;
    lVar73 = 0;
    local_2728 = local_9d8.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
    *(undefined1 (*) [64])
     ((this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array + 0x1c) = auVar304;
    *(undefined1 (*) [64])
     ((this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array + 0x18) = auVar304;
    *(undefined1 (*) [64])
     ((this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array + 0x10) = auVar304;
    *(undefined1 (*) [64])
     ((this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array + 8) = auVar304;
    *(undefined1 (*) [64])
     (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
     array = auVar304;
    local_2640[0] =
         (this->strain).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
         m_data.array[0];
    local_2640[1] =
         (this->strain).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
         m_data.array[1];
    local_2640[2] =
         (this->strain).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
         m_data.array[2];
    local_2640[3] =
         (this->strain).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
         m_data.array[3];
    local_2620 = (this->strain).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                 m_storage.m_data.array[4];
    dStack_2618 = (this->strain).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                  m_storage.m_data.array[5];
    auVar102 = vpermpd_avx2(_local_2748,0x90);
    auVar102 = vblendpd_avx(auVar102,ZEXT832((ulong)local_9d8.super_Matrix<double,_3,_3,_1,_3,_3>.
                                                                                                        
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                                  .m_storage.m_data.array[0]),1);
    local_2480._0_32_ = auVar102;
    local_2650 = vshufpd_avx(local_2748._16_16_,auVar178,1);
    do {
      local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
      array[0] = (double)local_2708;
      local_2780 = (ChMatrixNM<double,_3,_24> *)local_2640[lVar73];
      auVar85 = ZEXT816(0x4000000000000000);
      auVar87 = ZEXT816(0x3ff0000000000000);
      local_2640[lVar73] = (double)local_2780 + 1e-06;
      auVar147._8_8_ = 0;
      auVar147._0_8_ = local_2640[0];
      auVar214._8_8_ = 0;
      auVar214._0_8_ = local_2640[1];
      auVar200._8_8_ = 0;
      auVar200._0_8_ = local_2640[3];
      auVar92 = vfmadd132sd_fma(auVar147,auVar87,auVar85);
      auVar86 = vfmadd132sd_fma(auVar214,auVar87,auVar85);
      auVar85 = vfmadd132sd_fma(auVar200,auVar87,auVar85);
      dStack_26d0 = dStack_2618;
      local_2708._48_8_ = local_2620;
      local_2708._0_8_ = auVar92._0_8_;
      local_2708._32_8_ = auVar86._0_8_;
      local_26c8 = auVar85._0_8_;
      local_2708._24_8_ = local_2640[2];
      local_2708._8_8_ = local_2640[2];
      local_2708._16_8_ = vmovlps_avx(unique0x10005472);
      local_2708._40_8_ = dStack_2618;
      Eigen::internal::
      Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
      ::run((Matrix<double,_3,_3,_1,_3,_3> *)local_22e0,(SrcXprType *)&local_2000,
            (assign_op<double,_double> *)local_1630);
      auVar148._8_8_ = 0;
      auVar148._0_8_ = local_2708._32_8_;
      auVar296._8_8_ = 0;
      auVar296._0_8_ = dStack_26d0;
      auVar288._8_8_ = 0;
      auVar288._0_8_ = local_2708._16_8_;
      auVar215._8_8_ = 0;
      auVar215._0_8_ = local_26c8;
      auVar300._8_8_ = 0;
      auVar300._0_8_ = local_2708._48_8_;
      auVar92 = vmulsd_avx512f(auVar300,auVar300);
      dVar131 = (double)local_2708._0_8_ + (double)local_2708._32_8_ + local_26c8;
      local_26c0._0_8_ = dVar131;
      local_2770 = (ChMatrixNM<double,_3,_24> *)
                   ((dVar131 * dVar131 -
                    (local_26c8 * local_26c8 +
                    (double)local_2708._40_8_ * (double)local_2708._40_8_ +
                    (double)local_2708._16_8_ * (double)local_2708._16_8_ +
                    dStack_26d0 * dStack_26d0 +
                    (double)local_2708._32_8_ * (double)local_2708._32_8_ +
                    (double)local_2708._8_8_ * (double)local_2708._8_8_ +
                    auVar92._0_8_ +
                    (double)local_2708._0_8_ * (double)local_2708._0_8_ +
                    (double)local_2708._24_8_ * (double)local_2708._24_8_)) * 0.5);
      auVar179._8_8_ = 0;
      auVar179._0_8_ = dStack_26d0 * (double)local_2708._40_8_ * (double)local_2708._0_8_;
      auVar201._8_8_ = 0;
      auVar201._0_8_ = (double)local_2708._0_8_ * (double)local_2708._32_8_;
      auVar92 = vfmsub231sd_fma(auVar179,auVar215,auVar201);
      auVar202._8_8_ = 0;
      auVar202._0_8_ = (double)local_2708._40_8_ * (double)local_2708._8_8_;
      auVar301._8_8_ = 0;
      auVar301._0_8_ = local_2708._48_8_;
      auVar92 = vfmadd213sd_avx512f(auVar202,auVar301,auVar92);
      auVar180._8_8_ = 0;
      auVar180._0_8_ = (double)local_2708._24_8_ * (double)local_2708._8_8_;
      auVar92 = vfnmadd213sd_fma(auVar180,auVar215,auVar92);
      auVar191._8_8_ = 0;
      auVar191._0_8_ = (double)local_2708._16_8_ * (double)local_2708._24_8_;
      auVar92 = vfmadd213sd_fma(auVar191,auVar296,auVar92);
      auVar86 = vmulsd_avx512f(auVar148,auVar301);
      auVar92 = vfnmadd213sd_fma(auVar86,auVar288,auVar92);
      dVar131 = auVar92._0_8_;
      local_2600._0_8_ = dVar131;
      if (dVar131 < 0.0) {
        dVar151 = sqrt(dVar131);
        dVar131 = (double)local_2600._0_8_;
      }
      else {
        auVar92 = vsqrtsd_avx(auVar92,auVar92);
        dVar151 = auVar92._0_8_;
      }
      local_2540._0_8_ = dVar151;
      local_2440._0_8_ = (double)local_26c0._0_8_ * 0.3333333333333333;
      local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
      array[8] = pow(dVar131,-0.3333333333333333);
      local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
      array[4] = (double)local_2440._0_8_;
      local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
      array[2] = (double)local_22e0;
      ChMatrix33<double>::operator=
                ((ChMatrix33<double> *)local_b08,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
                  *)&local_2000);
      local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
      array[0x13] = pow((double)local_2600._0_8_,-0.6666666666666666);
      local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
      array[7] = (double)local_2708;
      local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
      array[5] = (double)local_26c0._0_8_;
      local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
      array[0xc] = 0.6666666666666666;
      local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
      array[0xf] = (double)local_2770;
      local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
      array[10] = (double)local_22e0;
      ChMatrix33<double>::operator=
                (&local_b50,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
                  *)&local_2000);
      local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
      array[0xb] = (double)&local_2330;
      dStack_22f8 = (double)local_2540._0_8_ * 0.5;
      local_2330 = dStack_22f8 * (double)local_22e0._0_8_;
      dStack_2328 = dStack_22f8 * (double)local_22e0._8_8_;
      local_22f0 = dStack_22f8 * (double)local_22e0._64_8_;
      local_2320 = dStack_22f8 * (double)local_22e0._16_8_;
      dStack_2318 = dStack_22f8 * (double)local_22e0._24_8_;
      local_2310 = dStack_22f8 * (double)local_22e0._32_8_;
      dStack_2308 = dStack_22f8 * (double)local_22e0._40_8_;
      local_2300 = dStack_22f8 * (double)local_22e0._48_8_;
      dStack_22f8 = dStack_22f8 * (double)local_22e0._56_8_;
      local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
      array[0xd] = ((double)local_2540._0_8_ + -1.0) * (double)local_2580._0_8_;
      dVar131 = this->element->CCOM1;
      local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
      array[8] = this->element->CCOM2;
      local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
      array[2] = (double)local_b08;
      local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
      array[6] = (double)&local_b50;
      local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
      array[0xd] = local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.
                   m_storage.m_data.array[0xd] +
                   local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.
                   m_storage.m_data.array[0xd];
      local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
      array[4] = dVar131 + dVar131;
      local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
      array[8] = local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage
                 .m_data.array[8] +
                 local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage
                 .m_data.array[8];
      ChMatrix33<double>::operator=
                ((ChMatrix33<double> *)local_23c8,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>_>
                  *)&local_2000);
      auVar304 = stack0xffffffffffffe9d8;
      a_rhs_00.m_other = local_2720.m_other;
      auVar56._8_8_ = local_23c8._8_8_;
      auVar56._0_8_ = local_23c8._0_8_;
      auVar182._8_8_ = local_23c8._8_8_;
      auVar182._0_8_ = local_23c8._8_8_;
      auVar182._16_8_ = local_23c8._8_8_;
      auVar182._24_8_ = local_23c8._8_8_;
      auVar203._8_8_ = 0x3eb0c6f7a0b5ed8d;
      auVar203._0_8_ = 0x3eb0c6f7a0b5ed8d;
      auVar205._16_8_ = 0x3eb0c6f7a0b5ed8d;
      auVar205._0_16_ = auVar203;
      auVar205._24_8_ = 0x3eb0c6f7a0b5ed8d;
      auVar92 = vmovhpd_avx(auVar56,local_23a8);
      local_2640[lVar73] = (double)local_2780;
      lVar73 = lVar73 + 1;
      auVar102 = vblendpd_avx(ZEXT1632(auVar92),auVar182,4);
      auVar183._8_8_ = local_2388;
      auVar183._0_8_ = local_2388;
      auVar183._16_8_ = local_2388;
      auVar183._24_8_ = local_2388;
      auVar102 = vblendpd_avx(auVar102,auVar183,8);
      auVar92 = vmovhpd_avx(local_23c8._16_16_,local_23a0);
      auVar102 = vsubpd_avx(auVar102,local_2480._0_32_);
      auVar92 = vsubpd_avx(auVar92,local_2650);
      auVar102 = vdivpd_avx(auVar102,auVar205);
      auVar92 = vdivpd_avx(auVar92,auVar203);
      *(undefined1 (*) [32])((plain_array<double,_36,_1,_32> *)(pdVar74 + -4))->array = auVar102;
      *(undefined1 (*) [16])pdVar74 = auVar92;
      pdVar74 = pdVar74 + 6;
    } while (lVar73 != 6);
    local_24d0.m_dst = (DstEvaluatorType *)&local_2488;
    local_24d0.m_src = (SrcEvaluatorType *)local_1630;
    local_24d0.m_functor = &local_2781;
    local_1630._0_8_ = local_2720.m_other;
    pCStack_1620 = (ChMatrixNM<double,_6,_9> *)local_2720.m_other;
    local_1630._8_8_ = local_25c0._0_8_;
    uStack_1618 = local_25c0._0_8_;
    adStack_1610._8_32_ = auVar304._32_32_;
    adStack_1610[0] = 2.96439387504748e-323;
    local_24d0.m_dstExpr = (DstXprType *)&local_2000;
    local_2488.data = (double *)&local_2000;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_9,_6,_0,_9,_6>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>,_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_1>
    ::run(&local_24d0);
    auVar297._8_8_ = local_2748._0_8_;
    auVar297._0_8_ = local_2748._0_8_;
    auVar260._8_8_ = local_2748._8_8_;
    auVar260._0_8_ = local_2748._8_8_;
    auVar251._8_8_ = dStack_2738;
    auVar251._0_8_ = dStack_2738;
    auVar240._8_8_ = dStack_2730;
    auVar240._0_8_ = dStack_2730;
    local_1630._0_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0];
    auVar20._8_8_ = 0;
    auVar20._0_8_ = local_2748._8_8_;
    auVar304 = vbroadcastsd_avx512f(auVar20);
    register0x000008fc =
         vgatherdpd_avx512f(*(undefined4 *)
                             (&stack0xfffffffffffffff8 +
                             (long)&local_2000.
                                    super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>))
    ;
    local_15e8 = vgatherdpd_avx512f(local_2000.
                                    super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.
                                    m_storage.m_data.array[0]._0_4_);
    local_15a8 = vgatherdpd_avx512f(*(undefined4 *)
                                     (&stack0xfffffffffffffff8 +
                                     (long)&local_2000.
                                            super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>
                                     ));
    local_1568 = vgatherdpd_avx512f(local_2000.
                                    super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.
                                    m_storage.m_data.array[0]._0_4_);
    local_1528 = vgatherdpd_avx512f(*(undefined4 *)
                                     (&stack0xfffffffffffffff8 +
                                     (long)&local_2000.
                                            super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>
                                     ));
    auVar21._8_8_ = 0;
    auVar21._0_8_ = local_2728;
    auVar104 = vbroadcastsd_avx512f(auVar21);
    local_14e8 = vgatherdpd_avx512f(local_2000.
                                    super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.
                                    m_storage.m_data.array[0]._0_4_);
    auVar22._8_8_ = 0;
    auVar22._0_8_ = dStack_2730;
    auVar184 = vbroadcastsd_avx512f(auVar22);
    local_14a8 = local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage
                 .m_data.array[0x11];
    local_14a0 = local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage
                 .m_data.array[0x1a];
    local_1498 = local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage
                 .m_data.array[0x23];
    auVar23._8_8_ = 0;
    auVar23._0_8_ = local_2748._0_8_;
    auVar302 = vbroadcastsd_avx512f(auVar23);
    local_1490 = local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage
                 .m_data.array[0x2c];
    auVar24._8_8_ = 0;
    auVar24._0_8_ = local_2750;
    auVar106 = vbroadcastsd_avx512f(auVar24);
    local_1488 = local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage
                 .m_data.array[0x35];
    auVar25._8_8_ = 0;
    auVar25._0_8_ = dStack_2738;
    auVar107 = vbroadcastsd_avx512f(auVar25);
    auVar105 = vmulpd_avx512f(auVar106,*(undefined1 (*) [64])
                                        (this->strainD).
                                        super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>
                                        .m_storage.m_data.array);
    auVar108 = vmulpd_avx512f(auVar106,*(undefined1 (*) [64])
                                        ((this->strainD).
                                         super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>
                                         .m_storage.m_data.array + 8));
    auVar106 = vmulpd_avx512f(auVar106,*(undefined1 (*) [64])
                                        ((this->strainD).
                                         super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>
                                         .m_storage.m_data.array + 0x10));
    auVar181._8_8_ = local_2728;
    auVar181._0_8_ = local_2728;
    auVar105 = vfmadd231pd_avx512f(auVar105,auVar302,
                                   *(undefined1 (*) [64])
                                    ((this->strainD).
                                     super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.
                                     m_storage.m_data.array + 0x18));
    auVar108 = vfmadd231pd_avx512f(auVar108,auVar302,
                                   *(undefined1 (*) [64])
                                    ((this->strainD).
                                     super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.
                                     m_storage.m_data.array + 0x20));
    auVar302 = vfmadd231pd_avx512f(auVar106,auVar302,
                                   *(undefined1 (*) [64])
                                    ((this->strainD).
                                     super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.
                                     m_storage.m_data.array + 0x28));
    auVar106 = vfmadd231pd_avx512f(auVar105,auVar304,
                                   *(undefined1 (*) [64])
                                    ((this->strainD).
                                     super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.
                                     m_storage.m_data.array + 0x30));
    auVar105 = vfmadd231pd_avx512f(auVar108,auVar304,
                                   *(undefined1 (*) [64])
                                    ((this->strainD).
                                     super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.
                                     m_storage.m_data.array + 0x38));
    auVar304 = vfmadd231pd_avx512f(auVar302,auVar304,
                                   *(undefined1 (*) [64])
                                    ((this->strainD).
                                     super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.
                                     m_storage.m_data.array + 0x40));
    auVar302 = vfmadd231pd_avx512f(auVar106,auVar107,
                                   *(undefined1 (*) [64])
                                    ((this->strainD).
                                     super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.
                                     m_storage.m_data.array + 0x48));
    auVar106 = vfmadd231pd_avx512f(auVar105,auVar107,
                                   *(undefined1 (*) [64])
                                    ((this->strainD).
                                     super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.
                                     m_storage.m_data.array + 0x50));
    auVar304 = vfmadd231pd_avx512f(auVar304,auVar107,
                                   *(undefined1 (*) [64])
                                    ((this->strainD).
                                     super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.
                                     m_storage.m_data.array + 0x58));
    auVar302 = vfmadd231pd_avx512f(auVar302,auVar184,
                                   *(undefined1 (*) [64])
                                    ((this->strainD).
                                     super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.
                                     m_storage.m_data.array + 0x60));
    auVar106 = vfmadd231pd_avx512f(auVar106,auVar184,
                                   *(undefined1 (*) [64])
                                    ((this->strainD).
                                     super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.
                                     m_storage.m_data.array + 0x68));
    auVar304 = vfmadd231pd_avx512f(auVar304,auVar184,
                                   *(undefined1 (*) [64])
                                    ((this->strainD).
                                     super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.
                                     m_storage.m_data.array + 0x70));
    auVar184 = vfmadd231pd_avx512f(auVar302,auVar104,
                                   *(undefined1 (*) [64])
                                    ((this->strainD).
                                     super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.
                                     m_storage.m_data.array + 0x78));
    auVar302 = vfmadd231pd_avx512f(auVar106,auVar104,
                                   *(undefined1 (*) [64])
                                    ((this->strainD).
                                     super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.
                                     m_storage.m_data.array + 0x80));
    auVar304 = vfmadd231pd_avx512f(auVar304,auVar104,
                                   *(undefined1 (*) [64])
                                    ((this->strainD).
                                     super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.
                                     m_storage.m_data.array + 0x88));
    *(undefined1 (*) [64])
     (this->Fint).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.m_data.
     array = auVar184;
    *(undefined1 (*) [64])
     ((this->Fint).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.m_data.
      array + 8) = auVar302;
    *(undefined1 (*) [64])
     ((this->Fint).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.m_data.
      array + 0x10) = auVar304;
    pCVar77 = this->element;
    dVar131 = this->detJ0;
    auVar192._8_8_ = 0;
    auVar192._0_8_ = dVar131;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = (pCVar77->m_InertFlexVec).m_data[0];
    auVar92 = vmulsd_avx512f(ZEXT816(0x3fe0000000000000),auVar26);
    auVar92 = vmulsd_avx512f(auVar192,auVar92);
    auVar149._8_8_ = 0x3fe0000000000000;
    auVar149._0_8_ = 0x3fe0000000000000;
    auVar86 = vmulpd_avx512vl(auVar149,*(undefined1 (*) [16])((pCVar77->m_InertFlexVec).m_data + 1))
    ;
    auVar92 = vmulsd_avx512f(auVar92,auVar86);
    auVar86 = vshufpd_avx512vl(auVar86,auVar86,1);
    auVar92 = vmulsd_avx512f(auVar92,auVar86);
    auVar104 = vbroadcastsd_avx512f(auVar92);
    auVar184 = vmulpd_avx512f(auVar184,auVar104);
    auVar302 = vmulpd_avx512f(auVar302,auVar104);
    *(undefined1 (*) [64])
     (this->Fint).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.m_data.
     array = auVar184;
    auVar304 = vmulpd_avx512f(auVar304,auVar104);
    *(undefined1 (*) [64])
     ((this->Fint).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.m_data.
      array + 8) = auVar302;
    *(undefined1 (*) [64])
     ((this->Fint).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.m_data.
      array + 0x10) = auVar304;
    auVar268._0_8_ =
         local_2750 *
         (this->G).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.
         array[0];
    auVar268._8_8_ =
         local_2750 *
         (this->G).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.
         array[1];
    auVar277._0_8_ =
         local_2750 *
         (this->G).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.
         array[2];
    auVar277._8_8_ =
         local_2750 *
         (this->G).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.
         array[3];
    auVar283._0_8_ =
         local_2750 *
         (this->G).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.
         array[4];
    auVar283._8_8_ =
         local_2750 *
         (this->G).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.
         array[5];
    auVar289._0_8_ =
         local_2750 *
         (this->G).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.
         array[6];
    auVar289._8_8_ =
         local_2750 *
         (this->G).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.m_data.
         array[7];
    auVar92 = vfmadd231pd_fma(auVar268,auVar297,
                              *(undefined1 (*) [16])
                               ((this->G).
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.
                                m_storage.m_data.array + 9));
    auVar86 = vfmadd231pd_fma(auVar277,auVar297,
                              *(undefined1 (*) [16])
                               ((this->G).
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.
                                m_storage.m_data.array + 0xb));
    auVar85 = vfmadd231pd_fma(auVar283,auVar297,
                              *(undefined1 (*) [16])
                               ((this->G).
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.
                                m_storage.m_data.array + 0xd));
    auVar87 = vfmadd231pd_fma(auVar289,auVar297,
                              *(undefined1 (*) [16])
                               ((this->G).
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.
                                m_storage.m_data.array + 0xf));
    auVar92 = vfmadd231pd_fma(auVar92,auVar260,
                              *(undefined1 (*) [16])
                               ((this->G).
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.
                                m_storage.m_data.array + 0x12));
    auVar86 = vfmadd231pd_fma(auVar86,auVar260,
                              *(undefined1 (*) [16])
                               ((this->G).
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.
                                m_storage.m_data.array + 0x14));
    auVar85 = vfmadd231pd_fma(auVar85,auVar260,
                              *(undefined1 (*) [16])
                               ((this->G).
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.
                                m_storage.m_data.array + 0x16));
    auVar87 = vfmadd231pd_fma(auVar87,auVar260,
                              *(undefined1 (*) [16])
                               ((this->G).
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.
                                m_storage.m_data.array + 0x18));
    auVar92 = vfmadd231pd_fma(auVar92,auVar251,
                              *(undefined1 (*) [16])
                               ((this->G).
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.
                                m_storage.m_data.array + 0x1b));
    auVar86 = vfmadd231pd_fma(auVar86,auVar251,
                              *(undefined1 (*) [16])
                               ((this->G).
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.
                                m_storage.m_data.array + 0x1d));
    auVar85 = vfmadd231pd_fma(auVar85,auVar251,
                              *(undefined1 (*) [16])
                               ((this->G).
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.
                                m_storage.m_data.array + 0x1f));
    auVar87 = vfmadd231pd_fma(auVar87,auVar251,
                              *(undefined1 (*) [16])
                               ((this->G).
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.
                                m_storage.m_data.array + 0x21));
    auVar92 = vfmadd231pd_fma(auVar92,auVar240,
                              *(undefined1 (*) [16])
                               ((this->G).
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.
                                m_storage.m_data.array + 0x24));
    auVar86 = vfmadd231pd_fma(auVar86,auVar240,
                              *(undefined1 (*) [16])
                               ((this->G).
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.
                                m_storage.m_data.array + 0x26));
    auVar85 = vfmadd231pd_fma(auVar85,auVar240,
                              *(undefined1 (*) [16])
                               ((this->G).
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.
                                m_storage.m_data.array + 0x28));
    auVar87 = vfmadd231pd_fma(auVar87,auVar240,
                              *(undefined1 (*) [16])
                               ((this->G).
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.
                                m_storage.m_data.array + 0x2a));
    auVar94 = vfmadd231pd_fma(auVar92,auVar181,
                              *(undefined1 (*) [16])
                               ((this->G).
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.
                                m_storage.m_data.array + 0x2d));
    auVar86 = vfmadd231pd_fma(auVar86,auVar181,
                              *(undefined1 (*) [16])
                               ((this->G).
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.
                                m_storage.m_data.array + 0x2f));
    auVar85 = vfmadd231pd_fma(auVar85,auVar181,
                              *(undefined1 (*) [16])
                               ((this->G).
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.
                                m_storage.m_data.array + 0x31));
    auVar87 = vfmadd231pd_fma(auVar87,auVar181,
                              *(undefined1 (*) [16])
                               ((this->G).
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.
                                m_storage.m_data.array + 0x33));
    auVar27._8_8_ = 0;
    auVar27._0_8_ = (pCVar77->m_InertFlexVec).m_data[0];
    auVar91 = vmulsd_avx512f(ZEXT816(0x3fe0000000000000),auVar27);
    auVar204._0_8_ = (pCVar77->m_InertFlexVec).m_data[1] * 0.5;
    auVar204._8_8_ = (pCVar77->m_InertFlexVec).m_data[2] * 0.5;
    auVar92 = vshufpd_avx(auVar204,auVar204,1);
    dStack_2498 = dVar131 * auVar91._0_8_ * auVar204._0_8_ * auVar92._0_8_;
    local_2490 = (local_2750 *
                  (this->G).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.
                  m_data.array[8] +
                  (double)local_2748._0_8_ *
                  (this->G).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.
                  m_data.array[0x11] +
                  (double)local_2748._8_8_ *
                  (this->G).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.
                  m_data.array[0x1a] +
                 dStack_2738 *
                 (this->G).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.
                 m_data.array[0x23] +
                 dStack_2730 *
                 (this->G).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.
                 m_data.array[0x2c] +
                 local_2728 *
                 (this->G).super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>.m_storage.
                 m_data.array[0x35]) * dStack_2498;
    local_24d0.m_dst = (DstEvaluatorType *)(auVar94._0_8_ * dStack_2498);
    local_24d0.m_src = (SrcEvaluatorType *)(auVar94._8_8_ * dStack_2498);
    local_24d0.m_functor = (assign_op<double,_double> *)(auVar86._0_8_ * dStack_2498);
    local_24d0.m_dstExpr = (DstXprType *)(auVar86._8_8_ * dStack_2498);
    dStack_24b0 = auVar85._0_8_ * dStack_2498;
    dStack_24a8 = auVar85._8_8_ * dStack_2498;
    dStack_24a0 = auVar87._0_8_ * dStack_2498;
    dStack_2498 = auVar87._8_8_ * dStack_2498;
    pCVar77 = this->element;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = (pCVar77->m_InertFlexVec).m_data[0];
    auVar86 = vmulsd_avx512f(ZEXT816(0x3fe0000000000000),auVar28);
    auVar150._0_8_ = (pCVar77->m_InertFlexVec).m_data[1] * 0.5;
    auVar150._8_8_ = (pCVar77->m_InertFlexVec).m_data[2] * 0.5;
    auVar92 = vshufpd_avx(auVar150,auVar150,1);
    sStack_1470.m_other = auVar86._0_8_ * this->detJ0 * auVar150._0_8_ * auVar92._0_8_;
    a_rhs = local_2610;
  }
  else {
    local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
    [0] = (double)&local_1910;
    pCVar79 = &this->E_eps;
    local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
    [2] = (double)local_1630;
    local_1480._0_8_ = local_2720.m_other;
    sStack_1470.m_other = local_2720.m_other;
    local_1480._8_8_ = pCVar79;
    vStack_1460.m_value = (long)&DAT_00000006;
    local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
    [1] = (double)local_1480;
    local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
    [3] = (double)&local_2000;
    local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
    [0] = (double)&local_2000;
    vStack_1468.m_value = (long)pCVar79;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_9,_6,_0,_9,_6>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>,_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_1>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_9,_6,_0,_9,_6>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>,_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *)&local_2290);
    lVar73 = 0x10;
    local_1630._0_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0];
    register0x000008fc =
         vgatherdpd_avx512f(local_2000.
                            super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage
                            .m_data.array[0]._0_4_);
    local_15e8 = vgatherdpd_avx512f(*(undefined4 *)
                                     ((long)local_2000.
                                            super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>
                                            .m_storage.m_data.array +
                                     (long)(pCVar79->
                                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                           ).m_storage.m_data.array));
    local_15a8 = vgatherdpd_avx512f(local_2000.
                                    super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.
                                    m_storage.m_data.array[0]._0_4_);
    local_1568 = vgatherdpd_avx512f(*(undefined4 *)
                                     ((long)local_2000.
                                            super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>
                                            .m_storage.m_data.array +
                                     (long)(pCVar79->
                                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                           ).m_storage.m_data.array));
    local_1528 = vgatherdpd_avx512f(local_2000.
                                    super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.
                                    m_storage.m_data.array[0]._0_4_);
    local_14e8 = vgatherdpd_avx512f(*(undefined4 *)
                                     ((long)local_2000.
                                            super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>
                                            .m_storage.m_data.array +
                                     (long)(pCVar79->
                                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                           ).m_storage.m_data.array));
    local_14a8 = local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage
                 .m_data.array[0x11];
    local_14a0 = local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage
                 .m_data.array[0x1a];
    local_1498 = local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage
                 .m_data.array[0x23];
    local_1490 = local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage
                 .m_data.array[0x2c];
    local_1488 = local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage
                 .m_data.array[0x35];
    auVar304 = *(undefined1 (*) [64])
                (this->strainD).super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.
                m_storage.m_data.array;
    auVar104 = *(undefined1 (*) [64])
                ((this->strainD).super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.
                 m_storage.m_data.array + 8);
    auVar184 = *(undefined1 (*) [64])
                ((this->strainD).super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.
                 m_storage.m_data.array + 0x10);
    auVar302 = *(undefined1 (*) [64])
                ((this->strainD).super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.
                 m_storage.m_data.array + 0x18);
    auVar106 = *(undefined1 (*) [64])
                ((this->strainD).super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.
                 m_storage.m_data.array + 0x30);
    auVar107 = *(undefined1 (*) [64])
                ((this->strainD).super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.
                 m_storage.m_data.array + 0x48);
    auVar105 = *(undefined1 (*) [64])
                ((this->strainD).super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.
                 m_storage.m_data.array + 0x60);
    auVar108 = *(undefined1 (*) [64])
                ((this->strainD).super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.
                 m_storage.m_data.array + 0x78);
    auVar109 = *(undefined1 (*) [64])
                ((this->strainD).super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.
                 m_storage.m_data.array + 0x20);
    auVar110 = *(undefined1 (*) [64])
                ((this->strainD).super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.
                 m_storage.m_data.array + 0x38);
    auVar111 = *(undefined1 (*) [64])
                ((this->strainD).super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.
                 m_storage.m_data.array + 0x50);
    auVar112 = *(undefined1 (*) [64])
                ((this->strainD).super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.
                 m_storage.m_data.array + 0x68);
    auVar113 = *(undefined1 (*) [64])
                ((this->strainD).super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.
                 m_storage.m_data.array + 0x80);
    auVar114 = *(undefined1 (*) [64])
                ((this->strainD).super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.
                 m_storage.m_data.array + 0x28);
    auVar115 = *(undefined1 (*) [64])
                ((this->strainD).super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.
                 m_storage.m_data.array + 0x40);
    auVar116 = *(undefined1 (*) [64])
                ((this->strainD).super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.
                 m_storage.m_data.array + 0x58);
    auVar124 = *(undefined1 (*) [64])
                ((this->strainD).super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.
                 m_storage.m_data.array + 0x70);
    auVar127 = *(undefined1 (*) [64])
                ((this->strainD).super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.
                 m_storage.m_data.array + 0x88);
    do {
      auVar8._8_8_ = 0;
      auVar8._0_8_ = (pCVar79->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).
                     m_storage.m_data.array[0];
      auVar129 = vbroadcastsd_avx512f(auVar8);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = (pCVar79->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).
                     m_storage.m_data.array[6];
      auVar128 = vbroadcastsd_avx512f(auVar9);
      auVar10._8_8_ = 0;
      auVar10._0_8_ =
           (pCVar79->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
           array[0xc];
      auVar117 = vbroadcastsd_avx512f(auVar10);
      auVar11._8_8_ = 0;
      auVar11._0_8_ =
           (pCVar79->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
           array[0x12];
      auVar118 = vbroadcastsd_avx512f(auVar11);
      auVar12._8_8_ = 0;
      auVar12._0_8_ =
           (pCVar79->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
           array[0x18];
      auVar119 = vbroadcastsd_avx512f(auVar12);
      auVar13._8_8_ = 0;
      auVar13._0_8_ =
           (pCVar79->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
           array[0x1e];
      auVar120 = vbroadcastsd_avx512f(auVar13);
      pCVar79 = (ChMatrixNM<double,_6,_6> *)
                ((pCVar79->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.
                 m_data.array + 1);
      auVar121 = vmulpd_avx512f(auVar304,auVar129);
      auVar122 = vmulpd_avx512f(auVar104,auVar129);
      auVar129 = vmulpd_avx512f(auVar184,auVar129);
      auVar121 = vfmadd231pd_avx512f(auVar121,auVar302,auVar128);
      auVar122 = vfmadd231pd_avx512f(auVar122,auVar109,auVar128);
      auVar129 = vfmadd231pd_avx512f(auVar129,auVar114,auVar128);
      auVar128 = vfmadd231pd_avx512f(auVar121,auVar106,auVar117);
      auVar121 = vfmadd231pd_avx512f(auVar122,auVar110,auVar117);
      auVar129 = vfmadd231pd_avx512f(auVar129,auVar115,auVar117);
      auVar128 = vfmadd231pd_avx512f(auVar128,auVar107,auVar118);
      auVar117 = vfmadd231pd_avx512f(auVar121,auVar111,auVar118);
      auVar129 = vfmadd231pd_avx512f(auVar129,auVar116,auVar118);
      auVar128 = vfmadd231pd_avx512f(auVar128,auVar105,auVar119);
      auVar117 = vfmadd231pd_avx512f(auVar117,auVar112,auVar119);
      auVar129 = vfmadd231pd_avx512f(auVar129,auVar124,auVar119);
      auVar128 = vfmadd231pd_avx512f(auVar128,auVar108,auVar120);
      auVar117 = vfmadd231pd_avx512f(auVar117,auVar113,auVar120);
      auVar129 = vfmadd231pd_avx512f(auVar129,auVar127,auVar120);
      *(undefined1 (*) [64])
       (local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.
        array + lVar73 + 0x42) = auVar128;
      *(undefined1 (*) [64])(&local_2040 + lVar73) = auVar117;
      *(undefined1 (*) [64])
       (local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
        array + lVar73) = auVar129;
      lVar73 = lVar73 + 0x18;
    } while (lVar73 != 0xa0);
    auVar14._8_8_ = 0;
    auVar14._0_8_ =
         (this->strain).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
         m_data.array[0];
    auVar304 = vbroadcastsd_avx512f(auVar14);
    auVar15._8_8_ = 0;
    auVar15._0_8_ =
         (this->strain).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
         m_data.array[1];
    auVar104 = vbroadcastsd_avx512f(auVar15);
    auVar16._8_8_ = 0;
    auVar16._0_8_ =
         (this->strain).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
         m_data.array[2];
    auVar184 = vbroadcastsd_avx512f(auVar16);
    auVar17._8_8_ = 0;
    auVar17._0_8_ =
         (this->strain).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
         m_data.array[3];
    auVar302 = vbroadcastsd_avx512f(auVar17);
    auVar18._8_8_ = 0;
    auVar18._0_8_ =
         (this->strain).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
         m_data.array[4];
    auVar106 = vbroadcastsd_avx512f(auVar18);
    auVar19._8_8_ = 0;
    auVar19._0_8_ =
         (this->strain).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
         m_data.array[5];
    auVar107 = vbroadcastsd_avx512f(auVar19);
    dVar151 = (this->strain).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
              m_data.array[0];
    dVar152 = (this->strain).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
              m_data.array[1];
    dVar130 = (this->strain).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
              m_data.array[2];
    dVar216 = (this->strain).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
              m_data.array[3];
    dVar290 = (this->strain).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
              m_data.array[4];
    dVar31 = (this->strain).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
             m_data.array[5];
    pdVar74 = adStack_1610;
    lVar73 = 0;
    auVar118._8_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[1];
    auVar118._0_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0];
    auVar118._16_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[2];
    auVar118._24_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[3];
    auVar118._32_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[4];
    auVar118._40_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[5];
    auVar118._48_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[6];
    auVar118._56_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[7];
    auVar105 = vmulpd_avx512f(auVar304,auVar118);
    auVar119._8_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[9];
    auVar119._0_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[8];
    auVar119._16_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[10];
    auVar119._24_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0xb];
    auVar119._32_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0xc];
    auVar119._40_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0xd];
    auVar119._48_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0xe];
    auVar119._56_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0xf];
    auVar108 = vmulpd_avx512f(auVar304,auVar119);
    auVar120._8_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x11];
    auVar120._0_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x10];
    auVar120._16_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x12];
    auVar120._24_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x13];
    auVar120._32_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x14];
    auVar120._40_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x15];
    auVar120._48_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x16];
    auVar120._56_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x17];
    auVar304 = vmulpd_avx512f(auVar304,auVar120);
    auVar121._8_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x19];
    auVar121._0_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x18];
    auVar121._16_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x1a];
    auVar121._24_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x1b];
    auVar121._32_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x1c];
    auVar121._40_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x1d];
    auVar121._48_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x1e];
    auVar121._56_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x1f];
    auVar105 = vfmadd231pd_avx512f(auVar105,auVar104,auVar121);
    auVar122._8_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x21];
    auVar122._0_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x20];
    auVar122._16_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x22];
    auVar122._24_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x23];
    auVar122._32_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x24];
    auVar122._40_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x25];
    auVar122._48_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x26];
    auVar122._56_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x27];
    auVar108 = vfmadd231pd_avx512f(auVar108,auVar104,auVar122);
    auVar123._8_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x29];
    auVar123._0_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x28];
    auVar123._16_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x2a];
    auVar123._24_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x2b];
    auVar123._32_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x2c];
    auVar123._40_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x2d];
    auVar123._48_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x2e];
    auVar123._56_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x2f];
    auVar304 = vfmadd231pd_avx512f(auVar304,auVar104,auVar123);
    auVar125._8_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x31];
    auVar125._0_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x30];
    auVar125._16_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x32];
    auVar125._24_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x33];
    auVar125._32_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x34];
    auVar125._40_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x35];
    auVar125._48_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x36];
    auVar125._56_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x37];
    auVar104 = vfmadd231pd_avx512f(auVar105,auVar184,auVar125);
    auVar126._8_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x39];
    auVar126._0_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x38];
    auVar126._16_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x3a];
    auVar126._24_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x3b];
    auVar126._32_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x3c];
    auVar126._40_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x3d];
    auVar126._48_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x3e];
    auVar126._56_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x3f];
    auVar105 = vfmadd231pd_avx512f(auVar108,auVar184,auVar126);
    auVar57._8_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x41];
    auVar57._0_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x40];
    auVar57._16_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x42];
    auVar57._24_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x43];
    auVar57._32_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x44];
    auVar57._40_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x45];
    auVar57._48_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x46];
    auVar57._56_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x47];
    auVar304 = vfmadd231pd_avx512f(auVar304,auVar184,auVar57);
    auVar58._8_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x49];
    auVar58._0_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x48];
    auVar58._16_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x4a];
    auVar58._24_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x4b];
    auVar58._32_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x4c];
    auVar58._40_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x4d];
    auVar58._48_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x4e];
    auVar58._56_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x4f];
    auVar104 = vfmadd231pd_avx512f(auVar104,auVar302,auVar58);
    auVar59._8_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x51];
    auVar59._0_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x50];
    auVar59._16_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x52];
    auVar59._24_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x53];
    auVar59._32_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x54];
    auVar59._40_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x55];
    auVar59._48_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x56];
    auVar59._56_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x57];
    auVar184 = vfmadd231pd_avx512f(auVar105,auVar302,auVar59);
    auVar60._8_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x59];
    auVar60._0_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x58];
    auVar60._16_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x5a];
    auVar60._24_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x5b];
    auVar60._32_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x5c];
    auVar60._40_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x5d];
    auVar60._48_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x5e];
    auVar60._56_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x5f];
    auVar304 = vfmadd231pd_avx512f(auVar304,auVar302,auVar60);
    auVar61._8_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x61];
    auVar61._0_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x60];
    auVar61._16_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x62];
    auVar61._24_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[99];
    auVar61._32_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[100];
    auVar61._40_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x65];
    auVar61._48_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x66];
    auVar61._56_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x67];
    auVar104 = vfmadd231pd_avx512f(auVar104,auVar106,auVar61);
    auVar62._8_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x69];
    auVar62._0_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x68];
    auVar62._16_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x6a];
    auVar62._24_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x6b];
    auVar62._32_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x6c];
    auVar62._40_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x6d];
    auVar62._48_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x6e];
    auVar62._56_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x6f];
    auVar184 = vfmadd231pd_avx512f(auVar184,auVar106,auVar62);
    auVar63._8_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x71];
    auVar63._0_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x70];
    auVar63._16_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x72];
    auVar63._24_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x73];
    auVar63._32_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x74];
    auVar63._40_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x75];
    auVar63._48_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x76];
    auVar63._56_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x77];
    auVar304 = vfmadd231pd_avx512f(auVar304,auVar106,auVar63);
    auVar64._8_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x79];
    auVar64._0_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x78];
    auVar64._16_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x7a];
    auVar64._24_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x7b];
    auVar64._32_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x7c];
    auVar64._40_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x7d];
    auVar64._48_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x7e];
    auVar64._56_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x7f];
    auVar104 = vfmadd231pd_avx512f(auVar104,auVar107,auVar64);
    auVar65._8_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x81];
    auVar65._0_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x80];
    auVar65._16_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x82];
    auVar65._24_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x83];
    auVar65._32_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x84];
    auVar65._40_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x85];
    auVar65._48_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x86];
    auVar65._56_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x87];
    auVar184 = vfmadd231pd_avx512f(auVar184,auVar107,auVar65);
    auVar66._8_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x89];
    auVar66._0_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x88];
    auVar66._16_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x8a];
    auVar66._24_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x8b];
    auVar66._32_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x8c];
    auVar66._40_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x8d];
    auVar66._48_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x8e];
    auVar66._56_8_ =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0x8f];
    auVar304 = vfmadd231pd_avx512f(auVar304,auVar107,auVar66);
    *(undefined1 (*) [64])
     (this->Fint).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.m_data.
     array = auVar104;
    *(undefined1 (*) [64])
     ((this->Fint).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.m_data.
      array + 8) = auVar184;
    *(undefined1 (*) [64])
     ((this->Fint).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.m_data.
      array + 0x10) = auVar304;
    pCVar77 = this->element;
    dVar131 = this->detJ0;
    auVar46._8_8_ = 0x3fe0000000000000;
    auVar46._0_8_ = 0x3fe0000000000000;
    auVar86 = vmulpd_avx512vl(*(undefined1 (*) [16])((pCVar77->m_InertFlexVec).m_data + 1),auVar46);
    auVar92 = vshufpd_avx(auVar86,auVar86,1);
    auVar226._8_8_ = 0;
    auVar226._0_8_ =
         dVar131 * (pCVar77->m_InertFlexVec).m_data[0] * 0.5 * auVar86._0_8_ * auVar92._0_8_;
    auVar302 = vbroadcastsd_avx512f(auVar226);
    auVar104 = vmulpd_avx512f(auVar104,auVar302);
    auVar184 = vmulpd_avx512f(auVar184,auVar302);
    auVar304 = vmulpd_avx512f(auVar304,auVar302);
    *(undefined1 (*) [64])
     (this->Fint).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.m_data.
     array = auVar104;
    *(undefined1 (*) [64])
     ((this->Fint).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.m_data.
      array + 8) = auVar184;
    *(undefined1 (*) [64])
     ((this->Fint).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.m_data.
      array + 0x10) = auVar304;
    do {
      pdVar2 = pdVar74 + -2;
      pdVar4 = pdVar74 + -1;
      dVar206 = *pdVar74;
      pdVar49 = pdVar74 + 1;
      pdVar3 = pdVar74 + -4;
      pdVar50 = pdVar74 + -3;
      pdVar74 = pdVar74 + 6;
      dVar206 = dVar151 * *pdVar3 + dVar130 * *pdVar2 + dVar290 * dVar206;
      dVar217 = dVar152 * *pdVar50 + dVar216 * *pdVar4 + dVar31 * *pdVar49;
      auVar213._0_8_ = dVar206 + dVar217;
      auVar213._8_8_ = dVar206 + dVar217;
      dVar206 = (double)vmovlpd_avx(auVar213);
      local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
      array[lVar73] = dVar206;
      lVar73 = lVar73 + 1;
    } while (lVar73 != 9);
    auVar47._8_8_ = 0x3fe0000000000000;
    auVar47._0_8_ = 0x3fe0000000000000;
    auVar86 = vmulpd_avx512vl(*(undefined1 (*) [16])((pCVar77->m_InertFlexVec).m_data + 1),auVar47);
    auVar92 = vshufpd_avx(auVar86,auVar86,1);
    sStack_1470.m_other =
         dVar131 * (pCVar77->m_InertFlexVec).m_data[0] * 0.5 * auVar86._0_8_ * auVar92._0_8_;
    local_24d0.m_dst =
         (DstEvaluatorType *)
         (sStack_1470.m_other *
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[0]);
    local_24d0.m_src =
         (SrcEvaluatorType *)
         (sStack_1470.m_other *
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[1]);
    local_24d0.m_functor =
         (assign_op<double,_double> *)
         (local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data
          .array[2] * sStack_1470.m_other);
    local_24d0.m_dstExpr =
         (DstXprType *)
         (local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data
          .array[3] * sStack_1470.m_other);
    dStack_24b0 = local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.
                  m_storage.m_data.array[4] * sStack_1470.m_other;
    dStack_24a8 = local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.
                  m_storage.m_data.array[5] * sStack_1470.m_other;
    dStack_24a0 = local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.
                  m_storage.m_data.array[6] * sStack_1470.m_other;
    dStack_2498 = local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.
                  m_storage.m_data.array[7] * sStack_1470.m_other;
    local_2490 = local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage
                 .m_data.array[8] * sStack_1470.m_other;
    a_rhs_00.m_other = local_2720.m_other;
  }
  vStack_1468.m_value = (long)local_1630;
  lVar73 = 0;
  pCStack_1458 = (ChMatrixNM<double,_6,_9> *)a_rhs_00.m_other;
  memset(&local_2000,0,0x288);
  local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0] = 1.0;
  Eigen::internal::
  generic_product_impl<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,9,6,1,9,6>const>const,Eigen::Matrix<double,9,6,1,9,6>const>,Eigen::Matrix<double,6,9,1,6,9>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,9,9,0,9,9>>
            ((Matrix<double,_9,_9,_0,_9,_9> *)&local_2000,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_6,_1,_9,_6>_>,_const_Eigen::Matrix<double,_9,_6,_1,_9,_6>_>
              *)local_1480,(Matrix<double,_6,_9,_1,_6,_9> *)a_rhs_00.m_other,(Scalar *)&local_2290);
  auVar304 = vpbroadcastq_avx512f();
  auVar104 = vpaddq_avx512f(auVar304,_DAT_00997e00);
  pdVar74 = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
            m_data.array + 1;
  local_2600 = vmovdqa64_avx512f(auVar304);
  do {
    pdVar2 = local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.
             m_data.array + lVar73;
    auVar304 = vpbroadcastq_avx512f();
    lVar73 = lVar73 + 1;
    ((plain_array<double,_72,_1,_64> *)(pdVar74 + -1))->array[0] = *pdVar2;
    auVar304 = vpsllq_avx512f(auVar304,3);
    vpaddq_avx512f(auVar104,auVar304);
    auVar304 = vgatherqpd_avx512f(*pdVar74);
    *(undefined1 (*) [64])pdVar74 = auVar304;
    pdVar74 = pdVar74 + 9;
  } while (lVar73 != 9);
  pCVar77 = this->element;
  lVar73 = 0;
  local_26c0 = vmovdqa64_avx512f(auVar104);
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [3] = (double)local_1630;
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [2] = (pCVar77->m_InertFlexVec).m_data[0] * 0.5 * this->detJ0 *
        (pCVar77->m_InertFlexVec).m_data[1] * 0.5 * (pCVar77->m_InertFlexVec).m_data[2] * 0.5;
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [5] = (double)a_rhs;
  memset(&local_2000,0,0x6c0);
  alpha = (Scalar *)local_1480;
  local_1480._0_8_ = (PointerType)0x3ff0000000000000;
  Eigen::internal::
  generic_product_impl<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,9,6,1,9,6>const>const,Eigen::Matrix<double,9,6,1,9,6>const>,Eigen::Matrix<double,6,24,1,6,24>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,9,24,0,9,24>>
            (&local_2000,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_6,_1,_9,_6>_>,_const_Eigen::Matrix<double,_9,_6,_1,_9,_6>_>
              *)&local_1910,a_rhs,alpha);
  pCVar70 = local_2758;
  auVar304 = vmovdqa64_avx512f(local_2600);
  auVar104 = vmovdqa64_avx512f(local_26c0);
  pdVar74 = &local_13c8;
  auVar304 = vpaddq_avx512f(auVar304,_DAT_00997e40);
  do {
    auVar184 = vpbroadcastq_avx512f();
    pdVar74[-0x17] =
         local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.
         array[lVar73];
    auVar184 = vpsllq_avx512f(auVar184,3);
    vpaddq_avx512f(auVar104,auVar184);
    vpaddq_avx512f(auVar304,auVar184);
    auVar184 = vgatherqpd_avx512f(*extraout_RDX);
    *(undefined1 (*) [64])(pdVar74 + -0x16) = auVar184;
    dVar131 = local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.
              m_data.array[lVar73 + 0xa2];
    auVar184 = vgatherqpd_avx512f(*alpha);
    *(undefined1 (*) [64])(pdVar74 + -0xe) = auVar184;
    pdVar74[-6] = local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.
                  m_storage.m_data.array[lVar73 + 0x99];
    dVar151 = local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.
              m_data.array[lVar73 + 0xab];
    pdVar74[-5] = dVar131;
    dVar131 = local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.
              m_data.array[lVar73 + 0xb4];
    pdVar74[-4] = dVar151;
    dVar151 = local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.
              m_data.array[lVar73 + 0xbd];
    pdVar74[-3] = dVar131;
    dVar131 = local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.
              m_data.array[lVar73 + 0xc6];
    pdVar74[-2] = dVar151;
    dVar151 = local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.
              m_data.array[lVar73 + 0xcf];
    pdVar74[-1] = dVar131;
    lVar73 = lVar73 + 1;
    *pdVar74 = dVar151;
    pdVar74 = pdVar74 + 0x18;
  } while (lVar73 != 9);
  iVar48 = (int)((ulong)local_2758 >> 3);
  uVar76 = -iVar48 & 6;
  uVar78 = (ulong)uVar76;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0]._0_4_ = (undefined4)local_1480._0_8_;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0]._4_4_ = SUB84(local_1480._0_8_,4);
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [1] = (double)local_1480._8_8_;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [2] = sStack_1470.m_other;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [3] = (double)vStack_1468.m_value;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [4] = (double)vStack_1460.m_value;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [5] = (double)pCStack_1458;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [6] = (double)auStack_1450._0_8_;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [7] = (double)auStack_1450._8_8_;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [8] = dStack_1440;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [9] = dStack_1438;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [10] = dStack_1430;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xb] = dStack_1428;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xc] = dStack_1420;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xd] = dStack_1418;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xe] = dStack_1410;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xf] = dStack_1408;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x10] = dStack_1400;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x11] = local_13f8;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x12] = local_13f0;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x13] = local_13e8;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x14] = local_13e0;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x15] = local_13d8;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x16] = local_13d0;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x17] = local_13c8;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x18] = local_13c0;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x19] = dStack_13b8;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x1a] = dStack_13b0;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x1b] = dStack_13a8;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x1c] = dStack_13a0;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x1d] = dStack_1398;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x1e] = dStack_1390;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x1f] = dStack_1388;
  uVar75 = (ulong)(0x18 - uVar76 & 0xfffffff8 | uVar76);
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.
        array[0];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [1] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.
        array[1];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [2] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.
        array[2];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [3] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.
        array[3];
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x20] = local_1380;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x21] = dStack_1378;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x22] = dStack_1370;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x23] = dStack_1368;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x24] = dStack_1360;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x25] = dStack_1358;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x26] = dStack_1350;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x27] = dStack_1348;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x28] = local_1340;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x29] = dStack_1338;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x2a] = dStack_1330;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x2b] = dStack_1328;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x2c] = dStack_1320;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x2d] = dStack_1318;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x2e] = dStack_1310;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x2f] = dStack_1308;
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [4] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.
        array[4];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [5] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.
        array[5];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [6] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.
        array[6];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [7] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.
        array[7];
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x30] = local_1300;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x31] = dStack_12f8;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x32] = dStack_12f0;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x33] = dStack_12e8;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x34] = dStack_12e0;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x35] = dStack_12d8;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x36] = dStack_12d0;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x37] = dStack_12c8;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x38] = local_12c0;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x39] = dStack_12b8;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x3a] = dStack_12b0;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x3b] = dStack_12a8;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x3c] = dStack_12a0;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x3d] = dStack_1298;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x3e] = dStack_1290;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x3f] = dStack_1288;
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [8] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.
        array[8];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [9] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.
        array[9];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [10] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.
         array[10];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0xb] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data
          .array[0xb];
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x40] = local_1280;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x41] = dStack_1278;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x42] = dStack_1270;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x43] = dStack_1268;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x44] = dStack_1260;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x45] = dStack_1258;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x46] = dStack_1250;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x47] = dStack_1248;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x48] = local_1240;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x49] = dStack_1238;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x4a] = dStack_1230;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x4b] = dStack_1228;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x4c] = dStack_1220;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x4d] = dStack_1218;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x4e] = dStack_1210;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x4f] = dStack_1208;
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0xc] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data
          .array[0xc];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0xd] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data
          .array[0xd];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0xe] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data
          .array[0xe];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0xf] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data
          .array[0xf];
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x50] = local_1200;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x51] = dStack_11f8;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x52] = dStack_11f0;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x53] = dStack_11e8;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x54] = dStack_11e0;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x55] = dStack_11d8;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x56] = dStack_11d0;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x57] = dStack_11c8;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x58] = local_11c0;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x59] = dStack_11b8;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x5a] = dStack_11b0;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x5b] = dStack_11a8;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x5c] = dStack_11a0;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x5d] = dStack_1198;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x5e] = dStack_1190;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x5f] = dStack_1188;
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x10] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x10];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x11] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x11];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x12] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x12];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x13] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x13];
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x60] = local_1180;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x61] = dStack_1178;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x62] = dStack_1170;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [99] = dStack_1168;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [100] = dStack_1160;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x65] = dStack_1158;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x66] = dStack_1150;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x67] = dStack_1148;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x68] = local_1140;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x69] = dStack_1138;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x6a] = dStack_1130;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x6b] = dStack_1128;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x6c] = dStack_1120;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x6d] = dStack_1118;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x6e] = dStack_1110;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x6f] = dStack_1108;
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x14] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x14];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x15] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x15];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x16] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x16];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x17] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x17];
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x70] = local_1100;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x71] = dStack_10f8;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x72] = dStack_10f0;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x73] = dStack_10e8;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x74] = dStack_10e0;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x75] = dStack_10d8;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x76] = dStack_10d0;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x77] = dStack_10c8;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x78] = local_10c0;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x79] = dStack_10b8;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x7a] = dStack_10b0;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x7b] = dStack_10a8;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x7c] = dStack_10a0;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x7d] = dStack_1098;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x7e] = dStack_1090;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x7f] = dStack_1088;
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x18] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x18];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x19] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x19];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x1a] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x1a];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x1b] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x1b];
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x80] = local_1080;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x81] = dStack_1078;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x82] = dStack_1070;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x83] = dStack_1068;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x84] = dStack_1060;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x85] = dStack_1058;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x86] = dStack_1050;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x87] = dStack_1048;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x88] = local_1040;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x89] = dStack_1038;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x8a] = dStack_1030;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x8b] = dStack_1028;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x8c] = dStack_1020;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x8d] = dStack_1018;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x8e] = dStack_1010;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x8f] = dStack_1008;
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x1c] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x1c];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x1d] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x1d];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x1e] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x1e];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x1f] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x1f];
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x90] = local_1000;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x91] = dStack_ff8;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x92] = dStack_ff0;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x93] = dStack_fe8;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x94] = dStack_fe0;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x95] = dStack_fd8;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x96] = dStack_fd0;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x97] = dStack_fc8;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x98] = local_fc0;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x99] = dStack_fb8;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x9a] = dStack_fb0;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x9b] = dStack_fa8;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x9c] = dStack_fa0;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x9d] = dStack_f98;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x9e] = dStack_f90;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0x9f] = dStack_f88;
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x20] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x20];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x21] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x21];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x22] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x22];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x23] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x23];
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xa0] = local_f80;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xa1] = dStack_f78;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xa2] = dStack_f70;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xa3] = dStack_f68;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xa4] = dStack_f60;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xa5] = dStack_f58;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xa6] = dStack_f50;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xa7] = dStack_f48;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xa8] = local_f40;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xa9] = dStack_f38;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xaa] = dStack_f30;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xab] = dStack_f28;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xac] = dStack_f20;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xad] = dStack_f18;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xae] = dStack_f10;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xaf] = dStack_f08;
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x24] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x24];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x25] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x25];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x26] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x26];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x27] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x27];
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xb0] = local_f00;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xb1] = dStack_ef8;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xb2] = dStack_ef0;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xb3] = dStack_ee8;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xb4] = dStack_ee0;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xb5] = dStack_ed8;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xb6] = dStack_ed0;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xb7] = dStack_ec8;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xb8] = local_ec0;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xb9] = dStack_eb8;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xba] = dStack_eb0;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xbb] = dStack_ea8;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xbc] = dStack_ea0;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xbd] = dStack_e98;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xbe] = dStack_e90;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xbf] = dStack_e88;
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x28] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x28];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x29] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x29];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x2a] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x2a];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x2b] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x2b];
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xc0] = local_e80;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xc1] = dStack_e78;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xc2] = dStack_e70;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xc3] = dStack_e68;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xc4] = dStack_e60;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xc5] = dStack_e58;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xc6] = dStack_e50;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [199] = dStack_e48;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [200] = local_e40;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xc9] = dStack_e38;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xca] = dStack_e30;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xcb] = dStack_e28;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xcc] = dStack_e20;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xcd] = dStack_e18;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xce] = dStack_e10;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xcf] = dStack_e08;
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x2c] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x2c];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x2d] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x2d];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x2e] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x2e];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x2f] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x2f];
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xd0] = local_e00;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xd1] = dStack_df8;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xd2] = dStack_df0;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xd3] = dStack_de8;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xd4] = dStack_de0;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xd5] = dStack_dd8;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xd6] = dStack_dd0;
  local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.m_storage.m_data.array
  [0xd7] = dStack_dc8;
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x30] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x30];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x31] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x31];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x32] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x32];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x33] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x33];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x34] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x34];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x35] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x35];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x36] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x36];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x37] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x37];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x38] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x38];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x39] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x39];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x3a] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x3a];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x3b] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x3b];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x3c] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x3c];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x3d] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x3d];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x3e] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x3e];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x3f] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x3f];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x40] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x40];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x41] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x41];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x42] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x42];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x43] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x43];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x44] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x44];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x45] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x45];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x46] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x46];
  local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.m_data.array
  [0x47] = local_2290.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.m_storage.
           m_data.array[0x47];
  local_16d0 = local_2050;
  uStack_16c8 = uStack_2048;
  local_16c0 = local_2040;
  uStack_16b8 = uStack_2038;
  local_16b0 = local_2030;
  uStack_16a8 = uStack_2028;
  local_16a0 = local_2020;
  uStack_1698 = uStack_2018;
  local_1690 = local_2010;
  uVar84 = uVar78;
  if (uVar78 != 0) {
    uVar80 = 0;
    do {
      *(undefined8 *)
       ((long)(local_2758->super_PlainObjectBase<Eigen::Matrix<double,_330,_1,_0,_330,_1>_>).
              m_storage.m_data.array + uVar80) =
           *(undefined8 *)
            ((long)(this->Fint).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.
                   m_storage.m_data.array + uVar80);
      uVar80 = uVar80 + 8;
    } while ((iVar48 * -8 & 0x30) != uVar80);
  }
  do {
    pdVar74 = (this->Fint).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
              m_data.array + uVar84;
    dVar131 = pdVar74[1];
    dVar151 = pdVar74[2];
    dVar152 = pdVar74[3];
    dVar130 = pdVar74[4];
    dVar216 = pdVar74[5];
    dVar290 = pdVar74[6];
    dVar31 = pdVar74[7];
    pdVar2 = (local_2758->super_PlainObjectBase<Eigen::Matrix<double,_330,_1,_0,_330,_1>_>).
             m_storage.m_data.array + uVar84;
    *pdVar2 = *pdVar74;
    pdVar2[1] = dVar131;
    pdVar2[2] = dVar151;
    pdVar2[3] = dVar152;
    pdVar2[4] = dVar130;
    pdVar2[5] = dVar216;
    pdVar2[6] = dVar290;
    pdVar2[7] = dVar31;
    uVar84 = uVar84 + 8;
  } while (uVar84 < uVar75);
  if (uVar78 != 0) {
    do {
      (local_2758->super_PlainObjectBase<Eigen::Matrix<double,_330,_1,_0,_330,_1>_>).m_storage.
      m_data.array[uVar75] =
           (this->Fint).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
           m_data.array[uVar75];
      uVar75 = uVar75 + 1;
    } while (uVar75 != 0x18);
  }
  pdVar74 = (local_2758->super_PlainObjectBase<Eigen::Matrix<double,_330,_1,_0,_330,_1>_>).m_storage
            .m_data.array + 0x18;
  iVar48 = (int)((ulong)pdVar74 >> 3);
  uVar81 = -iVar48;
  uVar76 = uVar81 & 6;
  uVar82 = (uint)(uVar76 == 0) * 8;
  if (uVar76 == 0) {
    *pdVar74 = (double)local_24d0.m_dst;
    (local_2758->super_PlainObjectBase<Eigen::Matrix<double,_330,_1,_0,_330,_1>_>).m_storage.m_data.
    array[0x19] = (double)local_24d0.m_src;
    (local_2758->super_PlainObjectBase<Eigen::Matrix<double,_330,_1,_0,_330,_1>_>).m_storage.m_data.
    array[0x1a] = (double)local_24d0.m_functor;
    (local_2758->super_PlainObjectBase<Eigen::Matrix<double,_330,_1,_0,_330,_1>_>).m_storage.m_data.
    array[0x1b] = (double)local_24d0.m_dstExpr;
    (local_2758->super_PlainObjectBase<Eigen::Matrix<double,_330,_1,_0,_330,_1>_>).m_storage.m_data.
    array[0x1c] = dStack_24b0;
    (local_2758->super_PlainObjectBase<Eigen::Matrix<double,_330,_1,_0,_330,_1>_>).m_storage.m_data.
    array[0x1d] = dStack_24a8;
    (local_2758->super_PlainObjectBase<Eigen::Matrix<double,_330,_1,_0,_330,_1>_>).m_storage.m_data.
    array[0x1e] = dStack_24a0;
    (local_2758->super_PlainObjectBase<Eigen::Matrix<double,_330,_1,_0,_330,_1>_>).m_storage.m_data.
    array[0x1f] = dStack_2498;
  }
  else {
    memcpy(pdVar74,&local_24d0,(ulong)(iVar48 * -8 & 0x30));
  }
  if (uVar82 + uVar76 < 9) {
    uVar84 = (ulong)((uVar81 & 6 | uVar82) << 3);
    memcpy((void *)((long)(pCVar70->super_PlainObjectBase<Eigen::Matrix<double,_330,_1,_0,_330,_1>_>
                          ).m_storage.m_data.array + uVar84 + 0xc0),
           (void *)((long)&local_24d0.m_dst + uVar84),0x48 - (ulong)((uVar76 | uVar82) << 3));
  }
  pdVar74 = (pCVar70->super_PlainObjectBase<Eigen::Matrix<double,_330,_1,_0,_330,_1>_>).m_storage.
            m_data.array + 0x21;
  uVar76 = -((uint)((ulong)pdVar74 >> 3) & 0x1fffffff) & 7;
  uVar81 = uVar76 << 3;
  uVar84 = (ulong)uVar81;
  memcpy(pdVar74,&local_2000,uVar84);
  uVar76 = (0xd8 - uVar76) * 8;
  uVar82 = uVar76 & 0x6c0;
  memcpy((void *)((long)(pCVar70->super_PlainObjectBase<Eigen::Matrix<double,_330,_1,_0,_330,_1>_>).
                        m_storage.m_data.array + uVar84 + 0x108),
         (void *)((long)local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.
                        m_storage.m_data.array + uVar84),(ulong)(uVar82 + 0x7f8 & 0x6c0) + 0x40);
  uVar84 = (ulong)(uVar82 | uVar81);
  memcpy((void *)((long)(pCVar70->super_PlainObjectBase<Eigen::Matrix<double,_330,_1,_0,_330,_1>_>).
                        m_storage.m_data.array + uVar84 + 0x108),
         (void *)((long)local_2000.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_0,_9,_24>_>.
                        m_storage.m_data.array + uVar84),(ulong)(uVar76 & 0x38));
  pdVar74 = (pCVar70->super_PlainObjectBase<Eigen::Matrix<double,_330,_1,_0,_330,_1>_>).m_storage.
            m_data.array + 0xf9;
  uVar81 = -((uint)((ulong)pdVar74 >> 3) & 0x1fffffff) & 7;
  uVar84 = (ulong)(uVar81 * 8);
  uVar76 = 0x51 - uVar81 & 0xffffffd8;
  memcpy(pdVar74,&local_1910,uVar84);
  memcpy((void *)((long)(pCVar70->super_PlainObjectBase<Eigen::Matrix<double,_330,_1,_0,_330,_1>_>).
                        m_storage.m_data.array + uVar84 + 0x7c8),
         (void *)((long)local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.
                        m_storage.m_data.array + uVar84),(ulong)(uVar76 * 8 + 0x3f8 & 0x3c0) + 0x40)
  ;
  if ((uVar81 | uVar76) < 0x51) {
    uVar76 = (0x51 - uVar81) * 8;
    uVar84 = (ulong)(uVar76 & 0x2c0 | uVar81 * 8);
    memcpy((void *)((long)(pCVar70->super_PlainObjectBase<Eigen::Matrix<double,_330,_1,_0,_330,_1>_>
                          ).m_storage.m_data.array + uVar84 + 0x7c8),
           (void *)((long)local_1910.super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>.
                          m_storage.m_data.array + uVar84),(ulong)(uVar76 & 0x38));
  }
  return;
}

Assistant:

void Brick_ForceNumerical::Evaluate(ChVectorN<double, 330>& result, const double x, const double y, const double z) {
    element->ShapeFunctionsDerivativeX(Nx, x, y, z);
    element->ShapeFunctionsDerivativeY(Ny, x, y, z);
    element->ShapeFunctionsDerivativeZ(Nz, x, y, z);
    element->Basis_M(M, x, y, z);  // EAS

    if (!element->m_isMooney) {  // m_isMooney == false means linear elastic material
        double DD = (*E) * (1.0 - (*v)) / ((1.0 + (*v)) * (1.0 - 2.0 * (*v)));
        E_eps.fillDiagonal(1.0);
        E_eps(0, 1) = (*v) / (1.0 - (*v));
        E_eps(0, 3) = (*v) / (1.0 - (*v));
        E_eps(1, 0) = (*v) / (1.0 - (*v));
        E_eps(1, 3) = (*v) / (1.0 - (*v));
        E_eps(2, 2) = (1.0 - 2.0 * (*v)) / (2.0 * (1.0 - (*v)));
        E_eps(3, 0) = (*v) / (1.0 - (*v));
        E_eps(3, 1) = (*v) / (1.0 - (*v));
        E_eps(4, 4) = (1.0 - 2.0 * (*v)) / (2.0 * (1.0 - (*v)));
        E_eps(5, 5) = (1.0 - 2.0 * (*v)) / (2.0 * (1.0 - (*v)));
        E_eps *= DD;
    }
    // Expand shape functions Sx, Sy, Sz
    // Sx=[Nx1*eye(3) Nx2*eye(3) Nx3*eye(3) Nx4*eye(3) Nx5*eye(3) Nx6*eye(3) Nx7*eye(3) Nx8*eye(3)]

    for (int i = 0; i < 8; i++) {
        Sx(0, 3 * i + 0) = Nx(i);
        Sx(1, 3 * i + 1) = Nx(i);
        Sx(2, 3 * i + 2) = Nx(i);
    }

    for (int i = 0; i < 8; i++) {
        Sy(0, 3 * i + 0) = Ny(i);
        Sy(1, 3 * i + 1) = Ny(i);
        Sy(2, 3 * i + 2) = Ny(i);
    }

    for (int i = 0; i < 8; i++) {
        Sz(0, 3 * i + 0) = Nz(i);
        Sz(1, 3 * i + 1) = Nz(i);
        Sz(2, 3 * i + 2) = Nz(i);
    }

    //==EAS and Initial Shape==//
    ChMatrixNM<double, 3, 3> rd0;
    rd0.col(0) = (*d0).transpose() * Nx.transpose();
    rd0.col(1) = (*d0).transpose() * Ny.transpose();
    rd0.col(2) = (*d0).transpose() * Nz.transpose();
    detJ0 = rd0.determinant();

    //////////////////////////////////////////////////////////////
    //// Transformation : Orthogonal transformation (A and J) ////
    //////////////////////////////////////////////////////////////
    ChVector<double> G1;
    ChVector<double> G2;
    ChVector<double> G3;
    ChVector<double> G1xG2;
    G1[0] = rd0(0, 0);
    G2[0] = rd0(0, 1);
    G3[0] = rd0(0, 2);
    G1[1] = rd0(1, 0);
    G2[1] = rd0(1, 1);
    G3[1] = rd0(1, 2);
    G1[2] = rd0(2, 0);
    G2[2] = rd0(2, 1);
    G3[2] = rd0(2, 2);
    G1xG2.Cross(G1, G2);

    ////Tangent Frame
    ChVector<> A1 = G1 / sqrt(G1[0] * G1[0] + G1[1] * G1[1] + G1[2] * G1[2]);
    ChVector<> A3 = G1xG2 / sqrt(G1xG2[0] * G1xG2[0] + G1xG2[1] * G1xG2[1] + G1xG2[2] * G1xG2[2]);
    ChVector<> A2 = A3.Cross(A1);

    ////Direction for orthotropic material//
    double theta = 0.0;
    ChVector<> AA1 = A1 * cos(theta) + A2 * sin(theta);
    ChVector<> AA2 = -A1 * sin(theta) + A2 * cos(theta);
    ChVector<> AA3 = A3;

    ////Beta
    ChMatrixNM<double, 3, 3> j0 = rd0.inverse();
    ChVector<double> j01;
    ChVector<double> j02;
    ChVector<double> j03;
    j01[0] = j0(0, 0);
    j02[0] = j0(1, 0);
    j03[0] = j0(2, 0);
    j01[1] = j0(0, 1);
    j02[1] = j0(1, 1);
    j03[1] = j0(2, 1);
    j01[2] = j0(0, 2);
    j02[2] = j0(1, 2);
    j03[2] = j0(2, 2);
    ChVectorN<double, 9> beta;
    beta(0) = Vdot(AA1, j01);
    beta(1) = Vdot(AA2, j01);
    beta(2) = Vdot(AA3, j01);
    beta(3) = Vdot(AA1, j02);
    beta(4) = Vdot(AA2, j02);
    beta(5) = Vdot(AA3, j02);
    beta(6) = Vdot(AA1, j03);
    beta(7) = Vdot(AA2, j03);
    beta(8) = Vdot(AA3, j03);

    //////////////////////////////////////////////////
    //// Enhanced Assumed Strain /////////////////////
    //////////////////////////////////////////////////
    G = (*T0) * M * ((*detJ0C) / detJ0);
    strain_EAS = G * (*alpha_eas);

    ChMatrixNM<double, 8, 8> d_d = (*d) * (*d).transpose();
    ChVectorN<double, 8> ddNx = d_d * Nx.transpose();
    ChVectorN<double, 8> ddNy = d_d * Ny.transpose();
    ChVectorN<double, 8> ddNz = d_d * Nz.transpose();

    ChMatrixNM<double, 8, 8> d0_d0 = (*d0) * (*d0).transpose();
    ChVectorN<double, 8> d0d0Nx = d0_d0 * Nx.transpose();
    ChVectorN<double, 8> d0d0Ny = d0_d0 * Ny.transpose();
    ChVectorN<double, 8> d0d0Nz = d0_d0 * Nz.transpose();

    ///////////////////////////
    /// Strain component //////
    ///////////////////////////
    ChVectorN<double, 6> strain_til;
    strain_til(0) = 0.5 * Nx.dot(ddNx - d0d0Nx);
    strain_til(1) = 0.5 * Ny.dot(ddNy - d0d0Ny);
    strain_til(2) = Nx.dot(ddNy - d0d0Ny);
    //== Compatible strain (No ANS) ==//
    strain_til(3) = 0.5 * Nz.dot(ddNz - d0d0Nz);
    strain_til(4) = Nx.dot(ddNz - d0d0Nz);
    strain_til(5) = Ny.dot(ddNz - d0d0Nz);

    //// For orthotropic material ///
    strain(0) = strain_til(0) * beta(0) * beta(0) + strain_til(1) * beta(3) * beta(3) +
                strain_til(2) * beta(0) * beta(3) + strain_til(3) * beta(6) * beta(6) +
                strain_til(4) * beta(0) * beta(6) + strain_til(5) * beta(3) * beta(6);
    strain(1) = strain_til(0) * beta(1) * beta(1) + strain_til(1) * beta(4) * beta(4) +
                strain_til(2) * beta(1) * beta(4) + strain_til(3) * beta(7) * beta(7) +
                strain_til(4) * beta(1) * beta(7) + strain_til(5) * beta(4) * beta(7);
    strain(2) = strain_til(0) * 2.0 * beta(0) * beta(1) + strain_til(1) * 2.0 * beta(3) * beta(4) +
                strain_til(2) * (beta(1) * beta(3) + beta(0) * beta(4)) + strain_til(3) * 2.0 * beta(6) * beta(7) +
                strain_til(4) * (beta(1) * beta(6) + beta(0) * beta(7)) +
                strain_til(5) * (beta(4) * beta(6) + beta(3) * beta(7));
    strain(3) = strain_til(0) * beta(2) * beta(2) + strain_til(1) * beta(5) * beta(5) +
                strain_til(2) * beta(2) * beta(5) + strain_til(3) * beta(8) * beta(8) +
                strain_til(4) * beta(2) * beta(8) + strain_til(5) * beta(5) * beta(8);
    strain(4) = strain_til(0) * 2.0 * beta(0) * beta(2) + strain_til(1) * 2.0 * beta(3) * beta(5) +
                strain_til(2) * (beta(2) * beta(3) + beta(0) * beta(5)) + strain_til(3) * 2.0 * beta(6) * beta(8) +
                strain_til(4) * (beta(2) * beta(6) + beta(0) * beta(8)) +
                strain_til(5) * (beta(5) * beta(6) + beta(3) * beta(8));
    strain(5) = strain_til(0) * 2.0 * beta(1) * beta(2) + strain_til(1) * 2.0 * beta(4) * beta(5) +
                strain_til(2) * (beta(2) * beta(4) + beta(1) * beta(5)) + strain_til(3) * 2.0 * beta(7) * beta(8) +
                strain_til(4) * (beta(2) * beta(7) + beta(1) * beta(8)) +
                strain_til(5) * (beta(5) * beta(7) + beta(4) * beta(8));

    ////////////////////////////////////
    /// Straint derivative component ///
    ////////////////////////////////////
    ChMatrixNM<double, 6, 24> strainD_til;
    strainD_til.row(0) = Nx * (*d) * Sx;
    strainD_til.row(1) = Ny * (*d) * Sy;
    strainD_til.row(2) = Nx * (*d) * Sy + Ny * (*d) * Sx;
    //== Compatible strain (No ANS)==//
    strainD_til.row(3) = Nz * (*d) * Sz;
    strainD_til.row(4) = Nx * (*d) * Sz + Nz * (*d) * Sx;
    strainD_til.row(5) = Ny * (*d) * Sz + Nz * (*d) * Sy;

    //// For orthotropic material ///
    for (int ii = 0; ii < 24; ii++) {
        strainD(0, ii) = strainD_til(0, ii) * beta(0) * beta(0) + strainD_til(1, ii) * beta(3) * beta(3) +
                         strainD_til(2, ii) * beta(0) * beta(3) + strainD_til(3, ii) * beta(6) * beta(6) +
                         strainD_til(4, ii) * beta(0) * beta(6) + strainD_til(5, ii) * beta(3) * beta(6);
        strainD(1, ii) = strainD_til(0, ii) * beta(1) * beta(1) + strainD_til(1, ii) * beta(4) * beta(4) +
                         strainD_til(2, ii) * beta(1) * beta(4) + strainD_til(3, ii) * beta(7) * beta(7) +
                         strainD_til(4, ii) * beta(1) * beta(7) + strainD_til(5, ii) * beta(4) * beta(7);
        strainD(2, ii) = strainD_til(0, ii) * 2.0 * beta(0) * beta(1) + strainD_til(1, ii) * 2.0 * beta(3) * beta(4) +
                         strainD_til(2, ii) * (beta(1) * beta(3) + beta(0) * beta(4)) +
                         strainD_til(3, ii) * 2.0 * beta(6) * beta(7) +
                         strainD_til(4, ii) * (beta(1) * beta(6) + beta(0) * beta(7)) +
                         strainD_til(5, ii) * (beta(4) * beta(6) + beta(3) * beta(7));
        strainD(3, ii) = strainD_til(0, ii) * beta(2) * beta(2) + strainD_til(1, ii) * beta(5) * beta(5) +
                         strainD_til(2, ii) * beta(2) * beta(5) + strainD_til(3, ii) * beta(8) * beta(8) +
                         strainD_til(4, ii) * beta(2) * beta(8) + strainD_til(5) * beta(5) * beta(8);
        strainD(4, ii) = strainD_til(0, ii) * 2.0 * beta(0) * beta(2) + strainD_til(1, ii) * 2.0 * beta(3) * beta(5) +
                         strainD_til(2, ii) * (beta(2) * beta(3) + beta(0) * beta(5)) +
                         strainD_til(3, ii) * 2.0 * beta(6) * beta(8) +
                         strainD_til(4, ii) * (beta(2) * beta(6) + beta(0) * beta(8)) +
                         strainD_til(5, ii) * (beta(5) * beta(6) + beta(3) * beta(8));
        strainD(5, ii) = strainD_til(0, ii) * 2.0 * beta(1) * beta(2) + strainD_til(1, ii) * 2.0 * beta(4) * beta(5) +
                         strainD_til(2, ii) * (beta(2) * beta(4) + beta(1) * beta(5)) +
                         strainD_til(3, ii) * 2.0 * beta(7) * beta(8) +
                         strainD_til(4, ii) * (beta(2) * beta(7) + beta(1) * beta(8)) +
                         strainD_til(5, ii) * (beta(5) * beta(7) + beta(4) * beta(8));
    }

    ///////////////////////////////////
    /// Enhanced Assumed Strain 2nd ///
    ///////////////////////////////////
    strain += strain_EAS;  // same as EPS in FORTRAN

    ChMatrixNM<double, 9, 6> temp56;  // same as TEMP1 in FORTRAN
    ChVectorN<double, 9> HE1;
    ChMatrixNM<double, 9, 24> GDEPSP;
    ChMatrixNM<double, 9, 9> KALPHA;

    // m_isMooney == 1 use Iso_Nonlinear_Mooney-Rivlin Material (2-parameters=> 3 inputs)
    if (element->m_isMooney == 1) {
        ChMatrix33<> CG;  // CG: Right Cauchy-Green tensor  C=trans(F)*F
        ChMatrix33<> INVCG;
        ChMatrix33<> I1PC;
        ChMatrix33<> I2PC;
        ChMatrix33<> JPC;
        ChMatrix33<> STR;

        ChMatrix33<> CGN;
        ChMatrix33<> INVCGN;
        ChMatrix33<> I1PCN;
        ChMatrix33<> I2PCN;
        ChMatrix33<> JPCN;
        ChMatrix33<> STRN;

        ChVectorN<double, 6> strain_1;

        CG(0, 0) = 2.0 * strain(0) + 1.0;
        CG(1, 1) = 2.0 * strain(1) + 1.0;
        CG(2, 2) = 2.0 * strain(3) + 1.0;
        CG(1, 0) = strain(2);
        CG(0, 1) = CG(1, 0);
        CG(2, 0) = strain(4);
        CG(0, 2) = CG(2, 0);
        CG(2, 1) = strain(5);
        CG(1, 2) = CG(2, 1);

        INVCG = CG.inverse();

        double Deld = 0.000001;
        double I1 = CG(0, 0) + CG(1, 1) + CG(2, 2);
        double I2 = 0.5 * (pow(I1, 2) - (pow(CG(0, 0), 2) + pow(CG(1, 0), 2) + pow(CG(2, 0), 2) + pow(CG(0, 1), 2) +
                                         pow(CG(1, 1), 2) + pow(CG(2, 1), 2) + pow(CG(0, 2), 2) + pow(CG(1, 2), 2) +
                                         pow(CG(2, 2), 2)));
        double I3 = CG(0, 0) * CG(1, 1) * CG(2, 2) - CG(0, 0) * CG(1, 2) * CG(2, 1) + CG(0, 1) * CG(1, 2) * CG(2, 0) -
                    CG(0, 1) * CG(1, 0) * CG(2, 2) + CG(0, 2) * CG(1, 0) * CG(2, 1) - CG(2, 0) * CG(1, 1) * CG(0, 2);
        double J = sqrt(I3);
        // double CCOM1 = 551584.0;                                    // C10   not 0.551584
        // double CCOM2 = 137896.0;                                    // C01   not 0.137896
        double CCOM3 = 2.0 * (element->CCOM1 + element->CCOM2) / (1.0 - 2.0 * 0.49);  // K:bulk modulus
        double StockEPS;

        I1PC = (ChMatrix33<>::Identity() - INVCG * (1.0 / 3.0 * I1)) * pow(I3, -1.0 / 3.0);
        I2PC = (((ChMatrix33<>::Identity() * I1) - CG) - (INVCG * (2.0 / 3.0) * I2)) * pow(I3, -2.0 / 3.0);
        JPC = INVCG * (J / 2.0);

        STR = I1PC * (element->CCOM1 * 2.0) + I2PC * (element->CCOM2 * 2.0) + JPC * (CCOM3 * (J - 1.0) * 2.0);

        ChVectorN<double, 6> TEMP5;
        TEMP5(0) = STR(0, 0);
        TEMP5(1) = STR(1, 1);
        TEMP5(2) = STR(0, 1);
        TEMP5(3) = STR(2, 2);
        TEMP5(4) = STR(0, 2);
        TEMP5(5) = STR(1, 2);

        E_eps.setZero();

        ChVectorN<double, 6> TEMP5N;
        strain_1 = strain;
        for (int JJJ = 0; JJJ < 6; JJJ++) {
            StockEPS = strain_1(JJJ);
            strain_1(JJJ) = StockEPS + Deld;
            CGN(0, 0) = 2.0 * strain_1(0) + 1.0;
            CGN(1, 1) = 2.0 * strain_1(1) + 1.0;
            CGN(2, 2) = 2.0 * strain_1(3) + 1.0;
            CGN(1, 0) = strain_1(2);
            CGN(0, 1) = CGN(1, 0);
            CGN(2, 0) = strain_1(4);
            CGN(0, 2) = CGN(2, 0);
            CGN(2, 1) = strain_1(5);
            CGN(1, 2) = CGN(2, 1);
            INVCGN = CGN.inverse();
            I1 = CGN(0, 0) + CGN(1, 1) + CGN(2, 2);
            I2 = 0.5 * (pow(I1, 2) - (pow(CGN(0, 0), 2) + pow(CGN(1, 0), 2) + pow(CGN(2, 0), 2) + pow(CGN(0, 1), 2) +
                                      pow(CGN(1, 1), 2) + pow(CGN(2, 1), 2) + pow(CGN(0, 2), 2) + pow(CGN(1, 2), 2) +
                                      pow(CGN(2, 2), 2)));
            I3 = CGN(0, 0) * CGN(1, 1) * CGN(2, 2) - CGN(0, 0) * CGN(1, 2) * CGN(2, 1) +
                 CGN(0, 1) * CGN(1, 2) * CGN(2, 0) - CGN(0, 1) * CGN(1, 0) * CGN(2, 2) +
                 CGN(0, 2) * CGN(1, 0) * CGN(2, 1) - CGN(2, 0) * CGN(1, 1) * CGN(0, 2);
            J = sqrt(I3);
            I1PCN = (ChMatrix33<>::Identity() - INVCGN * (1.0 / 3.0 * I1)) * pow(I3, -1.0 / 3.0);
            I2PCN = (((ChMatrix33<>::Identity() * I1) - CGN) - (INVCGN * (2.0 / 3.0) * I2)) * pow(I3, -2.0 / 3.0);
            JPCN = INVCGN * (J / 2.0);
            STRN = I1PCN * (element->CCOM1 * 2.0) + I2PCN * (element->CCOM2 * 2.0) + JPCN * (CCOM3 * (J - 1.0) * 2.0);
            TEMP5N(0) = STRN(0, 0);
            TEMP5N(1) = STRN(1, 1);
            TEMP5N(2) = STRN(0, 1);
            TEMP5N(3) = STRN(2, 2);
            TEMP5N(4) = STRN(0, 2);
            TEMP5N(5) = STRN(1, 2);
            strain_1(JJJ) = StockEPS;
            E_eps(JJJ, 0) = (TEMP5N(0) - TEMP5(0)) / Deld;
            E_eps(JJJ, 1) = (TEMP5N(1) - TEMP5(1)) / Deld;
            E_eps(JJJ, 2) = (TEMP5N(2) - TEMP5(2)) / Deld;
            E_eps(JJJ, 3) = (TEMP5N(3) - TEMP5(3)) / Deld;
            E_eps(JJJ, 4) = (TEMP5N(4) - TEMP5(4)) / Deld;
            E_eps(JJJ, 5) = (TEMP5N(5) - TEMP5(5)) / Deld;
        }
        temp56 = G.transpose() * E_eps;
        Fint = strainD.transpose() * TEMP5;
        Fint *= detJ0 * (element->GetLengthX() / 2.0) * (element->GetLengthY() / 2.0) * (element->GetLengthZ() / 2.0);
        HE1 = G.transpose() * TEMP5;
        HE1 *= detJ0 * (element->GetLengthX() / 2.0) * (element->GetLengthY() / 2.0) * (element->GetLengthZ() / 2.0);
    } else {
        temp56 = G.transpose() * E_eps;
        Fint = strainD.transpose() * E_eps * strain;
        Fint *= detJ0 * (element->GetLengthX() / 2.0) * (element->GetLengthY() / 2.0) * (element->GetLengthZ() / 2.0);
        HE1 = temp56 * strain;
        HE1 *= detJ0 * (element->GetLengthX() / 2.0) * (element->GetLengthY() / 2.0) * (element->GetLengthZ() / 2.0);
    }  // end of   if(*flag_Mooney==1)

    double factor_k =
        detJ0 * (element->GetLengthX() / 2.0) * (element->GetLengthY() / 2.0) * (element->GetLengthZ() / 2.0);
    KALPHA = factor_k * temp56 * G;
    double factor_g =
        detJ0 * (element->GetLengthX() / 2.0) * (element->GetLengthY() / 2.0) * (element->GetLengthZ() / 2.0);
    GDEPSP = factor_g * temp56 * strainD;

    ChVectorN<double, 216> GDEPSPVec = Eigen::Map<ChVectorN<double, 216>>(GDEPSP.data(), 216);
    ChVectorN<double, 81> KALPHAVec = Eigen::Map<ChVectorN<double, 81>>(KALPHA.data(), 81);

    result.segment(0, 24) = Fint;
    result.segment(24, 9) = HE1;
    result.segment(33, 216) = GDEPSPVec;
    result.segment(249, 81) = KALPHAVec;
}